

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softmax_x86_avx.cpp
# Opt level: O2

void ncnn::softmax(float *_ptr,int elemcount,int elempack,int stride,int size1,float *_maxptr,
                  float *_sumptr)

{
  float *pfVar1;
  undefined4 uVar2;
  float fVar3;
  float fVar4;
  bool bVar5;
  ulong uVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  undefined1 auVar33 [64];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  float afVar51 [16];
  float afVar52 [16];
  float afVar53 [16];
  float afVar54 [16];
  float afVar55 [16];
  float afVar56 [16];
  float afVar57 [16];
  float afVar58 [16];
  int j;
  int iVar59;
  ulong uVar60;
  long lVar61;
  undefined1 (*pauVar62) [64];
  undefined1 (*pauVar63) [64];
  long lVar64;
  float *pfVar65;
  undefined1 (*pauVar66) [16];
  long lVar67;
  undefined1 (*pauVar68) [32];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar112 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 (*pauVar69) [32];
  long lVar70;
  undefined1 (*pauVar71) [16];
  ulong uVar72;
  undefined1 (*pauVar73) [64];
  undefined1 (*pauVar74) [16];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [64];
  undefined1 auVar125 [64];
  undefined1 auVar126 [64];
  undefined1 auVar127 [64];
  undefined1 auVar128 [64];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar78 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar129 [64];
  undefined1 auVar130 [64];
  undefined1 auVar131 [64];
  undefined1 auVar132 [64];
  undefined1 auVar133 [64];
  undefined1 auVar134 [64];
  undefined1 auVar135 [64];
  undefined1 auVar136 [64];
  undefined1 auVar137 [64];
  undefined1 auVar138 [64];
  undefined1 auVar139 [64];
  undefined1 auVar140 [64];
  undefined1 auVar141 [64];
  undefined1 auVar142 [64];
  undefined1 auVar143 [64];
  undefined1 auVar144 [64];
  undefined1 auVar145 [64];
  undefined1 auVar146 [64];
  undefined1 auVar147 [64];
  undefined1 auVar148 [64];
  undefined1 auVar149 [64];
  undefined1 auVar150 [64];
  undefined1 auVar151 [64];
  undefined1 auVar152 [64];
  undefined1 auVar153 [64];
  undefined1 auVar154 [64];
  undefined1 auVar155 [64];
  undefined1 auVar156 [64];
  undefined1 auVar157 [64];
  undefined1 auVar158 [64];
  undefined1 auVar159 [64];
  undefined1 auVar160 [64];
  undefined1 auVar161 [64];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [32];
  undefined1 auVar172 [32];
  undefined1 auVar173 [32];
  undefined1 auVar174 [32];
  undefined1 auVar175 [32];
  undefined1 auVar176 [32];
  undefined1 auVar177 [32];
  undefined1 auVar178 [32];
  undefined1 auVar179 [32];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [32];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [32];
  undefined1 auVar186 [32];
  undefined1 auVar187 [32];
  undefined1 auVar188 [32];
  undefined1 auVar189 [32];
  undefined1 auVar190 [32];
  undefined1 auVar191 [16];
  undefined1 auVar192 [32];
  undefined1 auVar193 [32];
  undefined1 auVar194 [32];
  undefined1 auVar195 [32];
  undefined1 auVar196 [32];
  undefined1 auVar197 [32];
  undefined1 auVar198 [32];
  undefined1 auVar199 [32];
  undefined1 auVar200 [32];
  undefined1 auVar201 [32];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [32];
  undefined1 auVar206 [32];
  float afVar207 [16];
  undefined1 auVar208 [32];
  float afVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [32];
  undefined1 auVar212 [32];
  undefined1 auVar213 [32];
  undefined1 auVar214 [16];
  undefined1 auVar215 [32];
  undefined1 auVar216 [16];
  undefined1 auVar217 [32];
  undefined1 auVar218 [32];
  undefined1 auVar219 [32];
  undefined1 auVar220 [32];
  float fVar224;
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [32];
  undefined1 auVar227 [32];
  undefined1 auVar228 [16];
  undefined1 auVar111 [32];
  undefined1 auVar118 [32];
  undefined1 auVar79 [16];
  undefined1 auVar106 [32];
  undefined1 auVar113 [32];
  
  iVar59 = 0;
  auVar124 = vbroadcastss_avx512f(ZEXT416(0xff7fffff));
  pauVar63 = (undefined1 (*) [64])_maxptr;
  for (; iVar59 + 0xf < size1; iVar59 = iVar59 + 0x10) {
    *pauVar63 = auVar124;
    pauVar63 = pauVar63 + 1;
  }
  for (; iVar59 + 7 < size1; iVar59 = iVar59 + 8) {
    *(float *)*pauVar63 = -3.4028235e+38;
    *(float *)((long)*pauVar63 + 4) = -3.4028235e+38;
    *(float *)((long)*pauVar63 + 8) = -3.4028235e+38;
    *(float *)((long)*pauVar63 + 0xc) = -3.4028235e+38;
    *(float *)((long)*pauVar63 + 0x10) = -3.4028235e+38;
    *(float *)((long)*pauVar63 + 0x14) = -3.4028235e+38;
    *(float *)((long)*pauVar63 + 0x18) = -3.4028235e+38;
    *(float *)((long)*pauVar63 + 0x1c) = -3.4028235e+38;
    pauVar63 = (undefined1 (*) [64])((long)*pauVar63 + 0x20);
  }
  for (; iVar59 + 3 < size1; iVar59 = iVar59 + 4) {
    *(float *)*pauVar63 = -3.4028235e+38;
    *(float *)((long)*pauVar63 + 4) = -3.4028235e+38;
    *(float *)((long)*pauVar63 + 8) = -3.4028235e+38;
    *(float *)((long)*pauVar63 + 0xc) = -3.4028235e+38;
    pauVar63 = (undefined1 (*) [64])((long)*pauVar63 + 0x10);
  }
  for (; iVar59 < size1; iVar59 = iVar59 + 1) {
    *(float *)*pauVar63 = -3.4028235e+38;
    pauVar63 = (undefined1 (*) [64])((long)*pauVar63 + 4);
  }
  pauVar63 = (undefined1 (*) [64])_sumptr;
  for (iVar59 = 0; iVar59 + 0xf < size1; iVar59 = iVar59 + 0x10) {
    *pauVar63 = ZEXT864(0) << 0x20;
    pauVar63 = pauVar63 + 1;
  }
  for (; iVar59 + 7 < size1; iVar59 = iVar59 + 8) {
    *(undefined1 (*) [32])*pauVar63 = ZEXT432(0) << 0x20;
    pauVar63 = (undefined1 (*) [64])(*pauVar63 + 0x20);
  }
  for (; iVar59 + 3 < size1; iVar59 = iVar59 + 4) {
    *(undefined1 (*) [16])*pauVar63 = ZEXT816(0) << 0x20;
    pauVar63 = (undefined1 (*) [64])(*pauVar63 + 0x10);
  }
  for (; auVar125 = _DAT_0053d1c0, auVar124 = _DAT_0053d000, iVar59 < size1; iVar59 = iVar59 + 1) {
    *(undefined4 *)*pauVar63 = 0;
    pauVar63 = (undefined1 (*) [64])(*pauVar63 + 4);
  }
  lVar70 = (long)stride;
  if (elempack == 1) {
    uVar60 = 0;
    uVar72 = (ulong)(uint)elemcount;
    if (elemcount < 1) {
      uVar72 = 0;
    }
    for (; uVar60 != uVar72; uVar60 = uVar60 + 1) {
      pauVar62 = (undefined1 (*) [64])(_ptr + uVar60 * lVar70);
      pauVar63 = (undefined1 (*) [64])_maxptr;
      for (iVar59 = 0; iVar59 + 0xf < size1; iVar59 = iVar59 + 0x10) {
        auVar124 = vmaxps_avx512f(*pauVar63,*pauVar62);
        *pauVar63 = auVar124;
        pauVar62 = pauVar62 + 1;
        pauVar63 = pauVar63 + 1;
      }
      for (; iVar59 + 7 < size1; iVar59 = iVar59 + 8) {
        auVar99 = vmaxps_avx(*(undefined1 (*) [32])*pauVar63,*(undefined1 (*) [32])*pauVar62);
        *(undefined1 (*) [32])*pauVar63 = auVar99;
        pauVar62 = (undefined1 (*) [64])(*pauVar62 + 0x20);
        pauVar63 = (undefined1 (*) [64])(*pauVar63 + 0x20);
      }
      for (; iVar59 + 3 < size1; iVar59 = iVar59 + 4) {
        auVar75 = vmaxps_avx(*(undefined1 (*) [16])*pauVar63,*(undefined1 (*) [16])*pauVar62);
        *(undefined1 (*) [16])*pauVar63 = auVar75;
        pauVar62 = (undefined1 (*) [64])(*pauVar62 + 0x10);
        pauVar63 = (undefined1 (*) [64])(*pauVar63 + 0x10);
      }
      lVar64 = 0;
      for (; iVar59 < size1; iVar59 = iVar59 + 1) {
        auVar75 = vmaxss_avx(ZEXT416(*(uint *)(*pauVar62 + lVar64)),
                             ZEXT416(*(uint *)(*pauVar63 + lVar64)));
        *(int *)(*pauVar63 + lVar64) = auVar75._0_4_;
        lVar64 = lVar64 + 4;
      }
    }
    auVar124 = vbroadcastss_avx512f(ZEXT416(0x80000000));
    auVar125 = vxorps_avx512dq(auVar124,(undefined1  [64])::_ps512_cephes_exp_C1);
    auVar124 = vxorps_avx512dq(auVar124,(undefined1  [64])::_ps512_cephes_exp_C2);
    for (uVar60 = 0; uVar60 != uVar72; uVar60 = uVar60 + 1) {
      pauVar63 = (undefined1 (*) [64])(_ptr + uVar60 * lVar70);
      pauVar62 = (undefined1 (*) [64])_maxptr;
      pauVar73 = (undefined1 (*) [64])_sumptr;
      for (iVar59 = 0; iVar59 + 0xf < size1; iVar59 = iVar59 + 0x10) {
        auVar126 = vsubps_avx512f(*pauVar63,*pauVar62);
        auVar126 = vminps_avx512f(auVar126,(undefined1  [64])::_ps512_exp_hi);
        auVar126 = vmaxps_avx512f(auVar126,(undefined1  [64])::_ps512_exp_lo);
        auVar127 = vfmadd213ps_avx512f((undefined1  [64])::_ps512_cephes_LOG2EF,auVar126,
                                       (undefined1  [64])::_ps512_cephes_exp_p5);
        auVar128 = vrndscaleps_avx512f(auVar127,1);
        uVar6 = vcmpps_avx512f(auVar127,auVar128,1);
        auVar129 = vsubps_avx512f(auVar128,(undefined1  [64])::_ps512_1);
        bVar5 = (bool)((byte)uVar6 & 1);
        auVar127._0_4_ = (uint)bVar5 * auVar129._0_4_ | (uint)!bVar5 * auVar128._0_4_;
        bVar5 = (bool)((byte)(uVar6 >> 1) & 1);
        auVar127._4_4_ = (uint)bVar5 * auVar129._4_4_ | (uint)!bVar5 * auVar128._4_4_;
        bVar5 = (bool)((byte)(uVar6 >> 2) & 1);
        auVar127._8_4_ = (uint)bVar5 * auVar129._8_4_ | (uint)!bVar5 * auVar128._8_4_;
        bVar5 = (bool)((byte)(uVar6 >> 3) & 1);
        auVar127._12_4_ = (uint)bVar5 * auVar129._12_4_ | (uint)!bVar5 * auVar128._12_4_;
        bVar5 = (bool)((byte)(uVar6 >> 4) & 1);
        auVar127._16_4_ = (uint)bVar5 * auVar129._16_4_ | (uint)!bVar5 * auVar128._16_4_;
        bVar5 = (bool)((byte)(uVar6 >> 5) & 1);
        auVar127._20_4_ = (uint)bVar5 * auVar129._20_4_ | (uint)!bVar5 * auVar128._20_4_;
        bVar5 = (bool)((byte)(uVar6 >> 6) & 1);
        auVar127._24_4_ = (uint)bVar5 * auVar129._24_4_ | (uint)!bVar5 * auVar128._24_4_;
        bVar5 = (bool)((byte)(uVar6 >> 7) & 1);
        auVar127._28_4_ = (uint)bVar5 * auVar129._28_4_ | (uint)!bVar5 * auVar128._28_4_;
        bVar5 = (bool)((byte)(uVar6 >> 8) & 1);
        auVar127._32_4_ = (uint)bVar5 * auVar129._32_4_ | (uint)!bVar5 * auVar128._32_4_;
        bVar5 = (bool)((byte)(uVar6 >> 9) & 1);
        auVar127._36_4_ = (uint)bVar5 * auVar129._36_4_ | (uint)!bVar5 * auVar128._36_4_;
        bVar5 = (bool)((byte)(uVar6 >> 10) & 1);
        auVar127._40_4_ = (uint)bVar5 * auVar129._40_4_ | (uint)!bVar5 * auVar128._40_4_;
        bVar5 = (bool)((byte)(uVar6 >> 0xb) & 1);
        auVar127._44_4_ = (uint)bVar5 * auVar129._44_4_ | (uint)!bVar5 * auVar128._44_4_;
        bVar5 = (bool)((byte)(uVar6 >> 0xc) & 1);
        auVar127._48_4_ = (uint)bVar5 * auVar129._48_4_ | (uint)!bVar5 * auVar128._48_4_;
        bVar5 = (bool)((byte)(uVar6 >> 0xd) & 1);
        auVar127._52_4_ = (uint)bVar5 * auVar129._52_4_ | (uint)!bVar5 * auVar128._52_4_;
        bVar5 = (bool)((byte)(uVar6 >> 0xe) & 1);
        auVar127._56_4_ = (uint)bVar5 * auVar129._56_4_ | (uint)!bVar5 * auVar128._56_4_;
        bVar5 = SUB81(uVar6 >> 0xf,0);
        auVar127._60_4_ = (uint)bVar5 * auVar129._60_4_ | (uint)!bVar5 * auVar128._60_4_;
        auVar126 = vfmadd231ps_avx512f(auVar126,auVar127,auVar125);
        auVar126 = vfmadd231ps_avx512f(auVar126,auVar127,auVar124);
        auVar128 = vmulps_avx512f(auVar126,auVar126);
        auVar129 = vfmadd132ps_avx512f(auVar126,(undefined1  [64])::_ps512_cephes_exp_p1,
                                       (undefined1  [64])::_ps512_cephes_exp_p0);
        auVar129 = vfmadd213ps_avx512f(auVar129,auVar126,(undefined1  [64])::_ps512_cephes_exp_p2);
        auVar129 = vfmadd213ps_avx512f(auVar129,auVar126,(undefined1  [64])::_ps512_cephes_exp_p3);
        auVar129 = vfmadd213ps_avx512f(auVar129,auVar126,(undefined1  [64])::_ps512_cephes_exp_p4);
        auVar129 = vfmadd213ps_avx512f(auVar129,auVar126,(undefined1  [64])::_ps512_cephes_exp_p5);
        auVar126 = vfmadd213ps_avx512f(auVar129,auVar128,auVar126);
        auVar126 = vaddps_avx512f(auVar126,(undefined1  [64])::_ps512_1);
        auVar127 = vcvttps2dq_avx512f(auVar127);
        auVar127 = vpaddd_avx512f(auVar127,(undefined1  [64])::_pi32_512_0x7f);
        auVar127 = vpslld_avx512f(auVar127,0x17);
        auVar126 = vmulps_avx512f(auVar126,auVar127);
        auVar127 = vaddps_avx512f(auVar126,*pauVar73);
        *pauVar63 = auVar126;
        *pauVar73 = auVar127;
        pauVar63 = pauVar63 + 1;
        pauVar62 = pauVar62 + 1;
        pauVar73 = pauVar73 + 1;
      }
      lVar64 = 0;
      for (; iVar59 + 7 < size1; iVar59 = iVar59 + 8) {
        auVar99 = vsubps_avx(*(undefined1 (*) [32])(*pauVar63 + lVar64),
                             *(undefined1 (*) [32])(*pauVar62 + lVar64));
        auVar100._8_4_ = 0x42b0c0a5;
        auVar100._0_8_ = 0x42b0c0a542b0c0a5;
        auVar100._12_4_ = 0x42b0c0a5;
        auVar100._16_4_ = 0x42b0c0a5;
        auVar100._20_4_ = 0x42b0c0a5;
        auVar100._24_4_ = 0x42b0c0a5;
        auVar100._28_4_ = 0x42b0c0a5;
        auVar100 = vminps_avx512vl(auVar99,auVar100);
        auVar99._8_4_ = 0xc2b0c0a5;
        auVar99._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar99._12_4_ = 0xc2b0c0a5;
        auVar99._16_4_ = 0xc2b0c0a5;
        auVar99._20_4_ = 0xc2b0c0a5;
        auVar99._24_4_ = 0xc2b0c0a5;
        auVar99._28_4_ = 0xc2b0c0a5;
        auVar100 = vmaxps_avx512vl(auVar100,auVar99);
        auVar106._8_4_ = 0x3f000000;
        auVar106._0_8_ = 0x3f0000003f000000;
        auVar106._12_4_ = 0x3f000000;
        auVar106._16_4_ = 0x3f000000;
        auVar106._20_4_ = 0x3f000000;
        auVar106._24_4_ = 0x3f000000;
        auVar106._28_4_ = 0x3f000000;
        auVar101._8_4_ = 0x3fb8aa3b;
        auVar101._0_8_ = 0x3fb8aa3b3fb8aa3b;
        auVar101._12_4_ = 0x3fb8aa3b;
        auVar101._16_4_ = 0x3fb8aa3b;
        auVar101._20_4_ = 0x3fb8aa3b;
        auVar101._24_4_ = 0x3fb8aa3b;
        auVar101._28_4_ = 0x3fb8aa3b;
        auVar101 = vfmadd231ps_avx512vl(auVar106,auVar100,auVar101);
        auVar99 = vroundps_avx(auVar101,1);
        uVar6 = vcmpps_avx512vl(auVar101,auVar99,1);
        auVar91._8_4_ = 0xbf800000;
        auVar91._0_8_ = 0xbf800000bf800000;
        auVar91._12_4_ = 0xbf800000;
        auVar91._16_4_ = 0xbf800000;
        auVar91._20_4_ = 0xbf800000;
        auVar91._24_4_ = 0xbf800000;
        auVar91._28_4_ = 0xbf800000;
        auVar91 = vaddps_avx512vl(auVar99,auVar91);
        bVar5 = (bool)((byte)uVar6 & 1);
        auVar122._0_4_ = (float)((uint)bVar5 * auVar91._0_4_ | (uint)!bVar5 * auVar99._0_4_);
        bVar5 = (bool)((byte)(uVar6 >> 1) & 1);
        auVar122._4_4_ = (float)((uint)bVar5 * auVar91._4_4_ | (uint)!bVar5 * auVar99._4_4_);
        bVar5 = (bool)((byte)(uVar6 >> 2) & 1);
        auVar122._8_4_ = (float)((uint)bVar5 * auVar91._8_4_ | (uint)!bVar5 * auVar99._8_4_);
        bVar5 = (bool)((byte)(uVar6 >> 3) & 1);
        auVar122._12_4_ = (float)((uint)bVar5 * auVar91._12_4_ | (uint)!bVar5 * auVar99._12_4_);
        bVar5 = (bool)((byte)(uVar6 >> 4) & 1);
        auVar122._16_4_ = (float)((uint)bVar5 * auVar91._16_4_ | (uint)!bVar5 * auVar99._16_4_);
        bVar5 = (bool)((byte)(uVar6 >> 5) & 1);
        auVar122._20_4_ = (float)((uint)bVar5 * auVar91._20_4_ | (uint)!bVar5 * auVar99._20_4_);
        bVar5 = (bool)((byte)(uVar6 >> 6) & 1);
        auVar122._24_4_ = (float)((uint)bVar5 * auVar91._24_4_ | (uint)!bVar5 * auVar99._24_4_);
        bVar5 = SUB81(uVar6 >> 7,0);
        auVar122._28_4_ = (float)((uint)bVar5 * auVar91._28_4_ | (uint)!bVar5 * auVar99._28_4_);
        auVar92._8_4_ = 0x3f318000;
        auVar92._0_8_ = 0x3f3180003f318000;
        auVar92._12_4_ = 0x3f318000;
        auVar92._16_4_ = 0x3f318000;
        auVar92._20_4_ = 0x3f318000;
        auVar92._24_4_ = 0x3f318000;
        auVar92._28_4_ = 0x3f318000;
        auVar99 = vfmsub231ps_avx512vl(auVar100,auVar122,auVar92);
        auVar93._8_4_ = 0x395e8083;
        auVar93._0_8_ = 0x395e8083395e8083;
        auVar93._12_4_ = 0x395e8083;
        auVar93._16_4_ = 0x395e8083;
        auVar93._20_4_ = 0x395e8083;
        auVar93._24_4_ = 0x395e8083;
        auVar93._28_4_ = 0x395e8083;
        auVar99 = vfmsub231ps_avx512vl(auVar99,auVar122,auVar93);
        auVar121._4_4_ = auVar99._4_4_ * auVar99._4_4_;
        auVar121._0_4_ = auVar99._0_4_ * auVar99._0_4_;
        auVar121._8_4_ = auVar99._8_4_ * auVar99._8_4_;
        auVar121._12_4_ = auVar99._12_4_ * auVar99._12_4_;
        auVar121._16_4_ = auVar99._16_4_ * auVar99._16_4_;
        auVar121._20_4_ = auVar99._20_4_ * auVar99._20_4_;
        auVar121._24_4_ = auVar99._24_4_ * auVar99._24_4_;
        auVar121._28_4_ = auVar101._28_4_;
        auVar105._8_4_ = 0x39506967;
        auVar105._0_8_ = 0x3950696739506967;
        auVar105._12_4_ = 0x39506967;
        auVar105._16_4_ = 0x39506967;
        auVar105._20_4_ = 0x39506967;
        auVar105._24_4_ = 0x39506967;
        auVar105._28_4_ = 0x39506967;
        auVar94._8_4_ = 0x3ab743ce;
        auVar94._0_8_ = 0x3ab743ce3ab743ce;
        auVar94._12_4_ = 0x3ab743ce;
        auVar94._16_4_ = 0x3ab743ce;
        auVar94._20_4_ = 0x3ab743ce;
        auVar94._24_4_ = 0x3ab743ce;
        auVar94._28_4_ = 0x3ab743ce;
        auVar100 = vfmadd213ps_avx512vl(auVar105,auVar99,auVar94);
        auVar95._8_4_ = 0x3c088908;
        auVar95._0_8_ = 0x3c0889083c088908;
        auVar95._12_4_ = 0x3c088908;
        auVar95._16_4_ = 0x3c088908;
        auVar95._20_4_ = 0x3c088908;
        auVar95._24_4_ = 0x3c088908;
        auVar95._28_4_ = 0x3c088908;
        auVar100 = vfmadd213ps_avx512vl(auVar100,auVar99,auVar95);
        auVar102._8_4_ = 0x3d2aa9c1;
        auVar102._0_8_ = 0x3d2aa9c13d2aa9c1;
        auVar102._12_4_ = 0x3d2aa9c1;
        auVar102._16_4_ = 0x3d2aa9c1;
        auVar102._20_4_ = 0x3d2aa9c1;
        auVar102._24_4_ = 0x3d2aa9c1;
        auVar102._28_4_ = 0x3d2aa9c1;
        auVar100 = vfmadd213ps_avx512vl(auVar100,auVar99,auVar102);
        auVar103._8_4_ = 0x3e2aaaaa;
        auVar103._0_8_ = 0x3e2aaaaa3e2aaaaa;
        auVar103._12_4_ = 0x3e2aaaaa;
        auVar103._16_4_ = 0x3e2aaaaa;
        auVar103._20_4_ = 0x3e2aaaaa;
        auVar103._24_4_ = 0x3e2aaaaa;
        auVar103._28_4_ = 0x3e2aaaaa;
        auVar100 = vfmadd213ps_avx512vl(auVar100,auVar99,auVar103);
        auVar75 = vfmadd213ps_fma(auVar100,auVar99,auVar106);
        auVar75 = vfmadd213ps_fma(ZEXT1632(auVar75),auVar121,auVar99);
        auVar104._0_4_ = (int)auVar122._0_4_;
        auVar104._4_4_ = (int)auVar122._4_4_;
        auVar104._8_4_ = (int)auVar122._8_4_;
        auVar104._12_4_ = (int)auVar122._12_4_;
        auVar104._16_4_ = (int)auVar122._16_4_;
        auVar104._20_4_ = (int)auVar122._20_4_;
        auVar104._24_4_ = (int)auVar122._24_4_;
        auVar104._28_4_ = (int)auVar122._28_4_;
        auVar99 = vpslld_avx2(auVar104,0x17);
        auVar120._8_4_ = 0x3f800000;
        auVar120._0_8_ = 0x3f8000003f800000;
        auVar120._12_4_ = 0x3f800000;
        auVar120._16_4_ = 0x3f800000;
        auVar120._20_4_ = 0x3f800000;
        auVar120._24_4_ = 0x3f800000;
        auVar120._28_4_ = 0x3f800000;
        auVar99 = vpaddd_avx512vl(auVar99,auVar120);
        auVar75 = vfmadd213ps_fma(auVar99,ZEXT1632(auVar75),auVar99);
        pfVar65 = (float *)(*pauVar73 + lVar64);
        auVar108._0_4_ = auVar75._0_4_ + *pfVar65;
        auVar108._4_4_ = auVar75._4_4_ + pfVar65[1];
        auVar108._8_4_ = auVar75._8_4_ + pfVar65[2];
        auVar108._12_4_ = auVar75._12_4_ + pfVar65[3];
        auVar108._16_4_ = pfVar65[4] + 0.0;
        auVar108._20_4_ = pfVar65[5] + 0.0;
        auVar108._24_4_ = pfVar65[6] + 0.0;
        auVar108._28_4_ = pfVar65[7] + 0.0;
        *(undefined1 (*) [32])(*pauVar63 + lVar64) = ZEXT1632(auVar75);
        *(undefined1 (*) [32])(*pauVar73 + lVar64) = auVar108;
        lVar64 = lVar64 + 0x20;
      }
      pauVar74 = (undefined1 (*) [16])(*pauVar73 + lVar64);
      pauVar71 = (undefined1 (*) [16])(*pauVar62 + lVar64);
      pauVar66 = (undefined1 (*) [16])(*pauVar63 + lVar64);
      for (; iVar59 + 3 < size1; iVar59 = iVar59 + 4) {
        auVar75 = vsubps_avx(*pauVar66,*pauVar71);
        auVar89._8_4_ = 0x42b0c0a5;
        auVar89._0_8_ = 0x42b0c0a542b0c0a5;
        auVar89._12_4_ = 0x42b0c0a5;
        auVar89 = vminps_avx512vl(auVar75,auVar89);
        auVar75._8_4_ = 0xc2b0c0a5;
        auVar75._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar75._12_4_ = 0xc2b0c0a5;
        auVar89 = vmaxps_avx512vl(auVar89,auVar75);
        auVar204._8_4_ = 0x3f000000;
        auVar204._0_8_ = 0x3f0000003f000000;
        auVar204._12_4_ = 0x3f000000;
        auVar90._8_4_ = 0x3fb8aa3b;
        auVar90._0_8_ = 0x3fb8aa3b3fb8aa3b;
        auVar90._12_4_ = 0x3fb8aa3b;
        auVar90 = vfmadd231ps_avx512vl(auVar204,auVar89,auVar90);
        auVar84._0_4_ = (int)auVar90._0_4_;
        auVar84._4_4_ = (int)auVar90._4_4_;
        auVar84._8_4_ = (int)auVar90._8_4_;
        auVar84._12_4_ = (int)auVar90._12_4_;
        auVar75 = vcvtdq2ps_avx(auVar84);
        uVar6 = vcmpps_avx512vl(auVar90,auVar75,1);
        auVar210._8_4_ = 0xbf800000;
        auVar210._0_8_ = 0xbf800000bf800000;
        auVar210._12_4_ = 0xbf800000;
        auVar90 = vaddps_avx512vl(auVar75,auVar210);
        bVar5 = (bool)((byte)uVar6 & 1);
        auVar78._0_4_ = (float)((uint)bVar5 * auVar90._0_4_ | (uint)!bVar5 * auVar75._0_4_);
        bVar5 = (bool)((byte)(uVar6 >> 1) & 1);
        auVar78._4_4_ = (float)((uint)bVar5 * auVar90._4_4_ | (uint)!bVar5 * auVar75._4_4_);
        bVar5 = (bool)((byte)(uVar6 >> 2) & 1);
        auVar78._8_4_ = (float)((uint)bVar5 * auVar90._8_4_ | (uint)!bVar5 * auVar75._8_4_);
        bVar5 = (bool)((byte)(uVar6 >> 3) & 1);
        auVar78._12_4_ = (float)((uint)bVar5 * auVar90._12_4_ | (uint)!bVar5 * auVar75._12_4_);
        auVar214._8_4_ = 0x3f318000;
        auVar214._0_8_ = 0x3f3180003f318000;
        auVar214._12_4_ = 0x3f318000;
        auVar75 = vfmsub231ps_avx512vl(auVar89,auVar78,auVar214);
        auVar216._8_4_ = 0x395e8083;
        auVar216._0_8_ = 0x395e8083395e8083;
        auVar216._12_4_ = 0x395e8083;
        auVar89 = vfmsub231ps_avx512vl(auVar75,auVar78,auVar216);
        auVar81._0_4_ = auVar89._0_4_ * auVar89._0_4_;
        auVar81._4_4_ = auVar89._4_4_ * auVar89._4_4_;
        auVar81._8_4_ = auVar89._8_4_ * auVar89._8_4_;
        auVar81._12_4_ = auVar89._12_4_ * auVar89._12_4_;
        auVar86._8_4_ = 0x39506967;
        auVar86._0_8_ = 0x3950696739506967;
        auVar86._12_4_ = 0x39506967;
        auVar221._8_4_ = 0x3ab743ce;
        auVar221._0_8_ = 0x3ab743ce3ab743ce;
        auVar221._12_4_ = 0x3ab743ce;
        auVar75 = vfmadd213ps_avx512vl(auVar86,auVar89,auVar221);
        auVar225._8_4_ = 0x3c088908;
        auVar225._0_8_ = 0x3c0889083c088908;
        auVar225._12_4_ = 0x3c088908;
        auVar75 = vfmadd213ps_avx512vl(auVar75,auVar89,auVar225);
        auVar228._8_4_ = 0x3d2aa9c1;
        auVar228._0_8_ = 0x3d2aa9c13d2aa9c1;
        auVar228._12_4_ = 0x3d2aa9c1;
        auVar75 = vfmadd213ps_avx512vl(auVar75,auVar89,auVar228);
        auVar76._8_4_ = 0x3e2aaaaa;
        auVar76._0_8_ = 0x3e2aaaaa3e2aaaaa;
        auVar76._12_4_ = 0x3e2aaaaa;
        auVar75 = vfmadd213ps_avx512vl(auVar75,auVar89,auVar76);
        auVar75 = vfmadd213ps_fma(auVar75,auVar89,auVar204);
        auVar75 = vfmadd213ps_fma(auVar75,auVar81,auVar89);
        auVar79._0_4_ = (int)auVar78._0_4_;
        auVar79._4_4_ = (int)auVar78._4_4_;
        auVar79._8_4_ = (int)auVar78._8_4_;
        auVar79._12_4_ = (int)auVar78._12_4_;
        auVar89 = vpslld_avx(auVar79,0x17);
        auVar77._8_4_ = 0x3f800000;
        auVar77._0_8_ = 0x3f8000003f800000;
        auVar77._12_4_ = 0x3f800000;
        auVar89 = vpaddd_avx512vl(auVar89,auVar77);
        auVar75 = vfmadd213ps_fma(auVar89,auVar75,auVar89);
        auVar82._0_4_ = auVar75._0_4_ + *(float *)*pauVar74;
        auVar82._4_4_ = auVar75._4_4_ + *(float *)(*pauVar74 + 4);
        auVar82._8_4_ = auVar75._8_4_ + *(float *)(*pauVar74 + 8);
        auVar82._12_4_ = auVar75._12_4_ + *(float *)(*pauVar74 + 0xc);
        *pauVar66 = auVar75;
        *pauVar74 = auVar82;
        pauVar66 = pauVar66 + 1;
        pauVar71 = pauVar71 + 1;
        pauVar74 = pauVar74 + 1;
      }
      lVar64 = 0;
      for (; iVar59 < size1; iVar59 = iVar59 + 1) {
        fVar224 = expf(*(float *)(*pauVar66 + lVar64) - *(float *)(*pauVar71 + lVar64));
        *(float *)(*pauVar66 + lVar64) = fVar224;
        *(float *)(*pauVar74 + lVar64) = fVar224 + *(float *)(*pauVar74 + lVar64);
        lVar64 = lVar64 + 4;
      }
    }
    iVar59 = 0;
    auVar124 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
    pauVar63 = (undefined1 (*) [64])_sumptr;
    for (; iVar59 + 0xf < size1; iVar59 = iVar59 + 0x10) {
      auVar125 = vdivps_avx512f(auVar124,*pauVar63);
      *pauVar63 = auVar125;
      pauVar63 = pauVar63 + 1;
    }
    auVar109._8_4_ = 0x3f800000;
    auVar109._0_8_ = 0x3f8000003f800000;
    auVar109._12_4_ = 0x3f800000;
    auVar109._16_4_ = 0x3f800000;
    auVar109._20_4_ = 0x3f800000;
    auVar109._24_4_ = 0x3f800000;
    auVar109._28_4_ = 0x3f800000;
    for (; iVar59 + 7 < size1; iVar59 = iVar59 + 8) {
      auVar99 = vdivps_avx(auVar109,*(undefined1 (*) [32])*pauVar63);
      *(undefined1 (*) [32])*pauVar63 = auVar99;
      pauVar63 = (undefined1 (*) [64])(*pauVar63 + 0x20);
    }
    auVar169._8_4_ = 0x3f800000;
    auVar169._0_8_ = 0x3f8000003f800000;
    auVar169._12_4_ = 0x3f800000;
    for (; iVar59 + 3 < size1; iVar59 = iVar59 + 4) {
      auVar75 = vdivps_avx(auVar169,*(undefined1 (*) [16])*pauVar63);
      *(undefined1 (*) [16])*pauVar63 = auVar75;
      pauVar63 = (undefined1 (*) [64])(*pauVar63 + 0x10);
    }
    for (; iVar59 < size1; iVar59 = iVar59 + 1) {
      *(float *)*pauVar63 = 1.0 / *(float *)*pauVar63;
      pauVar63 = (undefined1 (*) [64])(*pauVar63 + 4);
    }
    for (uVar60 = 0; uVar60 != uVar72; uVar60 = uVar60 + 1) {
      pauVar62 = (undefined1 (*) [64])(_ptr + uVar60 * lVar70);
      pauVar63 = (undefined1 (*) [64])_sumptr;
      for (iVar59 = 0; iVar59 + 0xf < size1; iVar59 = iVar59 + 0x10) {
        auVar124 = vmulps_avx512f(*pauVar63,*pauVar62);
        *pauVar62 = auVar124;
        pauVar62 = pauVar62 + 1;
        pauVar63 = pauVar63 + 1;
      }
      for (; iVar59 + 7 < size1; iVar59 = iVar59 + 8) {
        auVar110._4_4_ = *(float *)(*pauVar63 + 4) * *(float *)(*pauVar62 + 4);
        auVar110._0_4_ = *(float *)*pauVar63 * *(float *)*pauVar62;
        auVar110._8_4_ = *(float *)(*pauVar63 + 8) * *(float *)(*pauVar62 + 8);
        auVar110._12_4_ = *(float *)(*pauVar63 + 0xc) * *(float *)(*pauVar62 + 0xc);
        auVar110._16_4_ = *(float *)(*pauVar63 + 0x10) * *(float *)(*pauVar62 + 0x10);
        auVar110._20_4_ = *(float *)(*pauVar63 + 0x14) * *(float *)(*pauVar62 + 0x14);
        auVar110._24_4_ = *(float *)(*pauVar63 + 0x18) * *(float *)(*pauVar62 + 0x18);
        auVar110._28_4_ = *(undefined4 *)(*pauVar63 + 0x1c);
        *(undefined1 (*) [32])*pauVar62 = auVar110;
        pauVar62 = (undefined1 (*) [64])(*pauVar62 + 0x20);
        pauVar63 = (undefined1 (*) [64])(*pauVar63 + 0x20);
      }
      for (; iVar59 + 3 < size1; iVar59 = iVar59 + 4) {
        auVar170._0_4_ = *(float *)*pauVar63 * *(float *)*pauVar62;
        auVar170._4_4_ = *(float *)(*pauVar63 + 4) * *(float *)(*pauVar62 + 4);
        auVar170._8_4_ = *(float *)(*pauVar63 + 8) * *(float *)(*pauVar62 + 8);
        auVar170._12_4_ = *(float *)(*pauVar63 + 0xc) * *(float *)(*pauVar62 + 0xc);
        *(undefined1 (*) [16])*pauVar62 = auVar170;
        pauVar62 = (undefined1 (*) [64])(*pauVar62 + 0x10);
        pauVar63 = (undefined1 (*) [64])(*pauVar63 + 0x10);
      }
      lVar64 = 0;
      for (; iVar59 < size1; iVar59 = iVar59 + 1) {
        *(float *)(*pauVar62 + lVar64) =
             *(float *)(*pauVar62 + lVar64) * *(float *)(*pauVar63 + lVar64);
        lVar64 = lVar64 + 4;
      }
    }
  }
  else if (elempack == 4) {
    uVar60 = 0;
    if (elemcount < 1) {
      elemcount = 0;
    }
    uVar72 = (ulong)(uint)elemcount;
    for (; afVar51 = ::_ps512_cephes_exp_p5, uVar60 != uVar72; uVar60 = uVar60 + 1) {
      pauVar62 = (undefined1 (*) [64])(_ptr + uVar60 * lVar70);
      pauVar63 = (undefined1 (*) [64])_maxptr;
      for (iVar59 = 0; iVar59 + 0xf < size1; iVar59 = iVar59 + 0x10) {
        auVar125 = vunpcklps_avx512f(*pauVar62,pauVar62[1]);
        auVar126 = vunpckhps_avx512f(*pauVar62,pauVar62[1]);
        auVar125 = vmaxps_avx512f(auVar125,auVar126);
        auVar126 = vunpcklps_avx512f(pauVar62[2],pauVar62[3]);
        auVar127 = vunpckhps_avx512f(pauVar62[2],pauVar62[3]);
        auVar126 = vmaxps_avx512f(auVar126,auVar127);
        auVar127 = vunpcklps_avx512f(auVar125,auVar126);
        auVar125 = vunpckhps_avx512f(auVar125,auVar126);
        auVar125 = vmaxps_avx512f(auVar127,auVar125);
        auVar125 = vpermps_avx512f(auVar124,auVar125);
        auVar125 = vmaxps_avx512f(auVar125,*pauVar63);
        *pauVar63 = auVar125;
        pauVar62 = pauVar62 + 4;
        pauVar63 = pauVar63 + 1;
      }
      for (; iVar59 + 7 < size1; iVar59 = iVar59 + 8) {
        auVar100 = vunpcklps_avx(*(undefined1 (*) [32])*pauVar62,
                                 *(undefined1 (*) [32])(*pauVar62 + 0x20));
        auVar99 = vunpckhps_avx(*(undefined1 (*) [32])*pauVar62,
                                *(undefined1 (*) [32])(*pauVar62 + 0x20));
        auVar99 = vmaxps_avx(auVar100,auVar99);
        auVar101 = vunpcklps_avx(*(undefined1 (*) [32])pauVar62[1],
                                 *(undefined1 (*) [32])(pauVar62[1] + 0x20));
        auVar100 = vunpckhps_avx(*(undefined1 (*) [32])pauVar62[1],
                                 *(undefined1 (*) [32])(pauVar62[1] + 0x20));
        auVar100 = vmaxps_avx(auVar101,auVar100);
        auVar113._16_16_ = auVar100._0_16_;
        auVar113._0_16_ = auVar99._0_16_;
        auVar99 = vperm2f128_avx(auVar99,auVar100,0x31);
        auVar100 = vunpcklps_avx(auVar113,auVar99);
        auVar99 = vunpckhps_avx(auVar113,auVar99);
        auVar99 = vmaxps_avx(auVar100,auVar99);
        auVar99 = vmaxps_avx(auVar99,*(undefined1 (*) [32])*pauVar63);
        *(undefined1 (*) [32])*pauVar63 = auVar99;
        pauVar62 = pauVar62 + 2;
        pauVar63 = (undefined1 (*) [64])(*pauVar63 + 0x20);
      }
      for (; iVar59 + 3 < size1; iVar59 = iVar59 + 4) {
        auVar89 = vunpcklps_avx(*(undefined1 (*) [16])*pauVar62,
                                *(undefined1 (*) [16])(*pauVar62 + 0x10));
        auVar214 = vunpcklps_avx(*(undefined1 (*) [16])(*pauVar62 + 0x20),
                                 *(undefined1 (*) [16])(*pauVar62 + 0x30));
        auVar90 = vunpckhps_avx(*(undefined1 (*) [16])*pauVar62,
                                *(undefined1 (*) [16])(*pauVar62 + 0x10));
        auVar210 = vunpckhps_avx(*(undefined1 (*) [16])(*pauVar62 + 0x20),
                                 *(undefined1 (*) [16])(*pauVar62 + 0x30));
        auVar75 = vmovlhps_avx(auVar89,auVar214);
        auVar89 = vunpckhpd_avx(auVar89,auVar214);
        auVar75 = vmaxps_avx(auVar75,auVar89);
        auVar89 = vmovlhps_avx(auVar90,auVar210);
        auVar90 = vunpckhpd_avx(auVar90,auVar210);
        auVar89 = vmaxps_avx(auVar89,auVar90);
        auVar75 = vmaxps_avx(auVar75,auVar89);
        auVar75 = vmaxps_avx(auVar75,*(undefined1 (*) [16])*pauVar63);
        *(undefined1 (*) [16])*pauVar63 = auVar75;
        pauVar62 = pauVar62 + 1;
        pauVar63 = (undefined1 (*) [64])(*pauVar63 + 0x10);
      }
      lVar64 = 0;
      for (; iVar59 < size1; iVar59 = iVar59 + 1) {
        auVar180._8_8_ = *(undefined8 *)(*pauVar62 + lVar64 * 4 + 8);
        auVar180._0_8_ = *(undefined8 *)(*pauVar62 + lVar64 * 4 + 8);
        auVar75 = vmaxps_avx(auVar180,*(undefined1 (*) [16])(*pauVar62 + lVar64 * 4));
        auVar89 = vmovshdup_avx(auVar75);
        auVar75 = vmaxss_avx(auVar75,auVar89);
        auVar75 = vmaxss_avx(auVar75,ZEXT416(*(uint *)(*pauVar63 + lVar64)));
        *(int *)(*pauVar63 + lVar64) = auVar75._0_4_;
        lVar64 = lVar64 + 4;
      }
    }
    auVar124 = vbroadcastss_avx512f(ZEXT416(0x80000000));
    auVar125 = vxorps_avx512dq(auVar124,(undefined1  [64])::_ps512_cephes_exp_C1);
    auVar126 = vxorps_avx512dq(auVar124,(undefined1  [64])::_ps512_cephes_exp_C2);
    uVar60 = 0;
    auVar99 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
    auVar128 = ZEXT1664(CONCAT412(0x42b0c0a5,CONCAT48(0x42b0c0a5,0x42b0c0a542b0c0a5)));
    auVar129 = ZEXT1664(CONCAT412(0xc2b0c0a5,CONCAT48(0xc2b0c0a5,0xc2b0c0a5c2b0c0a5)));
    auVar127 = ZEXT1664(CONCAT412(0x3fb8aa3b,CONCAT48(0x3fb8aa3b,0x3fb8aa3b3fb8aa3b)));
    auVar183._8_4_ = 0x3f000000;
    auVar183._0_8_ = 0x3f0000003f000000;
    auVar183._12_4_ = 0x3f000000;
    auVar131 = ZEXT1664(CONCAT412(0x3f318000,CONCAT48(0x3f318000,0x3f3180003f318000)));
    auVar137 = ZEXT1664(CONCAT412(0x3ab743ce,CONCAT48(0x3ab743ce,0x3ab743ce3ab743ce)));
    auVar130 = ZEXT1664(CONCAT412(0x39506967,CONCAT48(0x39506967,0x3950696739506967)));
    auVar139 = ZEXT1664(CONCAT412(0x3c088908,CONCAT48(0x3c088908,0x3c0889083c088908)));
    auVar132 = ZEXT1664(CONCAT412(0x3d2aa9c1,CONCAT48(0x3d2aa9c1,0x3d2aa9c13d2aa9c1)));
    auVar75 = vbroadcastss_avx512vl(ZEXT416(0x3e2aaaaa));
    auVar141 = ZEXT1664(auVar75);
    pfVar65 = _ptr;
    auVar124 = _DAT_0053d180;
    afVar209 = ::_ps512_1;
    afVar207 = ::_ps512_exp_hi;
    for (; uVar60 != uVar72; uVar60 = uVar60 + 1) {
      pauVar66 = (undefined1 (*) [16])(_ptr + uVar60 * lVar70);
      lVar64 = 0;
      for (iVar59 = 0; iVar59 + 0xf < size1; iVar59 = iVar59 + 0x10) {
        auVar143 = *(undefined1 (*) [64])((long)_maxptr + lVar64);
        auVar145 = vpermps_avx512f(_DAT_0053d040,auVar143);
        auVar145 = vsubps_avx512f(*(undefined1 (*) [64])(pfVar65 + lVar64),auVar145);
        auVar147 = vpermps_avx512f(_DAT_0053d080,auVar143);
        auVar147 = vsubps_avx512f(*(undefined1 (*) [64])(pfVar65 + lVar64 + 0x10),auVar147);
        auVar149 = vpermps_avx512f(_DAT_0053d0c0,auVar143);
        auVar149 = vsubps_avx512f(*(undefined1 (*) [64])(pfVar65 + lVar64 + 0x20),auVar149);
        auVar143 = vpermps_avx512f(_DAT_0053d100,auVar143);
        auVar143 = vsubps_avx512f(*(undefined1 (*) [64])(pfVar65 + lVar64 + 0x30),auVar143);
        auVar145 = vminps_avx512f(auVar145,(undefined1  [64])afVar207);
        auVar145 = vmaxps_avx512f(auVar145,(undefined1  [64])::_ps512_exp_lo);
        auVar151 = vfmadd213ps_avx512f((undefined1  [64])::_ps512_cephes_LOG2EF,auVar145,
                                       (undefined1  [64])afVar51);
        auVar153 = vrndscaleps_avx512f(auVar151,1);
        uVar6 = vcmpps_avx512f(auVar151,auVar153,1);
        auVar151 = vsubps_avx512f(auVar153,(undefined1  [64])afVar209);
        bVar5 = (bool)((byte)uVar6 & 1);
        auVar155._0_4_ = (uint)bVar5 * auVar151._0_4_ | (uint)!bVar5 * auVar153._0_4_;
        bVar5 = (bool)((byte)(uVar6 >> 1) & 1);
        auVar155._4_4_ = (uint)bVar5 * auVar151._4_4_ | (uint)!bVar5 * auVar153._4_4_;
        bVar5 = (bool)((byte)(uVar6 >> 2) & 1);
        auVar155._8_4_ = (uint)bVar5 * auVar151._8_4_ | (uint)!bVar5 * auVar153._8_4_;
        bVar5 = (bool)((byte)(uVar6 >> 3) & 1);
        auVar155._12_4_ = (uint)bVar5 * auVar151._12_4_ | (uint)!bVar5 * auVar153._12_4_;
        bVar5 = (bool)((byte)(uVar6 >> 4) & 1);
        auVar155._16_4_ = (uint)bVar5 * auVar151._16_4_ | (uint)!bVar5 * auVar153._16_4_;
        bVar5 = (bool)((byte)(uVar6 >> 5) & 1);
        auVar155._20_4_ = (uint)bVar5 * auVar151._20_4_ | (uint)!bVar5 * auVar153._20_4_;
        bVar5 = (bool)((byte)(uVar6 >> 6) & 1);
        auVar155._24_4_ = (uint)bVar5 * auVar151._24_4_ | (uint)!bVar5 * auVar153._24_4_;
        bVar5 = (bool)((byte)(uVar6 >> 7) & 1);
        auVar155._28_4_ = (uint)bVar5 * auVar151._28_4_ | (uint)!bVar5 * auVar153._28_4_;
        bVar5 = (bool)((byte)(uVar6 >> 8) & 1);
        auVar155._32_4_ = (uint)bVar5 * auVar151._32_4_ | (uint)!bVar5 * auVar153._32_4_;
        bVar5 = (bool)((byte)(uVar6 >> 9) & 1);
        auVar155._36_4_ = (uint)bVar5 * auVar151._36_4_ | (uint)!bVar5 * auVar153._36_4_;
        bVar5 = (bool)((byte)(uVar6 >> 10) & 1);
        auVar155._40_4_ = (uint)bVar5 * auVar151._40_4_ | (uint)!bVar5 * auVar153._40_4_;
        bVar5 = (bool)((byte)(uVar6 >> 0xb) & 1);
        auVar155._44_4_ = (uint)bVar5 * auVar151._44_4_ | (uint)!bVar5 * auVar153._44_4_;
        bVar5 = (bool)((byte)(uVar6 >> 0xc) & 1);
        auVar155._48_4_ = (uint)bVar5 * auVar151._48_4_ | (uint)!bVar5 * auVar153._48_4_;
        bVar5 = (bool)((byte)(uVar6 >> 0xd) & 1);
        auVar155._52_4_ = (uint)bVar5 * auVar151._52_4_ | (uint)!bVar5 * auVar153._52_4_;
        bVar5 = (bool)((byte)(uVar6 >> 0xe) & 1);
        auVar155._56_4_ = (uint)bVar5 * auVar151._56_4_ | (uint)!bVar5 * auVar153._56_4_;
        bVar5 = SUB81(uVar6 >> 0xf,0);
        auVar155._60_4_ = (uint)bVar5 * auVar151._60_4_ | (uint)!bVar5 * auVar153._60_4_;
        auVar145 = vfmadd231ps_avx512f(auVar145,auVar155,auVar125);
        auVar145 = vfmadd231ps_avx512f(auVar145,auVar155,auVar126);
        auVar151 = vmulps_avx512f(auVar145,auVar145);
        auVar153 = vfmadd213ps_avx512f(auVar145,(undefined1  [64])::_ps512_cephes_exp_p0,
                                       (undefined1  [64])::_ps512_cephes_exp_p1);
        auVar153 = vfmadd213ps_avx512f(auVar153,auVar145,(undefined1  [64])::_ps512_cephes_exp_p2);
        auVar153 = vfmadd213ps_avx512f(auVar153,auVar145,(undefined1  [64])::_ps512_cephes_exp_p3);
        auVar153 = vfmadd213ps_avx512f(auVar153,auVar145,(undefined1  [64])::_ps512_cephes_exp_p4);
        auVar153 = vfmadd213ps_avx512f(auVar153,auVar145,(undefined1  [64])afVar51);
        auVar145 = vfmadd213ps_avx512f(auVar153,auVar151,auVar145);
        auVar145 = vaddps_avx512f(auVar145,(undefined1  [64])afVar209);
        auVar151 = vcvttps2dq_avx512f(auVar155);
        auVar153 = vmovdqa64_avx512f((undefined1  [64])::_pi32_512_0x7f);
        auVar151 = vpaddd_avx512f(auVar151,auVar153);
        auVar151 = vpslld_avx512f(auVar151,0x17);
        auVar145 = vmulps_avx512f(auVar145,auVar151);
        auVar147 = vminps_avx512f(auVar147,(undefined1  [64])afVar207);
        auVar147 = vmaxps_avx512f(auVar147,(undefined1  [64])::_ps512_exp_lo);
        auVar151 = vfmadd213ps_avx512f((undefined1  [64])::_ps512_cephes_LOG2EF,auVar147,
                                       (undefined1  [64])afVar51);
        auVar155 = vrndscaleps_avx512f(auVar151,1);
        uVar6 = vcmpps_avx512f(auVar151,auVar155,1);
        auVar151 = vsubps_avx512f(auVar155,(undefined1  [64])afVar209);
        bVar5 = (bool)((byte)uVar6 & 1);
        auVar157._0_4_ = (uint)bVar5 * auVar151._0_4_ | (uint)!bVar5 * auVar155._0_4_;
        bVar5 = (bool)((byte)(uVar6 >> 1) & 1);
        auVar157._4_4_ = (uint)bVar5 * auVar151._4_4_ | (uint)!bVar5 * auVar155._4_4_;
        bVar5 = (bool)((byte)(uVar6 >> 2) & 1);
        auVar157._8_4_ = (uint)bVar5 * auVar151._8_4_ | (uint)!bVar5 * auVar155._8_4_;
        bVar5 = (bool)((byte)(uVar6 >> 3) & 1);
        auVar157._12_4_ = (uint)bVar5 * auVar151._12_4_ | (uint)!bVar5 * auVar155._12_4_;
        bVar5 = (bool)((byte)(uVar6 >> 4) & 1);
        auVar157._16_4_ = (uint)bVar5 * auVar151._16_4_ | (uint)!bVar5 * auVar155._16_4_;
        bVar5 = (bool)((byte)(uVar6 >> 5) & 1);
        auVar157._20_4_ = (uint)bVar5 * auVar151._20_4_ | (uint)!bVar5 * auVar155._20_4_;
        bVar5 = (bool)((byte)(uVar6 >> 6) & 1);
        auVar157._24_4_ = (uint)bVar5 * auVar151._24_4_ | (uint)!bVar5 * auVar155._24_4_;
        bVar5 = (bool)((byte)(uVar6 >> 7) & 1);
        auVar157._28_4_ = (uint)bVar5 * auVar151._28_4_ | (uint)!bVar5 * auVar155._28_4_;
        bVar5 = (bool)((byte)(uVar6 >> 8) & 1);
        auVar157._32_4_ = (uint)bVar5 * auVar151._32_4_ | (uint)!bVar5 * auVar155._32_4_;
        bVar5 = (bool)((byte)(uVar6 >> 9) & 1);
        auVar157._36_4_ = (uint)bVar5 * auVar151._36_4_ | (uint)!bVar5 * auVar155._36_4_;
        bVar5 = (bool)((byte)(uVar6 >> 10) & 1);
        auVar157._40_4_ = (uint)bVar5 * auVar151._40_4_ | (uint)!bVar5 * auVar155._40_4_;
        bVar5 = (bool)((byte)(uVar6 >> 0xb) & 1);
        auVar157._44_4_ = (uint)bVar5 * auVar151._44_4_ | (uint)!bVar5 * auVar155._44_4_;
        bVar5 = (bool)((byte)(uVar6 >> 0xc) & 1);
        auVar157._48_4_ = (uint)bVar5 * auVar151._48_4_ | (uint)!bVar5 * auVar155._48_4_;
        bVar5 = (bool)((byte)(uVar6 >> 0xd) & 1);
        auVar157._52_4_ = (uint)bVar5 * auVar151._52_4_ | (uint)!bVar5 * auVar155._52_4_;
        bVar5 = (bool)((byte)(uVar6 >> 0xe) & 1);
        auVar157._56_4_ = (uint)bVar5 * auVar151._56_4_ | (uint)!bVar5 * auVar155._56_4_;
        bVar5 = SUB81(uVar6 >> 0xf,0);
        auVar157._60_4_ = (uint)bVar5 * auVar151._60_4_ | (uint)!bVar5 * auVar155._60_4_;
        auVar147 = vfmadd231ps_avx512f(auVar147,auVar157,auVar125);
        auVar147 = vfmadd231ps_avx512f(auVar147,auVar157,auVar126);
        auVar151 = vmulps_avx512f(auVar147,auVar147);
        auVar155 = vfmadd213ps_avx512f(auVar147,(undefined1  [64])::_ps512_cephes_exp_p0,
                                       (undefined1  [64])::_ps512_cephes_exp_p1);
        auVar155 = vfmadd213ps_avx512f(auVar155,auVar147,(undefined1  [64])::_ps512_cephes_exp_p2);
        auVar155 = vfmadd213ps_avx512f(auVar155,auVar147,(undefined1  [64])::_ps512_cephes_exp_p3);
        auVar155 = vfmadd213ps_avx512f(auVar155,auVar147,(undefined1  [64])::_ps512_cephes_exp_p4);
        auVar155 = vfmadd213ps_avx512f(auVar155,auVar147,(undefined1  [64])afVar51);
        auVar147 = vfmadd213ps_avx512f(auVar155,auVar151,auVar147);
        auVar147 = vaddps_avx512f(auVar147,(undefined1  [64])afVar209);
        auVar151 = vcvttps2dq_avx512f(auVar157);
        auVar151 = vpaddd_avx512f(auVar151,auVar153);
        auVar151 = vpslld_avx512f(auVar151,0x17);
        auVar147 = vmulps_avx512f(auVar147,auVar151);
        auVar149 = vminps_avx512f(auVar149,(undefined1  [64])afVar207);
        auVar149 = vmaxps_avx512f(auVar149,(undefined1  [64])::_ps512_exp_lo);
        auVar151 = vfmadd213ps_avx512f((undefined1  [64])::_ps512_cephes_LOG2EF,auVar149,
                                       (undefined1  [64])afVar51);
        auVar155 = vrndscaleps_avx512f(auVar151,1);
        uVar6 = vcmpps_avx512f(auVar151,auVar155,1);
        auVar157 = vsubps_avx512f(auVar155,(undefined1  [64])afVar209);
        bVar5 = (bool)((byte)uVar6 & 1);
        auVar151._0_4_ = (uint)bVar5 * auVar157._0_4_ | (uint)!bVar5 * auVar155._0_4_;
        bVar5 = (bool)((byte)(uVar6 >> 1) & 1);
        auVar151._4_4_ = (uint)bVar5 * auVar157._4_4_ | (uint)!bVar5 * auVar155._4_4_;
        bVar5 = (bool)((byte)(uVar6 >> 2) & 1);
        auVar151._8_4_ = (uint)bVar5 * auVar157._8_4_ | (uint)!bVar5 * auVar155._8_4_;
        bVar5 = (bool)((byte)(uVar6 >> 3) & 1);
        auVar151._12_4_ = (uint)bVar5 * auVar157._12_4_ | (uint)!bVar5 * auVar155._12_4_;
        bVar5 = (bool)((byte)(uVar6 >> 4) & 1);
        auVar151._16_4_ = (uint)bVar5 * auVar157._16_4_ | (uint)!bVar5 * auVar155._16_4_;
        bVar5 = (bool)((byte)(uVar6 >> 5) & 1);
        auVar151._20_4_ = (uint)bVar5 * auVar157._20_4_ | (uint)!bVar5 * auVar155._20_4_;
        bVar5 = (bool)((byte)(uVar6 >> 6) & 1);
        auVar151._24_4_ = (uint)bVar5 * auVar157._24_4_ | (uint)!bVar5 * auVar155._24_4_;
        bVar5 = (bool)((byte)(uVar6 >> 7) & 1);
        auVar151._28_4_ = (uint)bVar5 * auVar157._28_4_ | (uint)!bVar5 * auVar155._28_4_;
        bVar5 = (bool)((byte)(uVar6 >> 8) & 1);
        auVar151._32_4_ = (uint)bVar5 * auVar157._32_4_ | (uint)!bVar5 * auVar155._32_4_;
        bVar5 = (bool)((byte)(uVar6 >> 9) & 1);
        auVar151._36_4_ = (uint)bVar5 * auVar157._36_4_ | (uint)!bVar5 * auVar155._36_4_;
        bVar5 = (bool)((byte)(uVar6 >> 10) & 1);
        auVar151._40_4_ = (uint)bVar5 * auVar157._40_4_ | (uint)!bVar5 * auVar155._40_4_;
        bVar5 = (bool)((byte)(uVar6 >> 0xb) & 1);
        auVar151._44_4_ = (uint)bVar5 * auVar157._44_4_ | (uint)!bVar5 * auVar155._44_4_;
        bVar5 = (bool)((byte)(uVar6 >> 0xc) & 1);
        auVar151._48_4_ = (uint)bVar5 * auVar157._48_4_ | (uint)!bVar5 * auVar155._48_4_;
        bVar5 = (bool)((byte)(uVar6 >> 0xd) & 1);
        auVar151._52_4_ = (uint)bVar5 * auVar157._52_4_ | (uint)!bVar5 * auVar155._52_4_;
        bVar5 = (bool)((byte)(uVar6 >> 0xe) & 1);
        auVar151._56_4_ = (uint)bVar5 * auVar157._56_4_ | (uint)!bVar5 * auVar155._56_4_;
        bVar5 = SUB81(uVar6 >> 0xf,0);
        auVar151._60_4_ = (uint)bVar5 * auVar157._60_4_ | (uint)!bVar5 * auVar155._60_4_;
        auVar149 = vfmadd231ps_avx512f(auVar149,auVar151,auVar125);
        auVar149 = vfmadd231ps_avx512f(auVar149,auVar151,auVar126);
        auVar155 = vmulps_avx512f(auVar149,auVar149);
        auVar157 = vfmadd213ps_avx512f(auVar149,(undefined1  [64])::_ps512_cephes_exp_p0,
                                       (undefined1  [64])::_ps512_cephes_exp_p1);
        auVar157 = vfmadd213ps_avx512f(auVar157,auVar149,(undefined1  [64])::_ps512_cephes_exp_p2);
        auVar157 = vfmadd213ps_avx512f(auVar157,auVar149,(undefined1  [64])::_ps512_cephes_exp_p3);
        auVar157 = vfmadd213ps_avx512f(auVar157,auVar149,(undefined1  [64])::_ps512_cephes_exp_p4);
        auVar157 = vfmadd213ps_avx512f(auVar157,auVar149,(undefined1  [64])afVar51);
        auVar149 = vfmadd213ps_avx512f(auVar157,auVar155,auVar149);
        auVar149 = vaddps_avx512f(auVar149,(undefined1  [64])afVar209);
        auVar151 = vcvttps2dq_avx512f(auVar151);
        auVar151 = vpaddd_avx512f(auVar151,auVar153);
        auVar151 = vpslld_avx512f(auVar151,0x17);
        auVar149 = vmulps_avx512f(auVar149,auVar151);
        auVar143 = vminps_avx512f(auVar143,(undefined1  [64])afVar207);
        auVar143 = vmaxps_avx512f(auVar143,(undefined1  [64])::_ps512_exp_lo);
        auVar151 = vfmadd213ps_avx512f((undefined1  [64])::_ps512_cephes_LOG2EF,auVar143,
                                       (undefined1  [64])afVar51);
        auVar155 = vrndscaleps_avx512f(auVar151,1);
        uVar6 = vcmpps_avx512f(auVar151,auVar155,1);
        auVar151 = vsubps_avx512f(auVar155,(undefined1  [64])afVar209);
        bVar5 = (bool)((byte)uVar6 & 1);
        auVar159._0_4_ = (uint)bVar5 * auVar151._0_4_ | (uint)!bVar5 * auVar155._0_4_;
        bVar5 = (bool)((byte)(uVar6 >> 1) & 1);
        auVar159._4_4_ = (uint)bVar5 * auVar151._4_4_ | (uint)!bVar5 * auVar155._4_4_;
        bVar5 = (bool)((byte)(uVar6 >> 2) & 1);
        auVar159._8_4_ = (uint)bVar5 * auVar151._8_4_ | (uint)!bVar5 * auVar155._8_4_;
        bVar5 = (bool)((byte)(uVar6 >> 3) & 1);
        auVar159._12_4_ = (uint)bVar5 * auVar151._12_4_ | (uint)!bVar5 * auVar155._12_4_;
        bVar5 = (bool)((byte)(uVar6 >> 4) & 1);
        auVar159._16_4_ = (uint)bVar5 * auVar151._16_4_ | (uint)!bVar5 * auVar155._16_4_;
        bVar5 = (bool)((byte)(uVar6 >> 5) & 1);
        auVar159._20_4_ = (uint)bVar5 * auVar151._20_4_ | (uint)!bVar5 * auVar155._20_4_;
        bVar5 = (bool)((byte)(uVar6 >> 6) & 1);
        auVar159._24_4_ = (uint)bVar5 * auVar151._24_4_ | (uint)!bVar5 * auVar155._24_4_;
        bVar5 = (bool)((byte)(uVar6 >> 7) & 1);
        auVar159._28_4_ = (uint)bVar5 * auVar151._28_4_ | (uint)!bVar5 * auVar155._28_4_;
        bVar5 = (bool)((byte)(uVar6 >> 8) & 1);
        auVar159._32_4_ = (uint)bVar5 * auVar151._32_4_ | (uint)!bVar5 * auVar155._32_4_;
        bVar5 = (bool)((byte)(uVar6 >> 9) & 1);
        auVar159._36_4_ = (uint)bVar5 * auVar151._36_4_ | (uint)!bVar5 * auVar155._36_4_;
        bVar5 = (bool)((byte)(uVar6 >> 10) & 1);
        auVar159._40_4_ = (uint)bVar5 * auVar151._40_4_ | (uint)!bVar5 * auVar155._40_4_;
        bVar5 = (bool)((byte)(uVar6 >> 0xb) & 1);
        auVar159._44_4_ = (uint)bVar5 * auVar151._44_4_ | (uint)!bVar5 * auVar155._44_4_;
        bVar5 = (bool)((byte)(uVar6 >> 0xc) & 1);
        auVar159._48_4_ = (uint)bVar5 * auVar151._48_4_ | (uint)!bVar5 * auVar155._48_4_;
        bVar5 = (bool)((byte)(uVar6 >> 0xd) & 1);
        auVar159._52_4_ = (uint)bVar5 * auVar151._52_4_ | (uint)!bVar5 * auVar155._52_4_;
        bVar5 = (bool)((byte)(uVar6 >> 0xe) & 1);
        auVar159._56_4_ = (uint)bVar5 * auVar151._56_4_ | (uint)!bVar5 * auVar155._56_4_;
        bVar5 = SUB81(uVar6 >> 0xf,0);
        auVar159._60_4_ = (uint)bVar5 * auVar151._60_4_ | (uint)!bVar5 * auVar155._60_4_;
        auVar143 = vfmadd231ps_avx512f(auVar143,auVar159,auVar125);
        auVar143 = vfmadd231ps_avx512f(auVar143,auVar159,auVar126);
        auVar151 = vmulps_avx512f(auVar143,auVar143);
        auVar155 = vfmadd213ps_avx512f(auVar143,(undefined1  [64])::_ps512_cephes_exp_p0,
                                       (undefined1  [64])::_ps512_cephes_exp_p1);
        auVar155 = vfmadd213ps_avx512f(auVar155,auVar143,(undefined1  [64])::_ps512_cephes_exp_p2);
        auVar155 = vfmadd213ps_avx512f(auVar155,auVar143,(undefined1  [64])::_ps512_cephes_exp_p3);
        auVar155 = vfmadd213ps_avx512f(auVar155,auVar143,(undefined1  [64])::_ps512_cephes_exp_p4);
        auVar155 = vfmadd213ps_avx512f(auVar155,auVar143,(undefined1  [64])afVar51);
        auVar143 = vfmadd213ps_avx512f(auVar155,auVar151,auVar143);
        auVar143 = vaddps_avx512f(auVar143,(undefined1  [64])afVar209);
        auVar151 = vcvttps2dq_avx512f(auVar159);
        auVar151 = vpaddd_avx512f(auVar151,auVar153);
        auVar151 = vpslld_avx512f(auVar151,0x17);
        auVar143 = vmulps_avx512f(auVar143,auVar151);
        *(undefined1 (*) [64])(pfVar65 + lVar64) = auVar145;
        *(undefined1 (*) [64])(pfVar65 + lVar64 + 0x10) = auVar147;
        *(undefined1 (*) [64])(pfVar65 + lVar64 + 0x20) = auVar149;
        *(undefined1 (*) [64])(pfVar65 + lVar64 + 0x30) = auVar143;
        auVar151 = vunpcklps_avx512f(auVar145,auVar147);
        auVar145 = vunpckhps_avx512f(auVar145,auVar147);
        auVar145 = vaddps_avx512f(auVar151,auVar145);
        auVar147 = vunpcklps_avx512f(auVar149,auVar143);
        auVar143 = vunpckhps_avx512f(auVar149,auVar143);
        auVar143 = vaddps_avx512f(auVar147,auVar143);
        auVar147 = vpermt2ps_avx512f(auVar145,_DAT_0053d140,auVar143);
        auVar143 = vpermt2ps_avx512f(auVar145,auVar124,auVar143);
        auVar143 = vaddps_avx512f(auVar143,auVar147);
        auVar143 = vaddps_avx512f(auVar143,*(undefined1 (*) [64])((long)_sumptr + lVar64));
        *(undefined1 (*) [64])((long)_sumptr + lVar64) = auVar143;
        pauVar66 = pauVar66 + 0x10;
        lVar64 = lVar64 + 0x40;
      }
      lVar61 = 0;
      lVar67 = lVar64;
      pauVar71 = pauVar66;
      while( true ) {
        afVar209 = ::_ps512_1;
        auVar124 = _DAT_0053d180;
        auVar228 = auVar141._0_16_;
        auVar210 = auVar130._0_16_;
        auVar216 = auVar132._0_16_;
        auVar225 = auVar139._0_16_;
        auVar221 = auVar137._0_16_;
        auVar214 = auVar131._0_16_;
        auVar75 = auVar127._0_16_;
        auVar90 = auVar129._0_16_;
        auVar89 = auVar128._0_16_;
        if (size1 <= iVar59 + 7) break;
        auVar76 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)_maxptr + lVar61 + lVar64 + 4)));
        auVar77 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)_maxptr + lVar61 + lVar64)));
        auVar100 = vinsertf32x4_avx512vl(ZEXT1632(auVar77),auVar76,1);
        auVar100 = vsubps_avx512vl(*(undefined1 (*) [32])(*pauVar66 + lVar61 * 4),auVar100);
        auVar205._8_4_ = 0x42b0c0a5;
        auVar205._0_8_ = 0x42b0c0a542b0c0a5;
        auVar205._12_4_ = 0x42b0c0a5;
        auVar205._16_4_ = 0x42b0c0a5;
        auVar205._20_4_ = 0x42b0c0a5;
        auVar205._24_4_ = 0x42b0c0a5;
        auVar205._28_4_ = 0x42b0c0a5;
        auVar100 = vminps_avx(auVar100,auVar205);
        auVar101 = vbroadcastss_avx512vl(ZEXT416(0xc2b0c0a5));
        auVar100 = vmaxps_avx512vl(auVar100,auVar101);
        auVar91 = vbroadcastss_avx512vl(ZEXT416(0x3fb8aa3b));
        auVar92 = vfmadd213ps_avx512vl(auVar91,auVar100,auVar99);
        auVar93 = vrndscaleps_avx512vl(auVar92,1);
        uVar6 = vcmpps_avx512vl(auVar92,auVar93,1);
        auVar92 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        auVar94 = vsubps_avx512vl(auVar93,auVar92);
        bVar5 = (bool)((byte)uVar6 & 1);
        auVar117._0_4_ = (uint)bVar5 * auVar94._0_4_ | (uint)!bVar5 * auVar93._0_4_;
        bVar5 = (bool)((byte)(uVar6 >> 1) & 1);
        auVar117._4_4_ = (uint)bVar5 * auVar94._4_4_ | (uint)!bVar5 * auVar93._4_4_;
        bVar5 = (bool)((byte)(uVar6 >> 2) & 1);
        auVar117._8_4_ = (uint)bVar5 * auVar94._8_4_ | (uint)!bVar5 * auVar93._8_4_;
        bVar5 = (bool)((byte)(uVar6 >> 3) & 1);
        auVar117._12_4_ = (uint)bVar5 * auVar94._12_4_ | (uint)!bVar5 * auVar93._12_4_;
        bVar5 = (bool)((byte)(uVar6 >> 4) & 1);
        auVar117._16_4_ = (uint)bVar5 * auVar94._16_4_ | (uint)!bVar5 * auVar93._16_4_;
        bVar5 = (bool)((byte)(uVar6 >> 5) & 1);
        auVar117._20_4_ = (uint)bVar5 * auVar94._20_4_ | (uint)!bVar5 * auVar93._20_4_;
        bVar5 = (bool)((byte)(uVar6 >> 6) & 1);
        auVar117._24_4_ = (uint)bVar5 * auVar94._24_4_ | (uint)!bVar5 * auVar93._24_4_;
        bVar5 = SUB81(uVar6 >> 7,0);
        auVar117._28_4_ = (uint)bVar5 * auVar94._28_4_ | (uint)!bVar5 * auVar93._28_4_;
        auVar93 = vbroadcastss_avx512vl(ZEXT416(0x3f318000));
        auVar100 = vfmsub231ps_avx512vl(auVar100,auVar117,auVar93);
        auVar94 = vbroadcastss_avx512vl(ZEXT416(0xb95e8083));
        auVar100 = vfnmsub231ps_avx512vl(auVar100,auVar117,auVar94);
        auVar95 = vmulps_avx512vl(auVar100,auVar100);
        auVar102 = vbroadcastss_avx512vl(ZEXT416(0x39506967));
        auVar103 = vbroadcastss_avx512vl(ZEXT416(0x3ab743ce));
        auVar120 = vfmadd213ps_avx512vl(auVar102,auVar100,auVar103);
        auVar121 = vbroadcastss_avx512vl(ZEXT416(0x3c088908));
        auVar120 = vfmadd213ps_avx512vl(auVar120,auVar100,auVar121);
        auVar122 = vbroadcastss_avx512vl(ZEXT416(0x3d2aa9c1));
        auVar120 = vfmadd213ps_avx512vl(auVar120,auVar100,auVar122);
        auVar171._8_4_ = 0x3e2aaaaa;
        auVar171._0_8_ = 0x3e2aaaaa3e2aaaaa;
        auVar171._12_4_ = 0x3e2aaaaa;
        auVar171._16_4_ = 0x3e2aaaaa;
        auVar171._20_4_ = 0x3e2aaaaa;
        auVar171._24_4_ = 0x3e2aaaaa;
        auVar171._28_4_ = 0x3e2aaaaa;
        auVar120 = vfmadd213ps_avx512vl(auVar120,auVar100,auVar171);
        auVar120 = vfmadd213ps_avx512vl(auVar120,auVar100,auVar99);
        auVar95 = vfmadd213ps_avx512vl(auVar120,auVar95,auVar100);
        auVar100 = vcvttps2dq_avx512vl(auVar117);
        auVar100 = vpslld_avx2(auVar100,0x17);
        auVar192._8_4_ = 0x3f800000;
        auVar192._0_8_ = 0x3f8000003f800000;
        auVar192._12_4_ = 0x3f800000;
        auVar192._16_4_ = 0x3f800000;
        auVar192._20_4_ = 0x3f800000;
        auVar192._24_4_ = 0x3f800000;
        auVar192._28_4_ = 0x3f800000;
        auVar100 = vpaddd_avx2(auVar100,auVar192);
        auVar76 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)_maxptr + lVar61 + lVar64 + 0xc)));
        auVar77 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)_maxptr + lVar61 + lVar64 + 8)));
        auVar100 = vfmadd213ps_avx512vl(auVar100,auVar95,auVar100);
        auVar95 = vinsertf32x4_avx512vl(ZEXT1632(auVar77),auVar76,1);
        auVar95 = vsubps_avx512vl(*(undefined1 (*) [32])(pauVar66[2] + lVar61 * 4),auVar95);
        auVar95 = vminps_avx512vl(auVar95,auVar205);
        auVar95 = vmaxps_avx512vl(auVar95,auVar101);
        auVar120 = vfmadd213ps_avx512vl(auVar91,auVar95,auVar99);
        auVar104 = vrndscaleps_avx512vl(auVar120,1);
        uVar6 = vcmpps_avx512vl(auVar120,auVar104,1);
        auVar120 = vsubps_avx512vl(auVar104,auVar92);
        bVar5 = (bool)((byte)uVar6 & 1);
        auVar96._0_4_ = (uint)bVar5 * auVar120._0_4_ | (uint)!bVar5 * auVar104._0_4_;
        bVar5 = (bool)((byte)(uVar6 >> 1) & 1);
        auVar96._4_4_ = (uint)bVar5 * auVar120._4_4_ | (uint)!bVar5 * auVar104._4_4_;
        bVar5 = (bool)((byte)(uVar6 >> 2) & 1);
        auVar96._8_4_ = (uint)bVar5 * auVar120._8_4_ | (uint)!bVar5 * auVar104._8_4_;
        bVar5 = (bool)((byte)(uVar6 >> 3) & 1);
        auVar96._12_4_ = (uint)bVar5 * auVar120._12_4_ | (uint)!bVar5 * auVar104._12_4_;
        bVar5 = (bool)((byte)(uVar6 >> 4) & 1);
        auVar96._16_4_ = (uint)bVar5 * auVar120._16_4_ | (uint)!bVar5 * auVar104._16_4_;
        bVar5 = (bool)((byte)(uVar6 >> 5) & 1);
        auVar96._20_4_ = (uint)bVar5 * auVar120._20_4_ | (uint)!bVar5 * auVar104._20_4_;
        bVar5 = (bool)((byte)(uVar6 >> 6) & 1);
        auVar96._24_4_ = (uint)bVar5 * auVar120._24_4_ | (uint)!bVar5 * auVar104._24_4_;
        bVar5 = SUB81(uVar6 >> 7,0);
        auVar96._28_4_ = (uint)bVar5 * auVar120._28_4_ | (uint)!bVar5 * auVar104._28_4_;
        auVar95 = vfmsub231ps_avx512vl(auVar95,auVar96,auVar93);
        auVar95 = vfnmsub231ps_avx512vl(auVar95,auVar96,auVar94);
        auVar120 = vmulps_avx512vl(auVar95,auVar95);
        auVar104 = vfmadd213ps_avx512vl(auVar102,auVar95,auVar103);
        auVar104 = vfmadd213ps_avx512vl(auVar104,auVar95,auVar121);
        auVar104 = vfmadd213ps_avx512vl(auVar104,auVar95,auVar122);
        auVar104 = vfmadd213ps_avx512vl(auVar104,auVar95,auVar171);
        auVar104 = vfmadd213ps_avx512vl(auVar104,auVar95,auVar99);
        auVar95 = vfmadd213ps_avx512vl(auVar104,auVar120,auVar95);
        auVar120 = vcvttps2dq_avx512vl(auVar96);
        auVar120 = vpslld_avx512vl(auVar120,0x17);
        auVar120 = vpaddd_avx512vl(auVar120,auVar192);
        auVar95 = vfmadd213ps_avx512vl(auVar120,auVar95,auVar120);
        auVar76 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)_maxptr + lVar61 + lVar64 + 0x14)));
        auVar77 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)_maxptr + lVar61 + lVar64 + 0x10)));
        auVar120 = vinsertf32x4_avx512vl(ZEXT1632(auVar77),auVar76,1);
        auVar120 = vsubps_avx512vl(*(undefined1 (*) [32])(pauVar66[4] + lVar61 * 4),auVar120);
        auVar120 = vminps_avx512vl(auVar120,auVar205);
        auVar120 = vmaxps_avx512vl(auVar120,auVar101);
        auVar104 = vfmadd213ps_avx512vl(auVar91,auVar120,auVar99);
        auVar108 = vrndscaleps_avx512vl(auVar104,1);
        uVar6 = vcmpps_avx512vl(auVar104,auVar108,1);
        auVar104 = vsubps_avx512vl(auVar108,auVar92);
        bVar5 = (bool)((byte)uVar6 & 1);
        auVar97._0_4_ = (uint)bVar5 * auVar104._0_4_ | (uint)!bVar5 * auVar108._0_4_;
        bVar5 = (bool)((byte)(uVar6 >> 1) & 1);
        auVar97._4_4_ = (uint)bVar5 * auVar104._4_4_ | (uint)!bVar5 * auVar108._4_4_;
        bVar5 = (bool)((byte)(uVar6 >> 2) & 1);
        auVar97._8_4_ = (uint)bVar5 * auVar104._8_4_ | (uint)!bVar5 * auVar108._8_4_;
        bVar5 = (bool)((byte)(uVar6 >> 3) & 1);
        auVar97._12_4_ = (uint)bVar5 * auVar104._12_4_ | (uint)!bVar5 * auVar108._12_4_;
        bVar5 = (bool)((byte)(uVar6 >> 4) & 1);
        auVar97._16_4_ = (uint)bVar5 * auVar104._16_4_ | (uint)!bVar5 * auVar108._16_4_;
        bVar5 = (bool)((byte)(uVar6 >> 5) & 1);
        auVar97._20_4_ = (uint)bVar5 * auVar104._20_4_ | (uint)!bVar5 * auVar108._20_4_;
        bVar5 = (bool)((byte)(uVar6 >> 6) & 1);
        auVar97._24_4_ = (uint)bVar5 * auVar104._24_4_ | (uint)!bVar5 * auVar108._24_4_;
        bVar5 = SUB81(uVar6 >> 7,0);
        auVar97._28_4_ = (uint)bVar5 * auVar104._28_4_ | (uint)!bVar5 * auVar108._28_4_;
        auVar120 = vfmsub231ps_avx512vl(auVar120,auVar97,auVar93);
        auVar120 = vfnmsub231ps_avx512vl(auVar120,auVar97,auVar94);
        auVar104 = vmulps_avx512vl(auVar120,auVar120);
        auVar108 = vfmadd213ps_avx512vl(auVar102,auVar120,auVar103);
        auVar108 = vfmadd213ps_avx512vl(auVar108,auVar120,auVar121);
        auVar108 = vfmadd213ps_avx512vl(auVar108,auVar120,auVar122);
        auVar108 = vfmadd213ps_avx512vl(auVar108,auVar120,auVar171);
        auVar108 = vfmadd213ps_avx512vl(auVar108,auVar120,auVar99);
        auVar120 = vfmadd213ps_avx512vl(auVar108,auVar104,auVar120);
        auVar104 = vcvttps2dq_avx512vl(auVar97);
        auVar104 = vpslld_avx512vl(auVar104,0x17);
        auVar104 = vpaddd_avx512vl(auVar104,auVar192);
        auVar76 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)_maxptr + lVar61 + lVar64 + 0x1c)));
        auVar120 = vfmadd213ps_avx512vl(auVar104,auVar120,auVar104);
        auVar77 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)_maxptr + lVar61 + lVar64 + 0x18)));
        auVar104 = vinsertf32x4_avx512vl(ZEXT1632(auVar77),auVar76,1);
        auVar104 = vsubps_avx512vl(*(undefined1 (*) [32])(pauVar66[6] + lVar61 * 4),auVar104);
        auVar104 = vminps_avx512vl(auVar104,auVar205);
        auVar101 = vmaxps_avx512vl(auVar104,auVar101);
        auVar91 = vfmadd213ps_avx512vl(auVar91,auVar101,auVar99);
        auVar104 = vrndscaleps_avx512vl(auVar91,1);
        uVar6 = vcmpps_avx512vl(auVar91,auVar104,1);
        auVar91 = vsubps_avx512vl(auVar104,auVar92);
        bVar5 = (bool)((byte)uVar6 & 1);
        auVar98._0_4_ = (uint)bVar5 * auVar91._0_4_ | (uint)!bVar5 * auVar104._0_4_;
        bVar5 = (bool)((byte)(uVar6 >> 1) & 1);
        auVar98._4_4_ = (uint)bVar5 * auVar91._4_4_ | (uint)!bVar5 * auVar104._4_4_;
        bVar5 = (bool)((byte)(uVar6 >> 2) & 1);
        auVar98._8_4_ = (uint)bVar5 * auVar91._8_4_ | (uint)!bVar5 * auVar104._8_4_;
        bVar5 = (bool)((byte)(uVar6 >> 3) & 1);
        auVar98._12_4_ = (uint)bVar5 * auVar91._12_4_ | (uint)!bVar5 * auVar104._12_4_;
        bVar5 = (bool)((byte)(uVar6 >> 4) & 1);
        auVar98._16_4_ = (uint)bVar5 * auVar91._16_4_ | (uint)!bVar5 * auVar104._16_4_;
        bVar5 = (bool)((byte)(uVar6 >> 5) & 1);
        auVar98._20_4_ = (uint)bVar5 * auVar91._20_4_ | (uint)!bVar5 * auVar104._20_4_;
        bVar5 = (bool)((byte)(uVar6 >> 6) & 1);
        auVar98._24_4_ = (uint)bVar5 * auVar91._24_4_ | (uint)!bVar5 * auVar104._24_4_;
        bVar5 = SUB81(uVar6 >> 7,0);
        auVar98._28_4_ = (uint)bVar5 * auVar91._28_4_ | (uint)!bVar5 * auVar104._28_4_;
        auVar101 = vfmsub231ps_avx512vl(auVar101,auVar98,auVar93);
        auVar101 = vfnmsub231ps_avx512vl(auVar101,auVar98,auVar94);
        auVar91 = vmulps_avx512vl(auVar101,auVar101);
        auVar92 = vfmadd213ps_avx512vl(auVar102,auVar101,auVar103);
        auVar92 = vfmadd213ps_avx512vl(auVar92,auVar101,auVar121);
        auVar92 = vfmadd213ps_avx512vl(auVar92,auVar101,auVar122);
        auVar141 = ZEXT1664(auVar228);
        auVar92 = vfmadd213ps_avx512vl(auVar92,auVar101,auVar171);
        auVar92 = vfmadd213ps_avx512vl(auVar92,auVar101,auVar99);
        auVar101 = vfmadd213ps_avx512vl(auVar92,auVar91,auVar101);
        auVar91 = vcvttps2dq_avx512vl(auVar98);
        auVar91 = vpslld_avx512vl(auVar91,0x17);
        auVar91 = vpaddd_avx512vl(auVar91,auVar192);
        auVar128 = ZEXT1664(auVar89);
        auVar129 = ZEXT1664(auVar90);
        auVar127 = ZEXT1664(auVar75);
        auVar131 = ZEXT1664(auVar214);
        auVar137 = ZEXT1664(auVar221);
        auVar139 = ZEXT1664(auVar225);
        auVar132 = ZEXT1664(auVar216);
        auVar130 = ZEXT1664(auVar210);
        auVar101 = vfmadd213ps_avx512vl(auVar91,auVar101,auVar91);
        *(undefined1 (*) [32])(*pauVar66 + lVar61 * 4) = auVar100;
        *(undefined1 (*) [32])(pauVar66[2] + lVar61 * 4) = auVar95;
        *(undefined1 (*) [32])(pauVar66[4] + lVar61 * 4) = auVar120;
        *(undefined1 (*) [32])(pauVar66[6] + lVar61 * 4) = auVar101;
        auVar91 = vunpcklps_avx512vl(auVar100,auVar95);
        auVar100 = vunpckhps_avx512vl(auVar100,auVar95);
        auVar100 = vaddps_avx512vl(auVar91,auVar100);
        auVar91 = vunpcklps_avx512vl(auVar120,auVar101);
        auVar101 = vunpckhps_avx512vl(auVar120,auVar101);
        auVar101 = vaddps_avx512vl(auVar91,auVar101);
        auVar91 = vinsertf32x4_avx512vl(auVar100,auVar101._0_16_,1);
        auVar100 = vshuff64x2_avx512vl(auVar100,auVar101,3);
        auVar101 = vunpcklps_avx512vl(auVar91,auVar100);
        auVar100 = vunpckhps_avx512vl(auVar91,auVar100);
        pfVar1 = (float *)((long)_sumptr + lVar61 + lVar64);
        auVar227._0_4_ = auVar100._0_4_ + *pfVar1;
        auVar227._4_4_ = auVar100._4_4_ + pfVar1[1];
        auVar227._8_4_ = auVar100._8_4_ + pfVar1[2];
        auVar227._12_4_ = auVar100._12_4_ + pfVar1[3];
        auVar227._16_4_ = auVar100._16_4_ + pfVar1[4];
        auVar227._20_4_ = auVar100._20_4_ + pfVar1[5];
        auVar227._24_4_ = auVar100._24_4_ + pfVar1[6];
        auVar227._28_4_ = auVar100._28_4_ + pfVar1[7];
        auVar100 = vaddps_avx512vl(auVar227,auVar101);
        *(undefined1 (*) [32])((long)_sumptr + lVar61 + lVar64) = auVar100;
        pauVar71 = pauVar71 + 8;
        iVar59 = iVar59 + 8;
        lVar61 = lVar61 + 0x20;
        lVar67 = lVar67 + 0x20;
      }
      for (; afVar207 = ::_ps512_exp_hi, iVar59 + 3 < size1; iVar59 = iVar59 + 4) {
        uVar2 = *(undefined4 *)((long)_maxptr + lVar67);
        auVar7._4_4_ = uVar2;
        auVar7._0_4_ = uVar2;
        auVar7._8_4_ = uVar2;
        auVar7._12_4_ = uVar2;
        auVar76 = vsubps_avx512vl(*pauVar71,auVar7);
        auVar76 = vminps_avx(auVar76,auVar89);
        auVar76 = vmaxps_avx(auVar76,auVar90);
        auVar77 = vfmadd213ps_avx512vl(auVar75,auVar76,auVar183);
        auVar78 = vcvttps2dq_avx512vl(auVar77);
        auVar78 = vcvtdq2ps_avx512vl(auVar78);
        uVar6 = vcmpps_avx512vl(auVar77,auVar78,1);
        auVar77 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        auVar79 = vsubps_avx512vl(auVar78,auVar77);
        bVar5 = (bool)((byte)uVar6 & 1);
        auVar80._0_4_ = (uint)bVar5 * auVar79._0_4_ | (uint)!bVar5 * auVar78._0_4_;
        bVar5 = (bool)((byte)(uVar6 >> 1) & 1);
        auVar80._4_4_ = (uint)bVar5 * auVar79._4_4_ | (uint)!bVar5 * auVar78._4_4_;
        bVar5 = (bool)((byte)(uVar6 >> 2) & 1);
        auVar80._8_4_ = (uint)bVar5 * auVar79._8_4_ | (uint)!bVar5 * auVar78._8_4_;
        bVar5 = (bool)((byte)(uVar6 >> 3) & 1);
        auVar80._12_4_ = (uint)bVar5 * auVar79._12_4_ | (uint)!bVar5 * auVar78._12_4_;
        auVar76 = vfmsub231ps_avx512vl(auVar76,auVar80,auVar214);
        auVar202._8_4_ = 0xb95e8083;
        auVar202._0_8_ = 0xb95e8083b95e8083;
        auVar202._12_4_ = 0xb95e8083;
        auVar76 = vfnmsub231ps_avx512vl(auVar76,auVar80,auVar202);
        auVar78 = vmulps_avx512vl(auVar76,auVar76);
        auVar79 = vfmadd213ps_avx512vl(auVar210,auVar76,auVar221);
        auVar79 = vfmadd213ps_avx512vl(auVar79,auVar76,auVar225);
        auVar79 = vfmadd213ps_avx512vl(auVar79,auVar76,auVar216);
        auVar79 = vfmadd213ps_avx512vl(auVar79,auVar76,auVar228);
        auVar79 = vfmadd213ps_avx512vl(auVar79,auVar76,auVar183);
        auVar76 = vfmadd213ps_avx512vl(auVar79,auVar78,auVar76);
        auVar78 = vcvttps2dq_avx512vl(auVar80);
        auVar79 = vpslld_avx(auVar78,0x17);
        auVar78 = vpbroadcastd_avx512vl(ZEXT416(0x3f800000));
        auVar79 = vpaddd_avx512vl(auVar79,auVar78);
        uVar2 = *(undefined4 *)((long)_maxptr + lVar67 + 4);
        auVar8._4_4_ = uVar2;
        auVar8._0_4_ = uVar2;
        auVar8._8_4_ = uVar2;
        auVar8._12_4_ = uVar2;
        auVar81 = vsubps_avx512vl(pauVar71[1],auVar8);
        auVar76 = vfmadd213ps_avx512vl(auVar79,auVar76,auVar79);
        auVar79 = vminps_avx512vl(auVar81,auVar89);
        auVar79 = vmaxps_avx512vl(auVar79,auVar90);
        auVar81 = vfmadd213ps_avx512vl(auVar75,auVar79,auVar183);
        auVar82 = vcvttps2dq_avx512vl(auVar81);
        auVar82 = vcvtdq2ps_avx512vl(auVar82);
        uVar6 = vcmpps_avx512vl(auVar81,auVar82,1);
        auVar81 = vsubps_avx512vl(auVar82,auVar77);
        bVar5 = (bool)((byte)uVar6 & 1);
        auVar83._0_4_ = (uint)bVar5 * auVar81._0_4_ | (uint)!bVar5 * auVar82._0_4_;
        bVar5 = (bool)((byte)(uVar6 >> 1) & 1);
        auVar83._4_4_ = (uint)bVar5 * auVar81._4_4_ | (uint)!bVar5 * auVar82._4_4_;
        bVar5 = (bool)((byte)(uVar6 >> 2) & 1);
        auVar83._8_4_ = (uint)bVar5 * auVar81._8_4_ | (uint)!bVar5 * auVar82._8_4_;
        bVar5 = (bool)((byte)(uVar6 >> 3) & 1);
        auVar83._12_4_ = (uint)bVar5 * auVar81._12_4_ | (uint)!bVar5 * auVar82._12_4_;
        auVar79 = vfmsub231ps_avx512vl(auVar79,auVar83,auVar214);
        auVar79 = vfnmsub231ps_avx512vl(auVar79,auVar83,auVar202);
        auVar81 = vmulps_avx512vl(auVar79,auVar79);
        auVar82 = vfmadd213ps_avx512vl(auVar210,auVar79,auVar221);
        auVar82 = vfmadd213ps_avx512vl(auVar82,auVar79,auVar225);
        auVar82 = vfmadd213ps_avx512vl(auVar82,auVar79,auVar216);
        auVar82 = vfmadd213ps_avx512vl(auVar82,auVar79,auVar228);
        auVar82 = vfmadd213ps_avx512vl(auVar82,auVar79,auVar183);
        auVar79 = vfmadd213ps_avx512vl(auVar82,auVar81,auVar79);
        auVar81 = vcvttps2dq_avx512vl(auVar83);
        auVar81 = vpslld_avx512vl(auVar81,0x17);
        auVar81 = vpaddd_avx512vl(auVar81,auVar78);
        uVar2 = *(undefined4 *)((long)_maxptr + lVar67 + 8);
        auVar9._4_4_ = uVar2;
        auVar9._0_4_ = uVar2;
        auVar9._8_4_ = uVar2;
        auVar9._12_4_ = uVar2;
        auVar82 = vsubps_avx512vl(pauVar71[2],auVar9);
        auVar79 = vfmadd213ps_avx512vl(auVar81,auVar79,auVar81);
        auVar81 = vminps_avx512vl(auVar82,auVar89);
        auVar81 = vmaxps_avx512vl(auVar81,auVar90);
        auVar82 = vfmadd213ps_avx512vl(auVar75,auVar81,auVar183);
        auVar84 = vcvttps2dq_avx512vl(auVar82);
        auVar84 = vcvtdq2ps_avx512vl(auVar84);
        uVar6 = vcmpps_avx512vl(auVar82,auVar84,1);
        auVar82 = vsubps_avx512vl(auVar84,auVar77);
        bVar5 = (bool)((byte)uVar6 & 1);
        auVar85._0_4_ = (uint)bVar5 * auVar82._0_4_ | (uint)!bVar5 * auVar84._0_4_;
        bVar5 = (bool)((byte)(uVar6 >> 1) & 1);
        auVar85._4_4_ = (uint)bVar5 * auVar82._4_4_ | (uint)!bVar5 * auVar84._4_4_;
        bVar5 = (bool)((byte)(uVar6 >> 2) & 1);
        auVar85._8_4_ = (uint)bVar5 * auVar82._8_4_ | (uint)!bVar5 * auVar84._8_4_;
        bVar5 = (bool)((byte)(uVar6 >> 3) & 1);
        auVar85._12_4_ = (uint)bVar5 * auVar82._12_4_ | (uint)!bVar5 * auVar84._12_4_;
        auVar81 = vfmsub231ps_avx512vl(auVar81,auVar85,auVar214);
        auVar81 = vfnmsub231ps_avx512vl(auVar81,auVar85,auVar202);
        auVar82 = vmulps_avx512vl(auVar81,auVar81);
        auVar84 = vfmadd213ps_avx512vl(auVar210,auVar81,auVar221);
        auVar84 = vfmadd213ps_avx512vl(auVar84,auVar81,auVar225);
        auVar84 = vfmadd213ps_avx512vl(auVar84,auVar81,auVar216);
        auVar84 = vfmadd213ps_avx512vl(auVar84,auVar81,auVar228);
        auVar84 = vfmadd213ps_avx512vl(auVar84,auVar81,auVar183);
        auVar81 = vfmadd213ps_avx512vl(auVar84,auVar82,auVar81);
        auVar82 = vcvttps2dq_avx512vl(auVar85);
        auVar82 = vpslld_avx512vl(auVar82,0x17);
        auVar82 = vpaddd_avx512vl(auVar82,auVar78);
        uVar2 = *(undefined4 *)((long)_maxptr + lVar67 + 0xc);
        auVar10._4_4_ = uVar2;
        auVar10._0_4_ = uVar2;
        auVar10._8_4_ = uVar2;
        auVar10._12_4_ = uVar2;
        auVar84 = vsubps_avx512vl(pauVar71[3],auVar10);
        auVar81 = vfmadd213ps_avx512vl(auVar82,auVar81,auVar82);
        auVar82 = vminps_avx512vl(auVar84,auVar89);
        auVar82 = vmaxps_avx512vl(auVar82,auVar90);
        auVar84 = vfmadd213ps_avx512vl(auVar75,auVar82,auVar183);
        auVar86 = vcvttps2dq_avx512vl(auVar84);
        auVar86 = vcvtdq2ps_avx512vl(auVar86);
        uVar6 = vcmpps_avx512vl(auVar84,auVar86,1);
        auVar77 = vsubps_avx512vl(auVar86,auVar77);
        bVar5 = (bool)((byte)uVar6 & 1);
        auVar87._0_4_ = (uint)bVar5 * auVar77._0_4_ | (uint)!bVar5 * auVar86._0_4_;
        bVar5 = (bool)((byte)(uVar6 >> 1) & 1);
        auVar87._4_4_ = (uint)bVar5 * auVar77._4_4_ | (uint)!bVar5 * auVar86._4_4_;
        bVar5 = (bool)((byte)(uVar6 >> 2) & 1);
        auVar87._8_4_ = (uint)bVar5 * auVar77._8_4_ | (uint)!bVar5 * auVar86._8_4_;
        bVar5 = (bool)((byte)(uVar6 >> 3) & 1);
        auVar87._12_4_ = (uint)bVar5 * auVar77._12_4_ | (uint)!bVar5 * auVar86._12_4_;
        auVar77 = vfmsub231ps_avx512vl(auVar82,auVar87,auVar214);
        auVar77 = vfnmsub231ps_avx512vl(auVar77,auVar87,auVar202);
        auVar82 = vmulps_avx512vl(auVar77,auVar77);
        auVar84 = vfmadd213ps_avx512vl(auVar210,auVar77,auVar221);
        auVar84 = vfmadd213ps_avx512vl(auVar84,auVar77,auVar225);
        auVar84 = vfmadd213ps_avx512vl(auVar84,auVar77,auVar216);
        auVar84 = vfmadd213ps_avx512vl(auVar84,auVar77,auVar228);
        auVar84 = vfmadd213ps_avx512vl(auVar84,auVar77,auVar183);
        auVar77 = vfmadd213ps_avx512vl(auVar84,auVar82,auVar77);
        auVar82 = vcvttps2dq_avx512vl(auVar87);
        auVar82 = vpslld_avx512vl(auVar82,0x17);
        auVar78 = vpaddd_avx512vl(auVar82,auVar78);
        auVar77 = vfmadd213ps_avx512vl(auVar78,auVar77,auVar78);
        *pauVar71 = auVar76;
        pauVar71[1] = auVar79;
        pauVar71[2] = auVar81;
        pauVar71[3] = auVar77;
        auVar78 = vunpcklps_avx512vl(auVar76,auVar79);
        auVar82 = vunpcklps_avx512vl(auVar81,auVar77);
        auVar79 = vunpckhps_avx512vl(auVar76,auVar79);
        auVar81 = vunpckhps_avx512vl(auVar81,auVar77);
        auVar76 = vmovlhps_avx512f(auVar78,auVar82);
        auVar78 = vunpckhpd_avx512vl(auVar78,auVar82);
        auVar77 = vmovlhps_avx512f(auVar79,auVar81);
        auVar79 = vunpckhpd_avx512vl(auVar79,auVar81);
        auVar76 = vaddps_avx512vl(auVar76,auVar79);
        auVar76 = vaddps_avx512vl(auVar76,auVar77);
        auVar77 = vaddps_avx512vl(auVar78,*(undefined1 (*) [16])((long)_sumptr + lVar67));
        auVar76 = vaddps_avx512vl(auVar77,auVar76);
        *(undefined1 (*) [16])((long)_sumptr + lVar67) = auVar76;
        pauVar71 = pauVar71 + 4;
        lVar67 = lVar67 + 0x10;
      }
      lVar64 = 0;
      auVar203._8_4_ = 0xbf800000;
      auVar203._0_8_ = 0xbf800000bf800000;
      auVar203._12_4_ = 0xbf800000;
      auVar76 = vbroadcastss_avx512vl(ZEXT416(0x395e8083));
      for (; iVar59 < size1; iVar59 = iVar59 + 1) {
        uVar2 = *(undefined4 *)((long)_maxptr + lVar64 + lVar67);
        auVar11._4_4_ = uVar2;
        auVar11._0_4_ = uVar2;
        auVar11._8_4_ = uVar2;
        auVar11._12_4_ = uVar2;
        auVar77 = vsubps_avx512vl(*(undefined1 (*) [16])(*pauVar71 + lVar64 * 4),auVar11);
        auVar77 = vminps_avx(auVar77,auVar89);
        auVar77 = vmaxps_avx(auVar77,auVar90);
        auVar78 = vfmadd231ps_avx512vl(auVar183,auVar77,auVar75);
        auVar79 = vcvttps2dq_avx512vl(auVar78);
        auVar79 = vcvtdq2ps_avx512vl(auVar79);
        uVar6 = vcmpps_avx512vl(auVar78,auVar79,1);
        auVar78 = vaddps_avx512vl(auVar79,auVar203);
        bVar5 = (bool)((byte)uVar6 & 1);
        auVar88._0_4_ = (uint)bVar5 * auVar78._0_4_ | (uint)!bVar5 * auVar79._0_4_;
        bVar5 = (bool)((byte)(uVar6 >> 1) & 1);
        auVar88._4_4_ = (uint)bVar5 * auVar78._4_4_ | (uint)!bVar5 * auVar79._4_4_;
        bVar5 = (bool)((byte)(uVar6 >> 2) & 1);
        auVar88._8_4_ = (uint)bVar5 * auVar78._8_4_ | (uint)!bVar5 * auVar79._8_4_;
        bVar5 = (bool)((byte)(uVar6 >> 3) & 1);
        auVar88._12_4_ = (uint)bVar5 * auVar78._12_4_ | (uint)!bVar5 * auVar79._12_4_;
        auVar77 = vfmsub231ps_avx512vl(auVar77,auVar88,auVar214);
        auVar77 = vfmsub231ps_avx512vl(auVar77,auVar88,auVar76);
        auVar78 = vmulps_avx512vl(auVar77,auVar77);
        auVar79 = vfmadd213ps_avx512vl(auVar210,auVar77,auVar221);
        auVar79 = vfmadd213ps_avx512vl(auVar79,auVar77,auVar225);
        auVar79 = vfmadd213ps_avx512vl(auVar79,auVar77,auVar216);
        auVar79 = vfmadd213ps_avx512vl(auVar79,auVar77,auVar228);
        auVar79 = vfmadd213ps_avx512vl(auVar79,auVar77,auVar183);
        auVar77 = vfmadd213ps_avx512vl(auVar79,auVar78,auVar77);
        auVar78 = vcvttps2dq_avx512vl(auVar88);
        auVar78 = vpslld_avx(auVar78,0x17);
        auVar12._8_4_ = 0x3f800000;
        auVar12._0_8_ = 0x3f8000003f800000;
        auVar12._12_4_ = 0x3f800000;
        auVar78 = vpaddd_avx512vl(auVar78,auVar12);
        auVar77 = vfmadd213ps_avx512vl(auVar78,auVar77,auVar78);
        *(undefined1 (*) [16])(*pauVar71 + lVar64 * 4) = auVar77;
        auVar78 = vshufpd_avx512vl(auVar77,auVar77,1);
        auVar77 = vaddps_avx512vl(auVar78,auVar77);
        auVar78 = vmovshdup_avx512vl(auVar77);
        auVar78 = vaddss_avx512f(auVar78,ZEXT416(*(uint *)((long)_sumptr + lVar64 + lVar67)));
        auVar77 = vaddss_avx512f(auVar78,auVar77);
        *(int *)((long)_sumptr + lVar64 + lVar67) = auVar77._0_4_;
        lVar64 = lVar64 + 4;
      }
      pfVar65 = pfVar65 + lVar70;
    }
    iVar59 = 0;
    auVar124 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
    pauVar63 = (undefined1 (*) [64])_sumptr;
    for (; iVar59 + 0xf < size1; iVar59 = iVar59 + 0x10) {
      auVar125 = vdivps_avx512f(auVar124,*pauVar63);
      *pauVar63 = auVar125;
      pauVar63 = pauVar63 + 1;
    }
    for (; iVar59 + 7 < size1; iVar59 = iVar59 + 8) {
      auVar172._8_4_ = 0x3f800000;
      auVar172._0_8_ = 0x3f8000003f800000;
      auVar172._12_4_ = 0x3f800000;
      auVar172._16_4_ = 0x3f800000;
      auVar172._20_4_ = 0x3f800000;
      auVar172._24_4_ = 0x3f800000;
      auVar172._28_4_ = 0x3f800000;
      auVar99 = vdivps_avx(auVar172,*(undefined1 (*) [32])*pauVar63);
      *(undefined1 (*) [32])*pauVar63 = auVar99;
      pauVar63 = (undefined1 (*) [64])(*pauVar63 + 0x20);
    }
    for (; iVar59 + 3 < size1; iVar59 = iVar59 + 4) {
      auVar162._8_4_ = 0x3f800000;
      auVar162._0_8_ = 0x3f8000003f800000;
      auVar162._12_4_ = 0x3f800000;
      auVar75 = vdivps_avx(auVar162,*(undefined1 (*) [16])*pauVar63);
      *(undefined1 (*) [16])*pauVar63 = auVar75;
      pauVar63 = (undefined1 (*) [64])(*pauVar63 + 0x10);
    }
    for (; iVar59 < size1; iVar59 = iVar59 + 1) {
      *(float *)*pauVar63 = 1.0 / *(float *)*pauVar63;
      pauVar63 = (undefined1 (*) [64])(*pauVar63 + 4);
    }
    for (uVar60 = 0; uVar60 != uVar72; uVar60 = uVar60 + 1) {
      pauVar62 = (undefined1 (*) [64])(_ptr + uVar60 * lVar70);
      pauVar63 = (undefined1 (*) [64])_sumptr;
      for (iVar59 = 0; iVar59 + 0xf < size1; iVar59 = iVar59 + 0x10) {
        auVar124 = *pauVar63;
        auVar125 = vpermps_avx512f(_DAT_0053d040,auVar124);
        auVar126 = vpermps_avx512f(_DAT_0053d080,auVar124);
        auVar127 = vpermps_avx512f(_DAT_0053d0c0,auVar124);
        auVar124 = vpermps_avx512f(_DAT_0053d100,auVar124);
        auVar125 = vmulps_avx512f(auVar125,*pauVar62);
        auVar126 = vmulps_avx512f(auVar126,pauVar62[1]);
        auVar127 = vmulps_avx512f(auVar127,pauVar62[2]);
        auVar124 = vmulps_avx512f(auVar124,pauVar62[3]);
        *pauVar62 = auVar125;
        pauVar62[1] = auVar126;
        pauVar62[2] = auVar127;
        pauVar62[3] = auVar124;
        pauVar62 = pauVar62 + 4;
        pauVar63 = pauVar63 + 1;
      }
      for (; iVar59 + 7 < size1; iVar59 = iVar59 + 8) {
        fVar224 = *(float *)*pauVar63;
        fVar3 = *(float *)(*pauVar63 + 4);
        auVar34._4_4_ = fVar224 * *(float *)(*pauVar62 + 4);
        auVar34._0_4_ = fVar224 * *(float *)*pauVar62;
        auVar34._8_4_ = fVar224 * *(float *)(*pauVar62 + 8);
        auVar34._12_4_ = fVar224 * *(float *)(*pauVar62 + 0xc);
        auVar34._16_4_ = fVar3 * *(float *)(*pauVar62 + 0x10);
        auVar34._20_4_ = fVar3 * *(float *)(*pauVar62 + 0x14);
        auVar34._24_4_ = fVar3 * *(float *)(*pauVar62 + 0x18);
        auVar34._28_4_ = fVar3;
        fVar224 = *(float *)(*pauVar63 + 8);
        fVar3 = *(float *)(*pauVar63 + 0xc);
        auVar35._4_4_ = fVar224 * *(float *)(*pauVar62 + 0x24);
        auVar35._0_4_ = fVar224 * *(float *)(*pauVar62 + 0x20);
        auVar35._8_4_ = fVar224 * *(float *)(*pauVar62 + 0x28);
        auVar35._12_4_ = fVar224 * *(float *)(*pauVar62 + 0x2c);
        auVar35._16_4_ = fVar3 * *(float *)(*pauVar62 + 0x30);
        auVar35._20_4_ = fVar3 * *(float *)(*pauVar62 + 0x34);
        auVar35._24_4_ = fVar3 * *(float *)(*pauVar62 + 0x38);
        auVar35._28_4_ = fVar3;
        fVar224 = *(float *)(*pauVar63 + 0x10);
        fVar3 = *(float *)(*pauVar63 + 0x14);
        auVar36._4_4_ = fVar224 * *(float *)(pauVar62[1] + 4);
        auVar36._0_4_ = fVar224 * *(float *)pauVar62[1];
        auVar36._8_4_ = fVar224 * *(float *)(pauVar62[1] + 8);
        auVar36._12_4_ = fVar224 * *(float *)(pauVar62[1] + 0xc);
        auVar36._16_4_ = fVar3 * *(float *)(pauVar62[1] + 0x10);
        auVar36._20_4_ = fVar3 * *(float *)(pauVar62[1] + 0x14);
        auVar36._24_4_ = fVar3 * *(float *)(pauVar62[1] + 0x18);
        auVar36._28_4_ = fVar3;
        fVar224 = *(float *)(*pauVar63 + 0x18);
        fVar3 = *(float *)(*pauVar63 + 0x1c);
        auVar37._4_4_ = fVar224 * *(float *)(pauVar62[1] + 0x24);
        auVar37._0_4_ = fVar224 * *(float *)(pauVar62[1] + 0x20);
        auVar37._8_4_ = fVar224 * *(float *)(pauVar62[1] + 0x28);
        auVar37._12_4_ = fVar224 * *(float *)(pauVar62[1] + 0x2c);
        auVar37._16_4_ = fVar3 * *(float *)(pauVar62[1] + 0x30);
        auVar37._20_4_ = fVar3 * *(float *)(pauVar62[1] + 0x34);
        auVar37._24_4_ = fVar3 * *(float *)(pauVar62[1] + 0x38);
        auVar37._28_4_ = fVar3;
        *(undefined1 (*) [32])*pauVar62 = auVar34;
        *(undefined1 (*) [32])(*pauVar62 + 0x20) = auVar35;
        *(undefined1 (*) [32])pauVar62[1] = auVar36;
        *(undefined1 (*) [32])(pauVar62[1] + 0x20) = auVar37;
        pauVar62 = pauVar62 + 2;
        pauVar63 = (undefined1 (*) [64])(*pauVar63 + 0x20);
      }
      for (; iVar59 + 3 < size1; iVar59 = iVar59 + 4) {
        fVar224 = *(float *)*pauVar63;
        auVar163._0_4_ = fVar224 * *(float *)*pauVar62;
        auVar163._4_4_ = fVar224 * *(float *)(*pauVar62 + 4);
        auVar163._8_4_ = fVar224 * *(float *)(*pauVar62 + 8);
        auVar163._12_4_ = fVar224 * *(float *)(*pauVar62 + 0xc);
        fVar224 = *(float *)(*pauVar63 + 4);
        auVar181._0_4_ = fVar224 * *(float *)(*pauVar62 + 0x10);
        auVar181._4_4_ = fVar224 * *(float *)(*pauVar62 + 0x14);
        auVar181._8_4_ = fVar224 * *(float *)(*pauVar62 + 0x18);
        auVar181._12_4_ = fVar224 * *(float *)(*pauVar62 + 0x1c);
        fVar224 = *(float *)(*pauVar63 + 8);
        auVar184._0_4_ = fVar224 * *(float *)(*pauVar62 + 0x20);
        auVar184._4_4_ = fVar224 * *(float *)(*pauVar62 + 0x24);
        auVar184._8_4_ = fVar224 * *(float *)(*pauVar62 + 0x28);
        auVar184._12_4_ = fVar224 * *(float *)(*pauVar62 + 0x2c);
        fVar224 = *(float *)(*pauVar63 + 0xc);
        auVar191._0_4_ = fVar224 * *(float *)(*pauVar62 + 0x30);
        auVar191._4_4_ = fVar224 * *(float *)(*pauVar62 + 0x34);
        auVar191._8_4_ = fVar224 * *(float *)(*pauVar62 + 0x38);
        auVar191._12_4_ = fVar224 * *(float *)(*pauVar62 + 0x3c);
        *(undefined1 (*) [16])*pauVar62 = auVar163;
        *(undefined1 (*) [16])(*pauVar62 + 0x10) = auVar181;
        *(undefined1 (*) [16])(*pauVar62 + 0x20) = auVar184;
        *(undefined1 (*) [16])(*pauVar62 + 0x30) = auVar191;
        pauVar62 = pauVar62 + 1;
        pauVar63 = (undefined1 (*) [64])(*pauVar63 + 0x10);
      }
      lVar64 = 0;
      for (; iVar59 < size1; iVar59 = iVar59 + 1) {
        fVar224 = *(float *)(*pauVar63 + lVar64);
        pfVar65 = (float *)(*pauVar62 + lVar64 * 4);
        auVar164._0_4_ = fVar224 * *pfVar65;
        auVar164._4_4_ = fVar224 * pfVar65[1];
        auVar164._8_4_ = fVar224 * pfVar65[2];
        auVar164._12_4_ = fVar224 * pfVar65[3];
        *(undefined1 (*) [16])(*pauVar62 + lVar64 * 4) = auVar164;
        lVar64 = lVar64 + 4;
      }
    }
  }
  else if (elempack == 8) {
    uVar60 = 0;
    if (elemcount < 1) {
      elemcount = 0;
    }
    uVar72 = (ulong)(uint)elemcount;
    for (; afVar209 = ::_ps512_cephes_exp_p5, afVar51 = ::_ps512_1, uVar60 != uVar72;
        uVar60 = uVar60 + 1) {
      pauVar62 = (undefined1 (*) [64])(_ptr + uVar60 * lVar70);
      pauVar63 = (undefined1 (*) [64])_maxptr;
      for (iVar59 = 0; iVar59 + 0xf < size1; iVar59 = iVar59 + 0x10) {
        auVar124 = vunpcklps_avx512f(*pauVar62,pauVar62[1]);
        auVar126 = vunpckhps_avx512f(*pauVar62,pauVar62[1]);
        auVar124 = vmaxps_avx512f(auVar124,auVar126);
        auVar126 = vunpcklps_avx512f(pauVar62[2],pauVar62[3]);
        auVar127 = vunpckhps_avx512f(pauVar62[2],pauVar62[3]);
        auVar126 = vmaxps_avx512f(auVar126,auVar127);
        auVar127 = vunpcklps_avx512f(pauVar62[4],pauVar62[5]);
        auVar128 = vunpckhps_avx512f(pauVar62[4],pauVar62[5]);
        auVar127 = vmaxps_avx512f(auVar127,auVar128);
        auVar128 = vunpcklps_avx512f(pauVar62[6],pauVar62[7]);
        auVar129 = vunpckhps_avx512f(pauVar62[6],pauVar62[7]);
        auVar128 = vmaxps_avx512f(auVar128,auVar129);
        auVar129 = vunpcklps_avx512f(auVar124,auVar126);
        auVar124 = vunpckhps_avx512f(auVar124,auVar126);
        auVar124 = vmaxps_avx512f(auVar129,auVar124);
        auVar126 = vunpcklps_avx512f(auVar127,auVar128);
        auVar127 = vunpckhps_avx512f(auVar127,auVar128);
        auVar126 = vmaxps_avx512f(auVar126,auVar127);
        auVar127 = vshuff64x2_avx512f(auVar124,auVar126,0x88);
        auVar124 = vshuff64x2_avx512f(auVar124,auVar126,0xdd);
        auVar124 = vmaxps_avx512f(auVar127,auVar124);
        auVar124 = vpermps_avx512f(auVar125,auVar124);
        auVar124 = vmaxps_avx512f(auVar124,*pauVar63);
        *pauVar63 = auVar124;
        pauVar62 = pauVar62 + 8;
        pauVar63 = pauVar63 + 1;
      }
      for (; iVar59 + 7 < size1; iVar59 = iVar59 + 8) {
        auVar100 = vunpcklps_avx(*(undefined1 (*) [32])*pauVar62,*(undefined1 (*) [32])pauVar62[2]);
        auVar99 = vunpckhps_avx(*(undefined1 (*) [32])*pauVar62,*(undefined1 (*) [32])pauVar62[2]);
        auVar99 = vmaxps_avx(auVar100,auVar99);
        auVar101 = vunpcklps_avx(*(undefined1 (*) [32])pauVar62[1],*(undefined1 (*) [32])pauVar62[3]
                                );
        auVar100 = vunpckhps_avx(*(undefined1 (*) [32])pauVar62[1],*(undefined1 (*) [32])pauVar62[3]
                                );
        auVar100 = vmaxps_avx(auVar101,auVar100);
        auVar91 = vunpcklps_avx(*(undefined1 (*) [32])(*pauVar62 + 0x20),
                                *(undefined1 (*) [32])(pauVar62[2] + 0x20));
        auVar101 = vunpckhps_avx(*(undefined1 (*) [32])(*pauVar62 + 0x20),
                                 *(undefined1 (*) [32])(pauVar62[2] + 0x20));
        auVar101 = vmaxps_avx(auVar91,auVar101);
        auVar92 = vunpcklps_avx(*(undefined1 (*) [32])(pauVar62[1] + 0x20),
                                *(undefined1 (*) [32])(pauVar62[3] + 0x20));
        auVar91 = vunpckhps_avx(*(undefined1 (*) [32])(pauVar62[1] + 0x20),
                                *(undefined1 (*) [32])(pauVar62[3] + 0x20));
        auVar91 = vmaxps_avx(auVar92,auVar91);
        auVar92 = vunpcklps_avx(auVar99,auVar100);
        auVar99 = vunpckhps_avx(auVar99,auVar100);
        auVar99 = vmaxps_avx(auVar92,auVar99);
        auVar92 = vunpcklps_avx(auVar101,auVar91);
        auVar100 = vunpckhps_avx(auVar101,auVar91);
        auVar100 = vmaxps_avx(auVar92,auVar100);
        auVar101 = vunpcklps_avx(auVar99,auVar100);
        auVar99 = vunpckhps_avx(auVar99,auVar100);
        auVar185._16_16_ = auVar99._0_16_;
        auVar185._0_16_ = auVar101._0_16_;
        auVar99 = vperm2f128_avx(auVar101,auVar99,0x31);
        auVar99 = vmaxps_avx(auVar185,auVar99);
        auVar99 = vmaxps_avx(auVar99,*(undefined1 (*) [32])*pauVar63);
        *(undefined1 (*) [32])*pauVar63 = auVar99;
        pauVar62 = pauVar62 + 4;
        pauVar63 = (undefined1 (*) [64])(*pauVar63 + 0x20);
      }
      lVar64 = 0;
      for (; iVar59 < size1; iVar59 = iVar59 + 1) {
        auVar75 = vmaxps_avx(*(undefined1 (*) [16])(*pauVar62 + lVar64 * 8 + 0x10),
                             *(undefined1 (*) [16])(*pauVar62 + lVar64 * 8));
        auVar89 = vshufpd_avx(auVar75,auVar75,3);
        auVar75 = vmaxps_avx(auVar75,auVar89);
        auVar89 = vmovshdup_avx(auVar75);
        auVar75 = vmaxss_avx(auVar75,auVar89);
        auVar75 = vmaxss_avx(auVar75,ZEXT416(*(uint *)(*pauVar63 + lVar64)));
        *(int *)(*pauVar63 + lVar64) = auVar75._0_4_;
        lVar64 = lVar64 + 4;
      }
    }
    auVar124 = vbroadcastss_avx512f(ZEXT416(0x80000000));
    auVar125 = vxorps_avx512dq(auVar124,(undefined1  [64])::_ps512_cephes_exp_C1);
    auVar124 = vxorps_avx512dq(auVar124,(undefined1  [64])::_ps512_cephes_exp_C2);
    uVar60 = 0;
    auVar126 = ZEXT3264(CONCAT428(0x42b0c0a5,
                                  CONCAT424(0x42b0c0a5,
                                            CONCAT420(0x42b0c0a5,
                                                      CONCAT416(0x42b0c0a5,
                                                                CONCAT412(0x42b0c0a5,
                                                                          CONCAT48(0x42b0c0a5,
                                                                                                                                                                      
                                                  0x42b0c0a542b0c0a5)))))));
    auVar127 = ZEXT3264(CONCAT428(0xc2b0c0a5,
                                  CONCAT424(0xc2b0c0a5,
                                            CONCAT420(0xc2b0c0a5,
                                                      CONCAT416(0xc2b0c0a5,
                                                                CONCAT412(0xc2b0c0a5,
                                                                          CONCAT48(0xc2b0c0a5,
                                                                                                                                                                      
                                                  0xc2b0c0a5c2b0c0a5)))))));
    auVar99 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
    auVar129 = ZEXT3264(CONCAT428(0x3fb8aa3b,
                                  CONCAT424(0x3fb8aa3b,
                                            CONCAT420(0x3fb8aa3b,
                                                      CONCAT416(0x3fb8aa3b,
                                                                CONCAT412(0x3fb8aa3b,
                                                                          CONCAT48(0x3fb8aa3b,
                                                                                                                                                                      
                                                  0x3fb8aa3b3fb8aa3b)))))));
    auVar128 = ZEXT3264(CONCAT428(0x3f318000,
                                  CONCAT424(0x3f318000,
                                            CONCAT420(0x3f318000,
                                                      CONCAT416(0x3f318000,
                                                                CONCAT412(0x3f318000,
                                                                          CONCAT48(0x3f318000,
                                                                                                                                                                      
                                                  0x3f3180003f318000)))))));
    auVar100 = vbroadcastss_avx512vl(ZEXT416(0x3ab743ce));
    auVar130 = ZEXT3264(auVar100);
    auVar100 = vbroadcastss_avx512vl(ZEXT416(0x39506967));
    auVar131 = ZEXT3264(auVar100);
    auVar100 = vbroadcastss_avx512vl(ZEXT416(0x3c088908));
    auVar101 = vbroadcastss_avx512vl(ZEXT416(0x3d2aa9c1));
    auVar132 = ZEXT3264(auVar101);
    auVar101 = vbroadcastss_avx512vl(ZEXT416(0x3e2aaaaa));
    auVar137 = ZEXT3264(auVar101);
    auVar101 = vpbroadcastd_avx512vl(ZEXT416(0x3f800000));
    auVar139 = ZEXT3264(auVar101);
    pfVar65 = _ptr;
    afVar207 = ::_ps512_exp_hi;
    for (; uVar60 != uVar72; uVar60 = uVar60 + 1) {
      pauVar68 = (undefined1 (*) [32])(_ptr + uVar60 * lVar70);
      lVar64 = 0;
      lVar67 = 0;
      iVar59 = 0;
      while( true ) {
        auVar101 = auVar126._0_32_;
        auVar91 = auVar127._0_32_;
        auVar93 = auVar131._0_32_;
        auVar92 = auVar129._0_32_;
        auVar95 = auVar137._0_32_;
        auVar94 = auVar132._0_32_;
        if (size1 <= iVar59 + 0xf) break;
        uVar2 = *(undefined4 *)((long)_maxptr + lVar67 + 4);
        auVar226._4_4_ = uVar2;
        auVar226._0_4_ = uVar2;
        auVar226._8_4_ = uVar2;
        auVar226._12_4_ = uVar2;
        auVar226._16_4_ = uVar2;
        auVar226._20_4_ = uVar2;
        auVar226._24_4_ = uVar2;
        auVar226._28_4_ = uVar2;
        auVar102 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)_maxptr + lVar67)));
        auVar126 = vinsertf64x4_avx512f(ZEXT3264(auVar102),auVar226,1);
        auVar102 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)_maxptr + lVar67 + 0xc)));
        uVar2 = *(undefined4 *)((long)_maxptr + lVar67 + 8);
        auVar126 = vsubps_avx512f(*(undefined1 (*) [64])(pfVar65 + lVar67 * 2),auVar126);
        auVar127 = vinsertf64x4_avx512f
                             (ZEXT3264(CONCAT428(uVar2,CONCAT424(uVar2,CONCAT420(uVar2,CONCAT416(
                                                  uVar2,CONCAT412(uVar2,CONCAT48(uVar2,CONCAT44(
                                                  uVar2,uVar2)))))))),auVar102,1);
        uVar2 = *(undefined4 *)((long)_maxptr + lVar67 + 0x14);
        auVar217._4_4_ = uVar2;
        auVar217._0_4_ = uVar2;
        auVar217._8_4_ = uVar2;
        auVar217._12_4_ = uVar2;
        auVar217._16_4_ = uVar2;
        auVar217._20_4_ = uVar2;
        auVar217._24_4_ = uVar2;
        auVar217._28_4_ = uVar2;
        auVar127 = vsubps_avx512f(*(undefined1 (*) [64])(pfVar65 + lVar67 * 2 + 0x10),auVar127);
        uVar2 = *(undefined4 *)((long)_maxptr + lVar67 + 0x10);
        auVar128 = vinsertf64x4_avx512f
                             (ZEXT3264(CONCAT428(uVar2,CONCAT424(uVar2,CONCAT420(uVar2,CONCAT416(
                                                  uVar2,CONCAT412(uVar2,CONCAT48(uVar2,CONCAT44(
                                                  uVar2,uVar2)))))))),auVar217,1);
        uVar2 = *(undefined4 *)((long)_maxptr + lVar67 + 0x1c);
        auVar186._4_4_ = uVar2;
        auVar186._0_4_ = uVar2;
        auVar186._8_4_ = uVar2;
        auVar186._12_4_ = uVar2;
        auVar186._16_4_ = uVar2;
        auVar186._20_4_ = uVar2;
        auVar186._24_4_ = uVar2;
        auVar186._28_4_ = uVar2;
        uVar2 = *(undefined4 *)((long)_maxptr + lVar67 + 0x18);
        auVar128 = vsubps_avx512f(*(undefined1 (*) [64])(pfVar65 + lVar67 * 2 + 0x20),auVar128);
        auVar129 = vinsertf64x4_avx512f
                             (ZEXT3264(CONCAT428(uVar2,CONCAT424(uVar2,CONCAT420(uVar2,CONCAT416(
                                                  uVar2,CONCAT412(uVar2,CONCAT48(uVar2,CONCAT44(
                                                  uVar2,uVar2)))))))),auVar186,1);
        uVar2 = *(undefined4 *)((long)_maxptr + lVar67 + 0x24);
        auVar218._4_4_ = uVar2;
        auVar218._0_4_ = uVar2;
        auVar218._8_4_ = uVar2;
        auVar218._12_4_ = uVar2;
        auVar218._16_4_ = uVar2;
        auVar218._20_4_ = uVar2;
        auVar218._24_4_ = uVar2;
        auVar218._28_4_ = uVar2;
        auVar129 = vsubps_avx512f(*(undefined1 (*) [64])(pfVar65 + lVar67 * 2 + 0x30),auVar129);
        uVar2 = *(undefined4 *)((long)_maxptr + lVar67 + 0x20);
        auVar130 = vinsertf64x4_avx512f
                             (ZEXT3264(CONCAT428(uVar2,CONCAT424(uVar2,CONCAT420(uVar2,CONCAT416(
                                                  uVar2,CONCAT412(uVar2,CONCAT48(uVar2,CONCAT44(
                                                  uVar2,uVar2)))))))),auVar218,1);
        uVar2 = *(undefined4 *)((long)_maxptr + lVar67 + 0x2c);
        auVar219._4_4_ = uVar2;
        auVar219._0_4_ = uVar2;
        auVar219._8_4_ = uVar2;
        auVar219._12_4_ = uVar2;
        auVar219._16_4_ = uVar2;
        auVar219._20_4_ = uVar2;
        auVar219._24_4_ = uVar2;
        auVar219._28_4_ = uVar2;
        auVar102 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)_maxptr + lVar67 + 0x28)));
        auVar130 = vsubps_avx512f(*(undefined1 (*) [64])(pfVar65 + lVar67 * 2 + 0x40),auVar130);
        auVar131 = vinsertf64x4_avx512f(ZEXT3264(auVar102),auVar219,1);
        auVar102 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)_maxptr + lVar67 + 0x34)));
        auVar131 = vsubps_avx512f(*(undefined1 (*) [64])(pfVar65 + lVar67 * 2 + 0x50),auVar131);
        uVar2 = *(undefined4 *)((long)_maxptr + lVar67 + 0x30);
        auVar132 = vinsertf64x4_avx512f
                             (ZEXT3264(CONCAT428(uVar2,CONCAT424(uVar2,CONCAT420(uVar2,CONCAT416(
                                                  uVar2,CONCAT412(uVar2,CONCAT48(uVar2,CONCAT44(
                                                  uVar2,uVar2)))))))),auVar102,1);
        auVar102 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)_maxptr + lVar67 + 0x3c)));
        auVar103 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)_maxptr + lVar67 + 0x38)));
        auVar132 = vsubps_avx512f(*(undefined1 (*) [64])(pfVar65 + lVar67 * 2 + 0x60),auVar132);
        auVar137 = vinsertf64x4_avx512f(ZEXT3264(auVar103),auVar102,1);
        auVar137 = vsubps_avx512f(*(undefined1 (*) [64])(pfVar65 + lVar67 * 2 + 0x70),auVar137);
        auVar126 = vminps_avx512f(auVar126,(undefined1  [64])afVar207);
        auVar126 = vmaxps_avx512f(auVar126,(undefined1  [64])::_ps512_exp_lo);
        auVar139 = vfmadd213ps_avx512f((undefined1  [64])::_ps512_cephes_LOG2EF,auVar126,
                                       (undefined1  [64])afVar209);
        auVar141 = vrndscaleps_avx512f(auVar139,1);
        uVar6 = vcmpps_avx512f(auVar139,auVar141,1);
        auVar139 = vsubps_avx512f(auVar141,(undefined1  [64])afVar51);
        bVar5 = (bool)((byte)uVar6 & 1);
        auVar143._0_4_ = (uint)bVar5 * auVar139._0_4_ | (uint)!bVar5 * auVar141._0_4_;
        bVar5 = (bool)((byte)(uVar6 >> 1) & 1);
        auVar143._4_4_ = (uint)bVar5 * auVar139._4_4_ | (uint)!bVar5 * auVar141._4_4_;
        bVar5 = (bool)((byte)(uVar6 >> 2) & 1);
        auVar143._8_4_ = (uint)bVar5 * auVar139._8_4_ | (uint)!bVar5 * auVar141._8_4_;
        bVar5 = (bool)((byte)(uVar6 >> 3) & 1);
        auVar143._12_4_ = (uint)bVar5 * auVar139._12_4_ | (uint)!bVar5 * auVar141._12_4_;
        bVar5 = (bool)((byte)(uVar6 >> 4) & 1);
        auVar143._16_4_ = (uint)bVar5 * auVar139._16_4_ | (uint)!bVar5 * auVar141._16_4_;
        bVar5 = (bool)((byte)(uVar6 >> 5) & 1);
        auVar143._20_4_ = (uint)bVar5 * auVar139._20_4_ | (uint)!bVar5 * auVar141._20_4_;
        bVar5 = (bool)((byte)(uVar6 >> 6) & 1);
        auVar143._24_4_ = (uint)bVar5 * auVar139._24_4_ | (uint)!bVar5 * auVar141._24_4_;
        bVar5 = (bool)((byte)(uVar6 >> 7) & 1);
        auVar143._28_4_ = (uint)bVar5 * auVar139._28_4_ | (uint)!bVar5 * auVar141._28_4_;
        bVar5 = (bool)((byte)(uVar6 >> 8) & 1);
        auVar143._32_4_ = (uint)bVar5 * auVar139._32_4_ | (uint)!bVar5 * auVar141._32_4_;
        bVar5 = (bool)((byte)(uVar6 >> 9) & 1);
        auVar143._36_4_ = (uint)bVar5 * auVar139._36_4_ | (uint)!bVar5 * auVar141._36_4_;
        bVar5 = (bool)((byte)(uVar6 >> 10) & 1);
        auVar143._40_4_ = (uint)bVar5 * auVar139._40_4_ | (uint)!bVar5 * auVar141._40_4_;
        bVar5 = (bool)((byte)(uVar6 >> 0xb) & 1);
        auVar143._44_4_ = (uint)bVar5 * auVar139._44_4_ | (uint)!bVar5 * auVar141._44_4_;
        bVar5 = (bool)((byte)(uVar6 >> 0xc) & 1);
        auVar143._48_4_ = (uint)bVar5 * auVar139._48_4_ | (uint)!bVar5 * auVar141._48_4_;
        bVar5 = (bool)((byte)(uVar6 >> 0xd) & 1);
        auVar143._52_4_ = (uint)bVar5 * auVar139._52_4_ | (uint)!bVar5 * auVar141._52_4_;
        bVar5 = (bool)((byte)(uVar6 >> 0xe) & 1);
        auVar143._56_4_ = (uint)bVar5 * auVar139._56_4_ | (uint)!bVar5 * auVar141._56_4_;
        bVar5 = SUB81(uVar6 >> 0xf,0);
        auVar143._60_4_ = (uint)bVar5 * auVar139._60_4_ | (uint)!bVar5 * auVar141._60_4_;
        auVar126 = vfmadd231ps_avx512f(auVar126,auVar143,auVar125);
        auVar126 = vfmadd231ps_avx512f(auVar126,auVar143,auVar124);
        auVar139 = vmulps_avx512f(auVar126,auVar126);
        auVar141 = vfmadd213ps_avx512f(auVar126,(undefined1  [64])::_ps512_cephes_exp_p0,
                                       (undefined1  [64])::_ps512_cephes_exp_p1);
        auVar141 = vfmadd213ps_avx512f(auVar141,auVar126,(undefined1  [64])::_ps512_cephes_exp_p2);
        auVar141 = vfmadd213ps_avx512f(auVar141,auVar126,(undefined1  [64])::_ps512_cephes_exp_p3);
        auVar141 = vfmadd213ps_avx512f(auVar141,auVar126,(undefined1  [64])::_ps512_cephes_exp_p4);
        auVar141 = vfmadd213ps_avx512f(auVar141,auVar126,(undefined1  [64])afVar209);
        auVar126 = vfmadd213ps_avx512f(auVar141,auVar139,auVar126);
        auVar126 = vaddps_avx512f(auVar126,(undefined1  [64])afVar51);
        auVar139 = vcvttps2dq_avx512f(auVar143);
        auVar141 = vmovdqa64_avx512f((undefined1  [64])::_pi32_512_0x7f);
        auVar139 = vpaddd_avx512f(auVar139,auVar141);
        auVar139 = vpslld_avx512f(auVar139,0x17);
        auVar143 = vmulps_avx512f(auVar126,auVar139);
        auVar126 = vminps_avx512f(auVar127,(undefined1  [64])afVar207);
        auVar126 = vmaxps_avx512f(auVar126,(undefined1  [64])::_ps512_exp_lo);
        auVar127 = vfmadd213ps_avx512f((undefined1  [64])::_ps512_cephes_LOG2EF,auVar126,
                                       (undefined1  [64])afVar209);
        auVar139 = vrndscaleps_avx512f(auVar127,1);
        uVar6 = vcmpps_avx512f(auVar127,auVar139,1);
        auVar127 = vsubps_avx512f(auVar139,(undefined1  [64])afVar51);
        bVar5 = (bool)((byte)uVar6 & 1);
        auVar145._0_4_ = (uint)bVar5 * auVar127._0_4_ | (uint)!bVar5 * auVar139._0_4_;
        bVar5 = (bool)((byte)(uVar6 >> 1) & 1);
        auVar145._4_4_ = (uint)bVar5 * auVar127._4_4_ | (uint)!bVar5 * auVar139._4_4_;
        bVar5 = (bool)((byte)(uVar6 >> 2) & 1);
        auVar145._8_4_ = (uint)bVar5 * auVar127._8_4_ | (uint)!bVar5 * auVar139._8_4_;
        bVar5 = (bool)((byte)(uVar6 >> 3) & 1);
        auVar145._12_4_ = (uint)bVar5 * auVar127._12_4_ | (uint)!bVar5 * auVar139._12_4_;
        bVar5 = (bool)((byte)(uVar6 >> 4) & 1);
        auVar145._16_4_ = (uint)bVar5 * auVar127._16_4_ | (uint)!bVar5 * auVar139._16_4_;
        bVar5 = (bool)((byte)(uVar6 >> 5) & 1);
        auVar145._20_4_ = (uint)bVar5 * auVar127._20_4_ | (uint)!bVar5 * auVar139._20_4_;
        bVar5 = (bool)((byte)(uVar6 >> 6) & 1);
        auVar145._24_4_ = (uint)bVar5 * auVar127._24_4_ | (uint)!bVar5 * auVar139._24_4_;
        bVar5 = (bool)((byte)(uVar6 >> 7) & 1);
        auVar145._28_4_ = (uint)bVar5 * auVar127._28_4_ | (uint)!bVar5 * auVar139._28_4_;
        bVar5 = (bool)((byte)(uVar6 >> 8) & 1);
        auVar145._32_4_ = (uint)bVar5 * auVar127._32_4_ | (uint)!bVar5 * auVar139._32_4_;
        bVar5 = (bool)((byte)(uVar6 >> 9) & 1);
        auVar145._36_4_ = (uint)bVar5 * auVar127._36_4_ | (uint)!bVar5 * auVar139._36_4_;
        bVar5 = (bool)((byte)(uVar6 >> 10) & 1);
        auVar145._40_4_ = (uint)bVar5 * auVar127._40_4_ | (uint)!bVar5 * auVar139._40_4_;
        bVar5 = (bool)((byte)(uVar6 >> 0xb) & 1);
        auVar145._44_4_ = (uint)bVar5 * auVar127._44_4_ | (uint)!bVar5 * auVar139._44_4_;
        bVar5 = (bool)((byte)(uVar6 >> 0xc) & 1);
        auVar145._48_4_ = (uint)bVar5 * auVar127._48_4_ | (uint)!bVar5 * auVar139._48_4_;
        bVar5 = (bool)((byte)(uVar6 >> 0xd) & 1);
        auVar145._52_4_ = (uint)bVar5 * auVar127._52_4_ | (uint)!bVar5 * auVar139._52_4_;
        bVar5 = (bool)((byte)(uVar6 >> 0xe) & 1);
        auVar145._56_4_ = (uint)bVar5 * auVar127._56_4_ | (uint)!bVar5 * auVar139._56_4_;
        bVar5 = SUB81(uVar6 >> 0xf,0);
        auVar145._60_4_ = (uint)bVar5 * auVar127._60_4_ | (uint)!bVar5 * auVar139._60_4_;
        auVar126 = vfmadd231ps_avx512f(auVar126,auVar145,auVar125);
        auVar126 = vfmadd231ps_avx512f(auVar126,auVar145,auVar124);
        auVar127 = vmulps_avx512f(auVar126,auVar126);
        auVar139 = vfmadd213ps_avx512f(auVar126,(undefined1  [64])::_ps512_cephes_exp_p0,
                                       (undefined1  [64])::_ps512_cephes_exp_p1);
        auVar139 = vfmadd213ps_avx512f(auVar139,auVar126,(undefined1  [64])::_ps512_cephes_exp_p2);
        auVar139 = vfmadd213ps_avx512f(auVar139,auVar126,(undefined1  [64])::_ps512_cephes_exp_p3);
        auVar139 = vfmadd213ps_avx512f(auVar139,auVar126,(undefined1  [64])::_ps512_cephes_exp_p4);
        auVar139 = vfmadd213ps_avx512f(auVar139,auVar126,(undefined1  [64])afVar209);
        auVar126 = vfmadd213ps_avx512f(auVar139,auVar127,auVar126);
        auVar126 = vaddps_avx512f(auVar126,(undefined1  [64])afVar51);
        auVar127 = vcvttps2dq_avx512f(auVar145);
        auVar127 = vpaddd_avx512f(auVar127,auVar141);
        auVar127 = vpslld_avx512f(auVar127,0x17);
        auVar145 = vmulps_avx512f(auVar126,auVar127);
        auVar126 = vminps_avx512f(auVar128,(undefined1  [64])afVar207);
        auVar126 = vmaxps_avx512f(auVar126,(undefined1  [64])::_ps512_exp_lo);
        auVar127 = vfmadd213ps_avx512f((undefined1  [64])::_ps512_cephes_LOG2EF,auVar126,
                                       (undefined1  [64])afVar209);
        auVar128 = vrndscaleps_avx512f(auVar127,1);
        uVar6 = vcmpps_avx512f(auVar127,auVar128,1);
        auVar127 = vsubps_avx512f(auVar128,(undefined1  [64])afVar51);
        bVar5 = (bool)((byte)uVar6 & 1);
        auVar139._0_4_ = (uint)bVar5 * auVar127._0_4_ | (uint)!bVar5 * auVar128._0_4_;
        bVar5 = (bool)((byte)(uVar6 >> 1) & 1);
        auVar139._4_4_ = (uint)bVar5 * auVar127._4_4_ | (uint)!bVar5 * auVar128._4_4_;
        bVar5 = (bool)((byte)(uVar6 >> 2) & 1);
        auVar139._8_4_ = (uint)bVar5 * auVar127._8_4_ | (uint)!bVar5 * auVar128._8_4_;
        bVar5 = (bool)((byte)(uVar6 >> 3) & 1);
        auVar139._12_4_ = (uint)bVar5 * auVar127._12_4_ | (uint)!bVar5 * auVar128._12_4_;
        bVar5 = (bool)((byte)(uVar6 >> 4) & 1);
        auVar139._16_4_ = (uint)bVar5 * auVar127._16_4_ | (uint)!bVar5 * auVar128._16_4_;
        bVar5 = (bool)((byte)(uVar6 >> 5) & 1);
        auVar139._20_4_ = (uint)bVar5 * auVar127._20_4_ | (uint)!bVar5 * auVar128._20_4_;
        bVar5 = (bool)((byte)(uVar6 >> 6) & 1);
        auVar139._24_4_ = (uint)bVar5 * auVar127._24_4_ | (uint)!bVar5 * auVar128._24_4_;
        bVar5 = (bool)((byte)(uVar6 >> 7) & 1);
        auVar139._28_4_ = (uint)bVar5 * auVar127._28_4_ | (uint)!bVar5 * auVar128._28_4_;
        bVar5 = (bool)((byte)(uVar6 >> 8) & 1);
        auVar139._32_4_ = (uint)bVar5 * auVar127._32_4_ | (uint)!bVar5 * auVar128._32_4_;
        bVar5 = (bool)((byte)(uVar6 >> 9) & 1);
        auVar139._36_4_ = (uint)bVar5 * auVar127._36_4_ | (uint)!bVar5 * auVar128._36_4_;
        bVar5 = (bool)((byte)(uVar6 >> 10) & 1);
        auVar139._40_4_ = (uint)bVar5 * auVar127._40_4_ | (uint)!bVar5 * auVar128._40_4_;
        bVar5 = (bool)((byte)(uVar6 >> 0xb) & 1);
        auVar139._44_4_ = (uint)bVar5 * auVar127._44_4_ | (uint)!bVar5 * auVar128._44_4_;
        bVar5 = (bool)((byte)(uVar6 >> 0xc) & 1);
        auVar139._48_4_ = (uint)bVar5 * auVar127._48_4_ | (uint)!bVar5 * auVar128._48_4_;
        bVar5 = (bool)((byte)(uVar6 >> 0xd) & 1);
        auVar139._52_4_ = (uint)bVar5 * auVar127._52_4_ | (uint)!bVar5 * auVar128._52_4_;
        bVar5 = (bool)((byte)(uVar6 >> 0xe) & 1);
        auVar139._56_4_ = (uint)bVar5 * auVar127._56_4_ | (uint)!bVar5 * auVar128._56_4_;
        bVar5 = SUB81(uVar6 >> 0xf,0);
        auVar139._60_4_ = (uint)bVar5 * auVar127._60_4_ | (uint)!bVar5 * auVar128._60_4_;
        auVar126 = vfmadd231ps_avx512f(auVar126,auVar139,auVar125);
        auVar126 = vfmadd231ps_avx512f(auVar126,auVar139,auVar124);
        auVar127 = vmulps_avx512f(auVar126,auVar126);
        auVar128 = vfmadd213ps_avx512f(auVar126,(undefined1  [64])::_ps512_cephes_exp_p0,
                                       (undefined1  [64])::_ps512_cephes_exp_p1);
        auVar128 = vfmadd213ps_avx512f(auVar128,auVar126,(undefined1  [64])::_ps512_cephes_exp_p2);
        auVar128 = vfmadd213ps_avx512f(auVar128,auVar126,(undefined1  [64])::_ps512_cephes_exp_p3);
        auVar128 = vfmadd213ps_avx512f(auVar128,auVar126,(undefined1  [64])::_ps512_cephes_exp_p4);
        auVar128 = vfmadd213ps_avx512f(auVar128,auVar126,(undefined1  [64])afVar209);
        auVar126 = vfmadd213ps_avx512f(auVar128,auVar127,auVar126);
        auVar126 = vaddps_avx512f(auVar126,(undefined1  [64])afVar51);
        auVar127 = vcvttps2dq_avx512f(auVar139);
        auVar127 = vpaddd_avx512f(auVar127,auVar141);
        auVar127 = vpslld_avx512f(auVar127,0x17);
        auVar147 = vmulps_avx512f(auVar126,auVar127);
        auVar126 = vminps_avx512f(auVar129,(undefined1  [64])afVar207);
        auVar126 = vmaxps_avx512f(auVar126,(undefined1  [64])::_ps512_exp_lo);
        auVar127 = vfmadd213ps_avx512f((undefined1  [64])::_ps512_cephes_LOG2EF,auVar126,
                                       (undefined1  [64])afVar209);
        auVar128 = vrndscaleps_avx512f(auVar127,1);
        uVar6 = vcmpps_avx512f(auVar127,auVar128,1);
        auVar127 = vsubps_avx512f(auVar128,(undefined1  [64])afVar51);
        bVar5 = (bool)((byte)uVar6 & 1);
        auVar129._0_4_ = (uint)bVar5 * auVar127._0_4_ | (uint)!bVar5 * auVar128._0_4_;
        bVar5 = (bool)((byte)(uVar6 >> 1) & 1);
        auVar129._4_4_ = (uint)bVar5 * auVar127._4_4_ | (uint)!bVar5 * auVar128._4_4_;
        bVar5 = (bool)((byte)(uVar6 >> 2) & 1);
        auVar129._8_4_ = (uint)bVar5 * auVar127._8_4_ | (uint)!bVar5 * auVar128._8_4_;
        bVar5 = (bool)((byte)(uVar6 >> 3) & 1);
        auVar129._12_4_ = (uint)bVar5 * auVar127._12_4_ | (uint)!bVar5 * auVar128._12_4_;
        bVar5 = (bool)((byte)(uVar6 >> 4) & 1);
        auVar129._16_4_ = (uint)bVar5 * auVar127._16_4_ | (uint)!bVar5 * auVar128._16_4_;
        bVar5 = (bool)((byte)(uVar6 >> 5) & 1);
        auVar129._20_4_ = (uint)bVar5 * auVar127._20_4_ | (uint)!bVar5 * auVar128._20_4_;
        bVar5 = (bool)((byte)(uVar6 >> 6) & 1);
        auVar129._24_4_ = (uint)bVar5 * auVar127._24_4_ | (uint)!bVar5 * auVar128._24_4_;
        bVar5 = (bool)((byte)(uVar6 >> 7) & 1);
        auVar129._28_4_ = (uint)bVar5 * auVar127._28_4_ | (uint)!bVar5 * auVar128._28_4_;
        bVar5 = (bool)((byte)(uVar6 >> 8) & 1);
        auVar129._32_4_ = (uint)bVar5 * auVar127._32_4_ | (uint)!bVar5 * auVar128._32_4_;
        bVar5 = (bool)((byte)(uVar6 >> 9) & 1);
        auVar129._36_4_ = (uint)bVar5 * auVar127._36_4_ | (uint)!bVar5 * auVar128._36_4_;
        bVar5 = (bool)((byte)(uVar6 >> 10) & 1);
        auVar129._40_4_ = (uint)bVar5 * auVar127._40_4_ | (uint)!bVar5 * auVar128._40_4_;
        bVar5 = (bool)((byte)(uVar6 >> 0xb) & 1);
        auVar129._44_4_ = (uint)bVar5 * auVar127._44_4_ | (uint)!bVar5 * auVar128._44_4_;
        bVar5 = (bool)((byte)(uVar6 >> 0xc) & 1);
        auVar129._48_4_ = (uint)bVar5 * auVar127._48_4_ | (uint)!bVar5 * auVar128._48_4_;
        bVar5 = (bool)((byte)(uVar6 >> 0xd) & 1);
        auVar129._52_4_ = (uint)bVar5 * auVar127._52_4_ | (uint)!bVar5 * auVar128._52_4_;
        bVar5 = (bool)((byte)(uVar6 >> 0xe) & 1);
        auVar129._56_4_ = (uint)bVar5 * auVar127._56_4_ | (uint)!bVar5 * auVar128._56_4_;
        bVar5 = SUB81(uVar6 >> 0xf,0);
        auVar129._60_4_ = (uint)bVar5 * auVar127._60_4_ | (uint)!bVar5 * auVar128._60_4_;
        auVar126 = vfmadd231ps_avx512f(auVar126,auVar129,auVar125);
        auVar126 = vfmadd231ps_avx512f(auVar126,auVar129,auVar124);
        auVar127 = vmulps_avx512f(auVar126,auVar126);
        auVar128 = vfmadd213ps_avx512f(auVar126,(undefined1  [64])::_ps512_cephes_exp_p0,
                                       (undefined1  [64])::_ps512_cephes_exp_p1);
        auVar128 = vfmadd213ps_avx512f(auVar128,auVar126,(undefined1  [64])::_ps512_cephes_exp_p2);
        auVar128 = vfmadd213ps_avx512f(auVar128,auVar126,(undefined1  [64])::_ps512_cephes_exp_p3);
        auVar128 = vfmadd213ps_avx512f(auVar128,auVar126,(undefined1  [64])::_ps512_cephes_exp_p4);
        auVar128 = vfmadd213ps_avx512f(auVar128,auVar126,(undefined1  [64])afVar209);
        auVar126 = vfmadd213ps_avx512f(auVar128,auVar127,auVar126);
        auVar126 = vaddps_avx512f(auVar126,(undefined1  [64])afVar51);
        auVar127 = vcvttps2dq_avx512f(auVar129);
        auVar127 = vpaddd_avx512f(auVar127,auVar141);
        auVar127 = vpslld_avx512f(auVar127,0x17);
        auVar149 = vmulps_avx512f(auVar126,auVar127);
        auVar126 = vminps_avx512f(auVar130,(undefined1  [64])afVar207);
        auVar126 = vmaxps_avx512f(auVar126,(undefined1  [64])::_ps512_exp_lo);
        auVar127 = vfmadd213ps_avx512f((undefined1  [64])::_ps512_cephes_LOG2EF,auVar126,
                                       (undefined1  [64])afVar209);
        auVar128 = vrndscaleps_avx512f(auVar127,1);
        uVar6 = vcmpps_avx512f(auVar127,auVar128,1);
        auVar127 = vsubps_avx512f(auVar128,(undefined1  [64])afVar51);
        bVar5 = (bool)((byte)uVar6 & 1);
        auVar130._0_4_ = (uint)bVar5 * auVar127._0_4_ | (uint)!bVar5 * auVar128._0_4_;
        bVar5 = (bool)((byte)(uVar6 >> 1) & 1);
        auVar130._4_4_ = (uint)bVar5 * auVar127._4_4_ | (uint)!bVar5 * auVar128._4_4_;
        bVar5 = (bool)((byte)(uVar6 >> 2) & 1);
        auVar130._8_4_ = (uint)bVar5 * auVar127._8_4_ | (uint)!bVar5 * auVar128._8_4_;
        bVar5 = (bool)((byte)(uVar6 >> 3) & 1);
        auVar130._12_4_ = (uint)bVar5 * auVar127._12_4_ | (uint)!bVar5 * auVar128._12_4_;
        bVar5 = (bool)((byte)(uVar6 >> 4) & 1);
        auVar130._16_4_ = (uint)bVar5 * auVar127._16_4_ | (uint)!bVar5 * auVar128._16_4_;
        bVar5 = (bool)((byte)(uVar6 >> 5) & 1);
        auVar130._20_4_ = (uint)bVar5 * auVar127._20_4_ | (uint)!bVar5 * auVar128._20_4_;
        bVar5 = (bool)((byte)(uVar6 >> 6) & 1);
        auVar130._24_4_ = (uint)bVar5 * auVar127._24_4_ | (uint)!bVar5 * auVar128._24_4_;
        bVar5 = (bool)((byte)(uVar6 >> 7) & 1);
        auVar130._28_4_ = (uint)bVar5 * auVar127._28_4_ | (uint)!bVar5 * auVar128._28_4_;
        bVar5 = (bool)((byte)(uVar6 >> 8) & 1);
        auVar130._32_4_ = (uint)bVar5 * auVar127._32_4_ | (uint)!bVar5 * auVar128._32_4_;
        bVar5 = (bool)((byte)(uVar6 >> 9) & 1);
        auVar130._36_4_ = (uint)bVar5 * auVar127._36_4_ | (uint)!bVar5 * auVar128._36_4_;
        bVar5 = (bool)((byte)(uVar6 >> 10) & 1);
        auVar130._40_4_ = (uint)bVar5 * auVar127._40_4_ | (uint)!bVar5 * auVar128._40_4_;
        bVar5 = (bool)((byte)(uVar6 >> 0xb) & 1);
        auVar130._44_4_ = (uint)bVar5 * auVar127._44_4_ | (uint)!bVar5 * auVar128._44_4_;
        bVar5 = (bool)((byte)(uVar6 >> 0xc) & 1);
        auVar130._48_4_ = (uint)bVar5 * auVar127._48_4_ | (uint)!bVar5 * auVar128._48_4_;
        bVar5 = (bool)((byte)(uVar6 >> 0xd) & 1);
        auVar130._52_4_ = (uint)bVar5 * auVar127._52_4_ | (uint)!bVar5 * auVar128._52_4_;
        bVar5 = (bool)((byte)(uVar6 >> 0xe) & 1);
        auVar130._56_4_ = (uint)bVar5 * auVar127._56_4_ | (uint)!bVar5 * auVar128._56_4_;
        bVar5 = SUB81(uVar6 >> 0xf,0);
        auVar130._60_4_ = (uint)bVar5 * auVar127._60_4_ | (uint)!bVar5 * auVar128._60_4_;
        auVar126 = vfmadd231ps_avx512f(auVar126,auVar130,auVar125);
        auVar126 = vfmadd231ps_avx512f(auVar126,auVar130,auVar124);
        auVar127 = vmulps_avx512f(auVar126,auVar126);
        auVar128 = vfmadd213ps_avx512f(auVar126,(undefined1  [64])::_ps512_cephes_exp_p0,
                                       (undefined1  [64])::_ps512_cephes_exp_p1);
        auVar128 = vfmadd213ps_avx512f(auVar128,auVar126,(undefined1  [64])::_ps512_cephes_exp_p2);
        auVar128 = vfmadd213ps_avx512f(auVar128,auVar126,(undefined1  [64])::_ps512_cephes_exp_p3);
        auVar128 = vfmadd213ps_avx512f(auVar128,auVar126,(undefined1  [64])::_ps512_cephes_exp_p4);
        auVar128 = vfmadd213ps_avx512f(auVar128,auVar126,(undefined1  [64])afVar209);
        auVar126 = vfmadd213ps_avx512f(auVar128,auVar127,auVar126);
        auVar126 = vaddps_avx512f(auVar126,(undefined1  [64])afVar51);
        auVar127 = vcvttps2dq_avx512f(auVar130);
        auVar127 = vpaddd_avx512f(auVar127,auVar141);
        auVar127 = vpslld_avx512f(auVar127,0x17);
        auVar151 = vmulps_avx512f(auVar126,auVar127);
        auVar126 = vminps_avx512f(auVar131,(undefined1  [64])afVar207);
        auVar126 = vmaxps_avx512f(auVar126,(undefined1  [64])::_ps512_exp_lo);
        auVar127 = vfmadd213ps_avx512f((undefined1  [64])::_ps512_cephes_LOG2EF,auVar126,
                                       (undefined1  [64])afVar209);
        auVar128 = vrndscaleps_avx512f(auVar127,1);
        uVar6 = vcmpps_avx512f(auVar127,auVar128,1);
        auVar127 = vsubps_avx512f(auVar128,(undefined1  [64])afVar51);
        bVar5 = (bool)((byte)uVar6 & 1);
        auVar131._0_4_ = (uint)bVar5 * auVar127._0_4_ | (uint)!bVar5 * auVar128._0_4_;
        bVar5 = (bool)((byte)(uVar6 >> 1) & 1);
        auVar131._4_4_ = (uint)bVar5 * auVar127._4_4_ | (uint)!bVar5 * auVar128._4_4_;
        bVar5 = (bool)((byte)(uVar6 >> 2) & 1);
        auVar131._8_4_ = (uint)bVar5 * auVar127._8_4_ | (uint)!bVar5 * auVar128._8_4_;
        bVar5 = (bool)((byte)(uVar6 >> 3) & 1);
        auVar131._12_4_ = (uint)bVar5 * auVar127._12_4_ | (uint)!bVar5 * auVar128._12_4_;
        bVar5 = (bool)((byte)(uVar6 >> 4) & 1);
        auVar131._16_4_ = (uint)bVar5 * auVar127._16_4_ | (uint)!bVar5 * auVar128._16_4_;
        bVar5 = (bool)((byte)(uVar6 >> 5) & 1);
        auVar131._20_4_ = (uint)bVar5 * auVar127._20_4_ | (uint)!bVar5 * auVar128._20_4_;
        bVar5 = (bool)((byte)(uVar6 >> 6) & 1);
        auVar131._24_4_ = (uint)bVar5 * auVar127._24_4_ | (uint)!bVar5 * auVar128._24_4_;
        bVar5 = (bool)((byte)(uVar6 >> 7) & 1);
        auVar131._28_4_ = (uint)bVar5 * auVar127._28_4_ | (uint)!bVar5 * auVar128._28_4_;
        bVar5 = (bool)((byte)(uVar6 >> 8) & 1);
        auVar131._32_4_ = (uint)bVar5 * auVar127._32_4_ | (uint)!bVar5 * auVar128._32_4_;
        bVar5 = (bool)((byte)(uVar6 >> 9) & 1);
        auVar131._36_4_ = (uint)bVar5 * auVar127._36_4_ | (uint)!bVar5 * auVar128._36_4_;
        bVar5 = (bool)((byte)(uVar6 >> 10) & 1);
        auVar131._40_4_ = (uint)bVar5 * auVar127._40_4_ | (uint)!bVar5 * auVar128._40_4_;
        bVar5 = (bool)((byte)(uVar6 >> 0xb) & 1);
        auVar131._44_4_ = (uint)bVar5 * auVar127._44_4_ | (uint)!bVar5 * auVar128._44_4_;
        bVar5 = (bool)((byte)(uVar6 >> 0xc) & 1);
        auVar131._48_4_ = (uint)bVar5 * auVar127._48_4_ | (uint)!bVar5 * auVar128._48_4_;
        bVar5 = (bool)((byte)(uVar6 >> 0xd) & 1);
        auVar131._52_4_ = (uint)bVar5 * auVar127._52_4_ | (uint)!bVar5 * auVar128._52_4_;
        bVar5 = (bool)((byte)(uVar6 >> 0xe) & 1);
        auVar131._56_4_ = (uint)bVar5 * auVar127._56_4_ | (uint)!bVar5 * auVar128._56_4_;
        bVar5 = SUB81(uVar6 >> 0xf,0);
        auVar131._60_4_ = (uint)bVar5 * auVar127._60_4_ | (uint)!bVar5 * auVar128._60_4_;
        auVar126 = vfmadd231ps_avx512f(auVar126,auVar131,auVar125);
        auVar126 = vfmadd231ps_avx512f(auVar126,auVar131,auVar124);
        auVar127 = vmulps_avx512f(auVar126,auVar126);
        auVar128 = vfmadd213ps_avx512f(auVar126,(undefined1  [64])::_ps512_cephes_exp_p0,
                                       (undefined1  [64])::_ps512_cephes_exp_p1);
        auVar128 = vfmadd213ps_avx512f(auVar128,auVar126,(undefined1  [64])::_ps512_cephes_exp_p2);
        auVar128 = vfmadd213ps_avx512f(auVar128,auVar126,(undefined1  [64])::_ps512_cephes_exp_p3);
        auVar128 = vfmadd213ps_avx512f(auVar128,auVar126,(undefined1  [64])::_ps512_cephes_exp_p4);
        auVar128 = vfmadd213ps_avx512f(auVar128,auVar126,(undefined1  [64])afVar209);
        auVar126 = vfmadd213ps_avx512f(auVar128,auVar127,auVar126);
        auVar126 = vaddps_avx512f(auVar126,(undefined1  [64])afVar51);
        auVar127 = vcvttps2dq_avx512f(auVar131);
        auVar127 = vpaddd_avx512f(auVar127,auVar141);
        auVar127 = vpslld_avx512f(auVar127,0x17);
        auVar153 = vmulps_avx512f(auVar126,auVar127);
        auVar126 = vminps_avx512f(auVar132,(undefined1  [64])afVar207);
        auVar126 = vmaxps_avx512f(auVar126,(undefined1  [64])::_ps512_exp_lo);
        auVar127 = vfmadd213ps_avx512f((undefined1  [64])::_ps512_cephes_LOG2EF,auVar126,
                                       (undefined1  [64])afVar209);
        auVar128 = vrndscaleps_avx512f(auVar127,1);
        uVar6 = vcmpps_avx512f(auVar127,auVar128,1);
        auVar127 = vsubps_avx512f(auVar128,(undefined1  [64])afVar51);
        bVar5 = (bool)((byte)uVar6 & 1);
        auVar132._0_4_ = (uint)bVar5 * auVar127._0_4_ | (uint)!bVar5 * auVar128._0_4_;
        bVar5 = (bool)((byte)(uVar6 >> 1) & 1);
        auVar132._4_4_ = (uint)bVar5 * auVar127._4_4_ | (uint)!bVar5 * auVar128._4_4_;
        bVar5 = (bool)((byte)(uVar6 >> 2) & 1);
        auVar132._8_4_ = (uint)bVar5 * auVar127._8_4_ | (uint)!bVar5 * auVar128._8_4_;
        bVar5 = (bool)((byte)(uVar6 >> 3) & 1);
        auVar132._12_4_ = (uint)bVar5 * auVar127._12_4_ | (uint)!bVar5 * auVar128._12_4_;
        bVar5 = (bool)((byte)(uVar6 >> 4) & 1);
        auVar132._16_4_ = (uint)bVar5 * auVar127._16_4_ | (uint)!bVar5 * auVar128._16_4_;
        bVar5 = (bool)((byte)(uVar6 >> 5) & 1);
        auVar132._20_4_ = (uint)bVar5 * auVar127._20_4_ | (uint)!bVar5 * auVar128._20_4_;
        bVar5 = (bool)((byte)(uVar6 >> 6) & 1);
        auVar132._24_4_ = (uint)bVar5 * auVar127._24_4_ | (uint)!bVar5 * auVar128._24_4_;
        bVar5 = (bool)((byte)(uVar6 >> 7) & 1);
        auVar132._28_4_ = (uint)bVar5 * auVar127._28_4_ | (uint)!bVar5 * auVar128._28_4_;
        bVar5 = (bool)((byte)(uVar6 >> 8) & 1);
        auVar132._32_4_ = (uint)bVar5 * auVar127._32_4_ | (uint)!bVar5 * auVar128._32_4_;
        bVar5 = (bool)((byte)(uVar6 >> 9) & 1);
        auVar132._36_4_ = (uint)bVar5 * auVar127._36_4_ | (uint)!bVar5 * auVar128._36_4_;
        bVar5 = (bool)((byte)(uVar6 >> 10) & 1);
        auVar132._40_4_ = (uint)bVar5 * auVar127._40_4_ | (uint)!bVar5 * auVar128._40_4_;
        bVar5 = (bool)((byte)(uVar6 >> 0xb) & 1);
        auVar132._44_4_ = (uint)bVar5 * auVar127._44_4_ | (uint)!bVar5 * auVar128._44_4_;
        bVar5 = (bool)((byte)(uVar6 >> 0xc) & 1);
        auVar132._48_4_ = (uint)bVar5 * auVar127._48_4_ | (uint)!bVar5 * auVar128._48_4_;
        bVar5 = (bool)((byte)(uVar6 >> 0xd) & 1);
        auVar132._52_4_ = (uint)bVar5 * auVar127._52_4_ | (uint)!bVar5 * auVar128._52_4_;
        bVar5 = (bool)((byte)(uVar6 >> 0xe) & 1);
        auVar132._56_4_ = (uint)bVar5 * auVar127._56_4_ | (uint)!bVar5 * auVar128._56_4_;
        bVar5 = SUB81(uVar6 >> 0xf,0);
        auVar132._60_4_ = (uint)bVar5 * auVar127._60_4_ | (uint)!bVar5 * auVar128._60_4_;
        auVar126 = vfmadd231ps_avx512f(auVar126,auVar132,auVar125);
        auVar126 = vfmadd231ps_avx512f(auVar126,auVar132,auVar124);
        auVar127 = vmulps_avx512f(auVar126,auVar126);
        auVar128 = vfmadd213ps_avx512f(auVar126,(undefined1  [64])::_ps512_cephes_exp_p0,
                                       (undefined1  [64])::_ps512_cephes_exp_p1);
        auVar128 = vfmadd213ps_avx512f(auVar128,auVar126,(undefined1  [64])::_ps512_cephes_exp_p2);
        auVar128 = vfmadd213ps_avx512f(auVar128,auVar126,(undefined1  [64])::_ps512_cephes_exp_p3);
        auVar128 = vfmadd213ps_avx512f(auVar128,auVar126,(undefined1  [64])::_ps512_cephes_exp_p4);
        auVar128 = vfmadd213ps_avx512f(auVar128,auVar126,(undefined1  [64])afVar209);
        auVar126 = vfmadd213ps_avx512f(auVar128,auVar127,auVar126);
        auVar126 = vaddps_avx512f(auVar126,(undefined1  [64])afVar51);
        auVar127 = vcvttps2dq_avx512f(auVar132);
        auVar127 = vpaddd_avx512f(auVar127,auVar141);
        auVar127 = vpslld_avx512f(auVar127,0x17);
        auVar155 = vmulps_avx512f(auVar126,auVar127);
        auVar126 = vminps_avx512f((undefined1  [64])afVar207,auVar137);
        auVar128 = vmaxps_avx512f(auVar126,(undefined1  [64])::_ps512_exp_lo);
        auVar126 = ZEXT3264(auVar101);
        auVar101 = vpbroadcastd_avx512vl(ZEXT416(0x3f800000));
        auVar139 = ZEXT3264(auVar101);
        auVar127 = ZEXT3264(auVar91);
        auVar129 = vfmadd213ps_avx512f((undefined1  [64])::_ps512_cephes_LOG2EF,auVar128,
                                       (undefined1  [64])afVar209);
        auVar130 = vrndscaleps_avx512f(auVar129,1);
        uVar6 = vcmpps_avx512f(auVar129,auVar130,1);
        auVar129 = vsubps_avx512f(auVar130,(undefined1  [64])afVar51);
        bVar5 = (bool)((byte)uVar6 & 1);
        auVar137._0_4_ = (uint)bVar5 * auVar129._0_4_ | (uint)!bVar5 * auVar130._0_4_;
        bVar5 = (bool)((byte)(uVar6 >> 1) & 1);
        auVar137._4_4_ = (uint)bVar5 * auVar129._4_4_ | (uint)!bVar5 * auVar130._4_4_;
        bVar5 = (bool)((byte)(uVar6 >> 2) & 1);
        auVar137._8_4_ = (uint)bVar5 * auVar129._8_4_ | (uint)!bVar5 * auVar130._8_4_;
        bVar5 = (bool)((byte)(uVar6 >> 3) & 1);
        auVar137._12_4_ = (uint)bVar5 * auVar129._12_4_ | (uint)!bVar5 * auVar130._12_4_;
        bVar5 = (bool)((byte)(uVar6 >> 4) & 1);
        auVar137._16_4_ = (uint)bVar5 * auVar129._16_4_ | (uint)!bVar5 * auVar130._16_4_;
        bVar5 = (bool)((byte)(uVar6 >> 5) & 1);
        auVar137._20_4_ = (uint)bVar5 * auVar129._20_4_ | (uint)!bVar5 * auVar130._20_4_;
        bVar5 = (bool)((byte)(uVar6 >> 6) & 1);
        auVar137._24_4_ = (uint)bVar5 * auVar129._24_4_ | (uint)!bVar5 * auVar130._24_4_;
        bVar5 = (bool)((byte)(uVar6 >> 7) & 1);
        auVar137._28_4_ = (uint)bVar5 * auVar129._28_4_ | (uint)!bVar5 * auVar130._28_4_;
        bVar5 = (bool)((byte)(uVar6 >> 8) & 1);
        auVar137._32_4_ = (uint)bVar5 * auVar129._32_4_ | (uint)!bVar5 * auVar130._32_4_;
        bVar5 = (bool)((byte)(uVar6 >> 9) & 1);
        auVar137._36_4_ = (uint)bVar5 * auVar129._36_4_ | (uint)!bVar5 * auVar130._36_4_;
        bVar5 = (bool)((byte)(uVar6 >> 10) & 1);
        auVar137._40_4_ = (uint)bVar5 * auVar129._40_4_ | (uint)!bVar5 * auVar130._40_4_;
        bVar5 = (bool)((byte)(uVar6 >> 0xb) & 1);
        auVar137._44_4_ = (uint)bVar5 * auVar129._44_4_ | (uint)!bVar5 * auVar130._44_4_;
        bVar5 = (bool)((byte)(uVar6 >> 0xc) & 1);
        auVar137._48_4_ = (uint)bVar5 * auVar129._48_4_ | (uint)!bVar5 * auVar130._48_4_;
        bVar5 = (bool)((byte)(uVar6 >> 0xd) & 1);
        auVar137._52_4_ = (uint)bVar5 * auVar129._52_4_ | (uint)!bVar5 * auVar130._52_4_;
        bVar5 = (bool)((byte)(uVar6 >> 0xe) & 1);
        auVar137._56_4_ = (uint)bVar5 * auVar129._56_4_ | (uint)!bVar5 * auVar130._56_4_;
        bVar5 = SUB81(uVar6 >> 0xf,0);
        auVar137._60_4_ = (uint)bVar5 * auVar129._60_4_ | (uint)!bVar5 * auVar130._60_4_;
        auVar128 = vfmadd231ps_avx512f(auVar128,auVar137,auVar125);
        auVar132 = vfmadd231ps_avx512f(auVar128,auVar137,auVar124);
        auVar157 = vmulps_avx512f(auVar132,auVar132);
        auVar129 = vfmadd213ps_avx512f(auVar132,(undefined1  [64])::_ps512_cephes_exp_p0,
                                       (undefined1  [64])::_ps512_cephes_exp_p1);
        auVar131 = ZEXT3264(auVar93);
        auVar128 = ZEXT3264(CONCAT428(0x3f318000,
                                      CONCAT424(0x3f318000,
                                                CONCAT420(0x3f318000,
                                                          CONCAT416(0x3f318000,
                                                                    CONCAT412(0x3f318000,
                                                                              CONCAT48(0x3f318000,
                                                                                                                                                                              
                                                  0x3f3180003f318000)))))));
        auVar101 = vbroadcastss_avx512vl(ZEXT416(0x3ab743ce));
        auVar130 = ZEXT3264(auVar101);
        auVar159 = vfmadd213ps_avx512f(auVar129,auVar132,(undefined1  [64])::_ps512_cephes_exp_p2);
        auVar129 = ZEXT3264(auVar92);
        auVar159 = vfmadd213ps_avx512f(auVar159,auVar132,(undefined1  [64])::_ps512_cephes_exp_p3);
        auVar159 = vfmadd213ps_avx512f(auVar159,auVar132,(undefined1  [64])::_ps512_cephes_exp_p4);
        auVar159 = vfmadd213ps_avx512f(auVar159,auVar132,(undefined1  [64])afVar209);
        auVar132 = vfmadd213ps_avx512f(auVar159,auVar157,auVar132);
        auVar157 = vaddps_avx512f(auVar132,(undefined1  [64])afVar51);
        auVar132 = vcvttps2dq_avx512f(auVar137);
        auVar141 = vpaddd_avx512f(auVar132,auVar141);
        auVar132 = ZEXT3264(auVar94);
        auVar137 = ZEXT3264(auVar95);
        auVar141 = vpslld_avx512f(auVar141,0x17);
        auVar141 = vmulps_avx512f(auVar157,auVar141);
        *(undefined1 (*) [64])(pfVar65 + lVar67 * 2) = auVar143;
        *(undefined1 (*) [64])(pfVar65 + lVar67 * 2 + 0x10) = auVar145;
        *(undefined1 (*) [64])(pfVar65 + lVar67 * 2 + 0x20) = auVar147;
        *(undefined1 (*) [64])(pfVar65 + lVar67 * 2 + 0x30) = auVar149;
        *(undefined1 (*) [64])(pfVar65 + lVar67 * 2 + 0x40) = auVar151;
        *(undefined1 (*) [64])(pfVar65 + lVar67 * 2 + 0x50) = auVar153;
        *(undefined1 (*) [64])(pfVar65 + lVar67 * 2 + 0x60) = auVar155;
        *(undefined1 (*) [64])(pfVar65 + lVar67 * 2 + 0x70) = auVar141;
        auVar157 = vunpcklps_avx512f(auVar143,auVar145);
        auVar143 = vunpckhps_avx512f(auVar143,auVar145);
        auVar143 = vaddps_avx512f(auVar157,auVar143);
        auVar145 = vunpcklps_avx512f(auVar147,auVar149);
        auVar147 = vunpckhps_avx512f(auVar147,auVar149);
        auVar145 = vaddps_avx512f(auVar145,auVar147);
        auVar147 = vunpcklps_avx512f(auVar151,auVar153);
        auVar149 = vunpckhps_avx512f(auVar151,auVar153);
        auVar147 = vaddps_avx512f(auVar147,auVar149);
        auVar149 = vunpcklps_avx512f(auVar155,auVar141);
        auVar141 = vunpckhps_avx512f(auVar155,auVar141);
        auVar141 = vaddps_avx512f(auVar149,auVar141);
        auVar149 = vunpcklps_avx512f(auVar143,auVar145);
        auVar143 = vunpckhps_avx512f(auVar143,auVar145);
        auVar143 = vaddps_avx512f(auVar149,auVar143);
        auVar145 = vunpcklps_avx512f(auVar147,auVar141);
        auVar141 = vunpckhps_avx512f(auVar147,auVar141);
        auVar141 = vaddps_avx512f(auVar145,auVar141);
        auVar145 = vpermt2ps_avx512f(auVar143,_DAT_0053d200,auVar141);
        auVar141 = vpermt2ps_avx512f(auVar143,_DAT_0053d240,auVar141);
        auVar141 = vaddps_avx512f(auVar141,auVar145);
        auVar141 = vaddps_avx512f(auVar141,*(undefined1 (*) [64])((long)_sumptr + lVar67));
        *(undefined1 (*) [64])((long)_sumptr + lVar67) = auVar141;
        pauVar68 = pauVar68 + 0x10;
        iVar59 = iVar59 + 0x10;
        lVar67 = lVar67 + 0x40;
        lVar64 = lVar64 + 0x10;
      }
      lVar61 = 0;
      auVar102 = vbroadcastss_avx512vl(ZEXT416(0xbf800000));
      auVar103 = vbroadcastss_avx512vl(ZEXT416(0x395e8083));
      pauVar69 = pauVar68;
      while( true ) {
        afVar207 = ::_ps512_exp_hi;
        auVar120 = auVar128._0_32_;
        auVar121 = auVar130._0_32_;
        auVar122 = auVar139._0_32_;
        if (size1 <= iVar59 + 7) break;
        uVar2 = *(undefined4 *)((long)_maxptr + lVar61 + lVar67);
        auVar13._4_4_ = uVar2;
        auVar13._0_4_ = uVar2;
        auVar13._8_4_ = uVar2;
        auVar13._12_4_ = uVar2;
        auVar13._16_4_ = uVar2;
        auVar13._20_4_ = uVar2;
        auVar13._24_4_ = uVar2;
        auVar13._28_4_ = uVar2;
        auVar104 = vsubps_avx512vl(*(undefined1 (*) [32])(*pauVar68 + lVar61 * 8),auVar13);
        auVar104 = vminps_avx(auVar101,auVar104);
        auVar104 = vmaxps_avx(auVar91,auVar104);
        auVar105 = vfmadd213ps_avx512vl(auVar92,auVar104,auVar99);
        auVar108 = vroundps_avx(auVar105,1);
        uVar6 = vcmpps_avx512vl(auVar105,auVar108,1);
        auVar206._8_4_ = 0x3f800000;
        auVar206._0_8_ = 0x3f8000003f800000;
        auVar206._12_4_ = 0x3f800000;
        auVar206._16_4_ = 0x3f800000;
        auVar206._20_4_ = 0x3f800000;
        auVar206._24_4_ = 0x3f800000;
        auVar206._28_4_ = 0x3f800000;
        auVar106 = vsubps_avx512vl(auVar108,auVar206);
        bVar5 = (bool)((byte)uVar6 & 1);
        auVar107._0_4_ = (float)((uint)bVar5 * auVar106._0_4_ | (uint)!bVar5 * auVar108._0_4_);
        bVar5 = (bool)((byte)(uVar6 >> 1) & 1);
        auVar107._4_4_ = (float)((uint)bVar5 * auVar106._4_4_ | (uint)!bVar5 * auVar108._4_4_);
        bVar5 = (bool)((byte)(uVar6 >> 2) & 1);
        auVar107._8_4_ = (float)((uint)bVar5 * auVar106._8_4_ | (uint)!bVar5 * auVar108._8_4_);
        bVar5 = (bool)((byte)(uVar6 >> 3) & 1);
        auVar107._12_4_ = (float)((uint)bVar5 * auVar106._12_4_ | (uint)!bVar5 * auVar108._12_4_);
        bVar5 = (bool)((byte)(uVar6 >> 4) & 1);
        auVar107._16_4_ = (float)((uint)bVar5 * auVar106._16_4_ | (uint)!bVar5 * auVar108._16_4_);
        bVar5 = (bool)((byte)(uVar6 >> 5) & 1);
        auVar107._20_4_ = (float)((uint)bVar5 * auVar106._20_4_ | (uint)!bVar5 * auVar108._20_4_);
        bVar5 = (bool)((byte)(uVar6 >> 6) & 1);
        auVar107._24_4_ = (float)((uint)bVar5 * auVar106._24_4_ | (uint)!bVar5 * auVar108._24_4_);
        bVar5 = SUB81(uVar6 >> 7,0);
        auVar107._28_4_ = (float)((uint)bVar5 * auVar106._28_4_ | (uint)!bVar5 * auVar108._28_4_);
        auVar75 = vfmsub231ps_fma(auVar104,auVar107,auVar120);
        auVar106 = vbroadcastss_avx512vl(ZEXT416(0xb95e8083));
        auVar104 = vfnmsub231ps_avx512vl(ZEXT1632(auVar75),auVar107,auVar106);
        auVar38._4_4_ = auVar104._4_4_ * auVar104._4_4_;
        auVar38._0_4_ = auVar104._0_4_ * auVar104._0_4_;
        auVar38._8_4_ = auVar104._8_4_ * auVar104._8_4_;
        auVar38._12_4_ = auVar104._12_4_ * auVar104._12_4_;
        auVar38._16_4_ = auVar104._16_4_ * auVar104._16_4_;
        auVar38._20_4_ = auVar104._20_4_ * auVar104._20_4_;
        auVar38._24_4_ = auVar104._24_4_ * auVar104._24_4_;
        auVar38._28_4_ = auVar105._28_4_;
        auVar108 = vfmadd213ps_avx512vl(auVar93,auVar104,auVar121);
        auVar108 = vfmadd213ps_avx512vl(auVar108,auVar104,auVar100);
        auVar108 = vfmadd213ps_avx512vl(auVar108,auVar104,auVar94);
        auVar108 = vfmadd213ps_avx512vl(auVar108,auVar104,auVar95);
        auVar108 = vfmadd213ps_avx512vl(auVar108,auVar104,auVar99);
        auVar75 = vfmadd213ps_fma(auVar108,auVar38,auVar104);
        auVar193._0_4_ = (int)auVar107._0_4_;
        auVar193._4_4_ = (int)auVar107._4_4_;
        auVar193._8_4_ = (int)auVar107._8_4_;
        auVar193._12_4_ = (int)auVar107._12_4_;
        auVar193._16_4_ = (int)auVar107._16_4_;
        auVar193._20_4_ = (int)auVar107._20_4_;
        auVar193._24_4_ = (int)auVar107._24_4_;
        auVar193._28_4_ = (int)auVar107._28_4_;
        auVar104 = vpslld_avx2(auVar193,0x17);
        auVar104 = vpaddd_avx512vl(auVar104,auVar122);
        auVar105 = vfmadd213ps_avx512vl(auVar104,ZEXT1632(auVar75),auVar104);
        uVar2 = *(undefined4 *)((long)_maxptr + lVar61 + lVar67 + 4);
        auVar14._4_4_ = uVar2;
        auVar14._0_4_ = uVar2;
        auVar14._8_4_ = uVar2;
        auVar14._12_4_ = uVar2;
        auVar14._16_4_ = uVar2;
        auVar14._20_4_ = uVar2;
        auVar14._24_4_ = uVar2;
        auVar14._28_4_ = uVar2;
        auVar104 = vsubps_avx512vl(*(undefined1 (*) [32])(pauVar68[1] + lVar61 * 8),auVar14);
        auVar104 = vminps_avx(auVar101,auVar104);
        auVar104 = vmaxps_avx(auVar91,auVar104);
        auVar109 = vfmadd213ps_avx512vl(auVar92,auVar104,auVar99);
        auVar108 = vroundps_avx(auVar109,1);
        uVar6 = vcmpps_avx512vl(auVar109,auVar108,1);
        auVar110 = vsubps_avx512vl(auVar108,auVar206);
        bVar5 = (bool)((byte)uVar6 & 1);
        auVar111._0_4_ = (float)((uint)bVar5 * auVar110._0_4_ | (uint)!bVar5 * auVar108._0_4_);
        bVar5 = (bool)((byte)(uVar6 >> 1) & 1);
        auVar111._4_4_ = (float)((uint)bVar5 * auVar110._4_4_ | (uint)!bVar5 * auVar108._4_4_);
        bVar5 = (bool)((byte)(uVar6 >> 2) & 1);
        auVar111._8_4_ = (float)((uint)bVar5 * auVar110._8_4_ | (uint)!bVar5 * auVar108._8_4_);
        bVar5 = (bool)((byte)(uVar6 >> 3) & 1);
        auVar111._12_4_ = (float)((uint)bVar5 * auVar110._12_4_ | (uint)!bVar5 * auVar108._12_4_);
        bVar5 = (bool)((byte)(uVar6 >> 4) & 1);
        auVar111._16_4_ = (float)((uint)bVar5 * auVar110._16_4_ | (uint)!bVar5 * auVar108._16_4_);
        bVar5 = (bool)((byte)(uVar6 >> 5) & 1);
        auVar111._20_4_ = (float)((uint)bVar5 * auVar110._20_4_ | (uint)!bVar5 * auVar108._20_4_);
        bVar5 = (bool)((byte)(uVar6 >> 6) & 1);
        auVar111._24_4_ = (float)((uint)bVar5 * auVar110._24_4_ | (uint)!bVar5 * auVar108._24_4_);
        bVar5 = SUB81(uVar6 >> 7,0);
        auVar111._28_4_ = (float)((uint)bVar5 * auVar110._28_4_ | (uint)!bVar5 * auVar108._28_4_);
        auVar75 = vfmsub231ps_fma(auVar104,auVar111,auVar120);
        auVar104 = vfnmsub231ps_avx512vl(ZEXT1632(auVar75),auVar111,auVar106);
        auVar39._4_4_ = auVar104._4_4_ * auVar104._4_4_;
        auVar39._0_4_ = auVar104._0_4_ * auVar104._0_4_;
        auVar39._8_4_ = auVar104._8_4_ * auVar104._8_4_;
        auVar39._12_4_ = auVar104._12_4_ * auVar104._12_4_;
        auVar39._16_4_ = auVar104._16_4_ * auVar104._16_4_;
        auVar39._20_4_ = auVar104._20_4_ * auVar104._20_4_;
        auVar39._24_4_ = auVar104._24_4_ * auVar104._24_4_;
        auVar39._28_4_ = auVar109._28_4_;
        auVar108 = vfmadd213ps_avx512vl(auVar93,auVar104,auVar121);
        auVar108 = vfmadd213ps_avx512vl(auVar108,auVar104,auVar100);
        auVar108 = vfmadd213ps_avx512vl(auVar108,auVar104,auVar94);
        auVar108 = vfmadd213ps_avx512vl(auVar108,auVar104,auVar95);
        auVar108 = vfmadd213ps_avx512vl(auVar108,auVar104,auVar99);
        auVar75 = vfmadd213ps_fma(auVar108,auVar39,auVar104);
        auVar194._0_4_ = (int)auVar111._0_4_;
        auVar194._4_4_ = (int)auVar111._4_4_;
        auVar194._8_4_ = (int)auVar111._8_4_;
        auVar194._12_4_ = (int)auVar111._12_4_;
        auVar194._16_4_ = (int)auVar111._16_4_;
        auVar194._20_4_ = (int)auVar111._20_4_;
        auVar194._24_4_ = (int)auVar111._24_4_;
        auVar194._28_4_ = (int)auVar111._28_4_;
        auVar104 = vpslld_avx2(auVar194,0x17);
        auVar104 = vpaddd_avx512vl(auVar104,auVar122);
        auVar75 = vfmadd213ps_fma(auVar104,ZEXT1632(auVar75),auVar104);
        uVar2 = *(undefined4 *)((long)_maxptr + lVar61 + lVar67 + 8);
        auVar15._4_4_ = uVar2;
        auVar15._0_4_ = uVar2;
        auVar15._8_4_ = uVar2;
        auVar15._12_4_ = uVar2;
        auVar15._16_4_ = uVar2;
        auVar15._20_4_ = uVar2;
        auVar15._24_4_ = uVar2;
        auVar15._28_4_ = uVar2;
        auVar104 = vsubps_avx512vl(*(undefined1 (*) [32])(pauVar68[2] + lVar61 * 8),auVar15);
        auVar104 = vminps_avx(auVar101,auVar104);
        auVar104 = vmaxps_avx(auVar91,auVar104);
        auVar109 = vfmadd213ps_avx512vl(auVar92,auVar104,auVar99);
        auVar108 = vroundps_avx(auVar109,1);
        uVar6 = vcmpps_avx512vl(auVar109,auVar108,1);
        auVar110 = vsubps_avx512vl(auVar108,auVar206);
        bVar5 = (bool)((byte)uVar6 & 1);
        auVar112._0_4_ = (float)((uint)bVar5 * auVar110._0_4_ | (uint)!bVar5 * auVar108._0_4_);
        bVar5 = (bool)((byte)(uVar6 >> 1) & 1);
        auVar112._4_4_ = (float)((uint)bVar5 * auVar110._4_4_ | (uint)!bVar5 * auVar108._4_4_);
        bVar5 = (bool)((byte)(uVar6 >> 2) & 1);
        auVar112._8_4_ = (float)((uint)bVar5 * auVar110._8_4_ | (uint)!bVar5 * auVar108._8_4_);
        bVar5 = (bool)((byte)(uVar6 >> 3) & 1);
        auVar112._12_4_ = (float)((uint)bVar5 * auVar110._12_4_ | (uint)!bVar5 * auVar108._12_4_);
        bVar5 = (bool)((byte)(uVar6 >> 4) & 1);
        auVar112._16_4_ = (float)((uint)bVar5 * auVar110._16_4_ | (uint)!bVar5 * auVar108._16_4_);
        bVar5 = (bool)((byte)(uVar6 >> 5) & 1);
        auVar112._20_4_ = (float)((uint)bVar5 * auVar110._20_4_ | (uint)!bVar5 * auVar108._20_4_);
        bVar5 = (bool)((byte)(uVar6 >> 6) & 1);
        auVar112._24_4_ = (float)((uint)bVar5 * auVar110._24_4_ | (uint)!bVar5 * auVar108._24_4_);
        bVar5 = SUB81(uVar6 >> 7,0);
        auVar112._28_4_ = (float)((uint)bVar5 * auVar110._28_4_ | (uint)!bVar5 * auVar108._28_4_);
        auVar89 = vfmsub231ps_fma(auVar104,auVar112,auVar120);
        auVar104 = vfnmsub231ps_avx512vl(ZEXT1632(auVar89),auVar112,auVar106);
        auVar40._4_4_ = auVar104._4_4_ * auVar104._4_4_;
        auVar40._0_4_ = auVar104._0_4_ * auVar104._0_4_;
        auVar40._8_4_ = auVar104._8_4_ * auVar104._8_4_;
        auVar40._12_4_ = auVar104._12_4_ * auVar104._12_4_;
        auVar40._16_4_ = auVar104._16_4_ * auVar104._16_4_;
        auVar40._20_4_ = auVar104._20_4_ * auVar104._20_4_;
        auVar40._24_4_ = auVar104._24_4_ * auVar104._24_4_;
        auVar40._28_4_ = auVar109._28_4_;
        auVar108 = vfmadd213ps_avx512vl(auVar93,auVar104,auVar121);
        auVar108 = vfmadd213ps_avx512vl(auVar108,auVar104,auVar100);
        auVar108 = vfmadd213ps_avx512vl(auVar108,auVar104,auVar94);
        auVar108 = vfmadd213ps_avx512vl(auVar108,auVar104,auVar95);
        auVar108 = vfmadd213ps_avx512vl(auVar108,auVar104,auVar99);
        auVar89 = vfmadd213ps_fma(auVar108,auVar40,auVar104);
        auVar195._0_4_ = (int)auVar112._0_4_;
        auVar195._4_4_ = (int)auVar112._4_4_;
        auVar195._8_4_ = (int)auVar112._8_4_;
        auVar195._12_4_ = (int)auVar112._12_4_;
        auVar195._16_4_ = (int)auVar112._16_4_;
        auVar195._20_4_ = (int)auVar112._20_4_;
        auVar195._24_4_ = (int)auVar112._24_4_;
        auVar195._28_4_ = (int)auVar112._28_4_;
        auVar104 = vpslld_avx2(auVar195,0x17);
        auVar104 = vpaddd_avx512vl(auVar104,auVar122);
        uVar2 = *(undefined4 *)((long)_maxptr + lVar61 + lVar67 + 0xc);
        auVar16._4_4_ = uVar2;
        auVar16._0_4_ = uVar2;
        auVar16._8_4_ = uVar2;
        auVar16._12_4_ = uVar2;
        auVar16._16_4_ = uVar2;
        auVar16._20_4_ = uVar2;
        auVar16._24_4_ = uVar2;
        auVar16._28_4_ = uVar2;
        auVar108 = vsubps_avx512vl(*(undefined1 (*) [32])(pauVar68[3] + lVar61 * 8),auVar16);
        auVar109 = vfmadd213ps_avx512vl(auVar104,ZEXT1632(auVar89),auVar104);
        auVar104 = vminps_avx(auVar101,auVar108);
        auVar104 = vmaxps_avx(auVar91,auVar104);
        auVar110 = vfmadd213ps_avx512vl(auVar92,auVar104,auVar99);
        auVar108 = vroundps_avx(auVar110,1);
        uVar6 = vcmpps_avx512vl(auVar110,auVar108,1);
        auVar113 = vsubps_avx512vl(auVar108,auVar206);
        bVar5 = (bool)((byte)uVar6 & 1);
        auVar114._0_4_ = (float)((uint)bVar5 * auVar113._0_4_ | (uint)!bVar5 * auVar108._0_4_);
        bVar5 = (bool)((byte)(uVar6 >> 1) & 1);
        auVar114._4_4_ = (float)((uint)bVar5 * auVar113._4_4_ | (uint)!bVar5 * auVar108._4_4_);
        bVar5 = (bool)((byte)(uVar6 >> 2) & 1);
        auVar114._8_4_ = (float)((uint)bVar5 * auVar113._8_4_ | (uint)!bVar5 * auVar108._8_4_);
        bVar5 = (bool)((byte)(uVar6 >> 3) & 1);
        auVar114._12_4_ = (float)((uint)bVar5 * auVar113._12_4_ | (uint)!bVar5 * auVar108._12_4_);
        bVar5 = (bool)((byte)(uVar6 >> 4) & 1);
        auVar114._16_4_ = (float)((uint)bVar5 * auVar113._16_4_ | (uint)!bVar5 * auVar108._16_4_);
        bVar5 = (bool)((byte)(uVar6 >> 5) & 1);
        auVar114._20_4_ = (float)((uint)bVar5 * auVar113._20_4_ | (uint)!bVar5 * auVar108._20_4_);
        bVar5 = (bool)((byte)(uVar6 >> 6) & 1);
        auVar114._24_4_ = (float)((uint)bVar5 * auVar113._24_4_ | (uint)!bVar5 * auVar108._24_4_);
        bVar5 = SUB81(uVar6 >> 7,0);
        auVar114._28_4_ = (float)((uint)bVar5 * auVar113._28_4_ | (uint)!bVar5 * auVar108._28_4_);
        auVar89 = vfmsub231ps_fma(auVar104,auVar114,auVar120);
        auVar104 = vfnmsub231ps_avx512vl(ZEXT1632(auVar89),auVar114,auVar106);
        auVar41._4_4_ = auVar104._4_4_ * auVar104._4_4_;
        auVar41._0_4_ = auVar104._0_4_ * auVar104._0_4_;
        auVar41._8_4_ = auVar104._8_4_ * auVar104._8_4_;
        auVar41._12_4_ = auVar104._12_4_ * auVar104._12_4_;
        auVar41._16_4_ = auVar104._16_4_ * auVar104._16_4_;
        auVar41._20_4_ = auVar104._20_4_ * auVar104._20_4_;
        auVar41._24_4_ = auVar104._24_4_ * auVar104._24_4_;
        auVar41._28_4_ = auVar110._28_4_;
        auVar108 = vfmadd213ps_avx512vl(auVar93,auVar104,auVar121);
        auVar108 = vfmadd213ps_avx512vl(auVar108,auVar104,auVar100);
        auVar108 = vfmadd213ps_avx512vl(auVar108,auVar104,auVar94);
        auVar108 = vfmadd213ps_avx512vl(auVar108,auVar104,auVar95);
        auVar108 = vfmadd213ps_avx512vl(auVar108,auVar104,auVar99);
        auVar89 = vfmadd213ps_fma(auVar108,auVar41,auVar104);
        auVar173._0_4_ = (int)auVar114._0_4_;
        auVar173._4_4_ = (int)auVar114._4_4_;
        auVar173._8_4_ = (int)auVar114._8_4_;
        auVar173._12_4_ = (int)auVar114._12_4_;
        auVar173._16_4_ = (int)auVar114._16_4_;
        auVar173._20_4_ = (int)auVar114._20_4_;
        auVar173._24_4_ = (int)auVar114._24_4_;
        auVar173._28_4_ = (int)auVar114._28_4_;
        auVar104 = vpslld_avx2(auVar173,0x17);
        auVar104 = vpaddd_avx512vl(auVar104,auVar122);
        auVar89 = vfmadd213ps_fma(auVar104,ZEXT1632(auVar89),auVar104);
        uVar2 = *(undefined4 *)((long)_maxptr + lVar61 + lVar67 + 0x10);
        auVar17._4_4_ = uVar2;
        auVar17._0_4_ = uVar2;
        auVar17._8_4_ = uVar2;
        auVar17._12_4_ = uVar2;
        auVar17._16_4_ = uVar2;
        auVar17._20_4_ = uVar2;
        auVar17._24_4_ = uVar2;
        auVar17._28_4_ = uVar2;
        auVar104 = vsubps_avx512vl(*(undefined1 (*) [32])(pauVar68[4] + lVar61 * 8),auVar17);
        auVar104 = vminps_avx(auVar101,auVar104);
        auVar104 = vmaxps_avx(auVar91,auVar104);
        auVar110 = vfmadd213ps_avx512vl(auVar92,auVar104,auVar99);
        auVar108 = vroundps_avx(auVar110,1);
        uVar6 = vcmpps_avx512vl(auVar110,auVar108,1);
        auVar113 = vsubps_avx512vl(auVar108,auVar206);
        bVar5 = (bool)((byte)uVar6 & 1);
        auVar115._0_4_ = (float)((uint)bVar5 * auVar113._0_4_ | (uint)!bVar5 * auVar108._0_4_);
        bVar5 = (bool)((byte)(uVar6 >> 1) & 1);
        auVar115._4_4_ = (float)((uint)bVar5 * auVar113._4_4_ | (uint)!bVar5 * auVar108._4_4_);
        bVar5 = (bool)((byte)(uVar6 >> 2) & 1);
        auVar115._8_4_ = (float)((uint)bVar5 * auVar113._8_4_ | (uint)!bVar5 * auVar108._8_4_);
        bVar5 = (bool)((byte)(uVar6 >> 3) & 1);
        auVar115._12_4_ = (float)((uint)bVar5 * auVar113._12_4_ | (uint)!bVar5 * auVar108._12_4_);
        bVar5 = (bool)((byte)(uVar6 >> 4) & 1);
        auVar115._16_4_ = (float)((uint)bVar5 * auVar113._16_4_ | (uint)!bVar5 * auVar108._16_4_);
        bVar5 = (bool)((byte)(uVar6 >> 5) & 1);
        auVar115._20_4_ = (float)((uint)bVar5 * auVar113._20_4_ | (uint)!bVar5 * auVar108._20_4_);
        bVar5 = (bool)((byte)(uVar6 >> 6) & 1);
        auVar115._24_4_ = (float)((uint)bVar5 * auVar113._24_4_ | (uint)!bVar5 * auVar108._24_4_);
        bVar5 = SUB81(uVar6 >> 7,0);
        auVar115._28_4_ = (float)((uint)bVar5 * auVar113._28_4_ | (uint)!bVar5 * auVar108._28_4_);
        auVar90 = vfmsub231ps_fma(auVar104,auVar115,auVar120);
        auVar104 = vfnmsub231ps_avx512vl(ZEXT1632(auVar90),auVar115,auVar106);
        auVar42._4_4_ = auVar104._4_4_ * auVar104._4_4_;
        auVar42._0_4_ = auVar104._0_4_ * auVar104._0_4_;
        auVar42._8_4_ = auVar104._8_4_ * auVar104._8_4_;
        auVar42._12_4_ = auVar104._12_4_ * auVar104._12_4_;
        auVar42._16_4_ = auVar104._16_4_ * auVar104._16_4_;
        auVar42._20_4_ = auVar104._20_4_ * auVar104._20_4_;
        auVar42._24_4_ = auVar104._24_4_ * auVar104._24_4_;
        auVar42._28_4_ = auVar110._28_4_;
        auVar108 = vfmadd213ps_avx512vl(auVar93,auVar104,auVar121);
        auVar108 = vfmadd213ps_avx512vl(auVar108,auVar104,auVar100);
        auVar108 = vfmadd213ps_avx512vl(auVar108,auVar104,auVar94);
        auVar108 = vfmadd213ps_avx512vl(auVar108,auVar104,auVar95);
        auVar108 = vfmadd213ps_avx512vl(auVar108,auVar104,auVar99);
        auVar90 = vfmadd213ps_fma(auVar108,auVar42,auVar104);
        auVar187._0_4_ = (int)auVar115._0_4_;
        auVar187._4_4_ = (int)auVar115._4_4_;
        auVar187._8_4_ = (int)auVar115._8_4_;
        auVar187._12_4_ = (int)auVar115._12_4_;
        auVar187._16_4_ = (int)auVar115._16_4_;
        auVar187._20_4_ = (int)auVar115._20_4_;
        auVar187._24_4_ = (int)auVar115._24_4_;
        auVar187._28_4_ = (int)auVar115._28_4_;
        auVar104 = vpslld_avx2(auVar187,0x17);
        auVar104 = vpaddd_avx512vl(auVar104,auVar122);
        auVar90 = vfmadd213ps_fma(auVar104,ZEXT1632(auVar90),auVar104);
        uVar2 = *(undefined4 *)((long)_maxptr + lVar61 + lVar67 + 0x14);
        auVar18._4_4_ = uVar2;
        auVar18._0_4_ = uVar2;
        auVar18._8_4_ = uVar2;
        auVar18._12_4_ = uVar2;
        auVar18._16_4_ = uVar2;
        auVar18._20_4_ = uVar2;
        auVar18._24_4_ = uVar2;
        auVar18._28_4_ = uVar2;
        auVar104 = vsubps_avx512vl(*(undefined1 (*) [32])(pauVar68[5] + lVar61 * 8),auVar18);
        auVar104 = vminps_avx(auVar101,auVar104);
        auVar104 = vmaxps_avx(auVar91,auVar104);
        auVar110 = vfmadd213ps_avx512vl(auVar92,auVar104,auVar99);
        auVar108 = vroundps_avx(auVar110,1);
        uVar6 = vcmpps_avx512vl(auVar110,auVar108,1);
        auVar113 = vsubps_avx512vl(auVar108,auVar206);
        bVar5 = (bool)((byte)uVar6 & 1);
        auVar116._0_4_ = (float)((uint)bVar5 * auVar113._0_4_ | (uint)!bVar5 * auVar108._0_4_);
        bVar5 = (bool)((byte)(uVar6 >> 1) & 1);
        auVar116._4_4_ = (float)((uint)bVar5 * auVar113._4_4_ | (uint)!bVar5 * auVar108._4_4_);
        bVar5 = (bool)((byte)(uVar6 >> 2) & 1);
        auVar116._8_4_ = (float)((uint)bVar5 * auVar113._8_4_ | (uint)!bVar5 * auVar108._8_4_);
        bVar5 = (bool)((byte)(uVar6 >> 3) & 1);
        auVar116._12_4_ = (float)((uint)bVar5 * auVar113._12_4_ | (uint)!bVar5 * auVar108._12_4_);
        bVar5 = (bool)((byte)(uVar6 >> 4) & 1);
        auVar116._16_4_ = (float)((uint)bVar5 * auVar113._16_4_ | (uint)!bVar5 * auVar108._16_4_);
        bVar5 = (bool)((byte)(uVar6 >> 5) & 1);
        auVar116._20_4_ = (float)((uint)bVar5 * auVar113._20_4_ | (uint)!bVar5 * auVar108._20_4_);
        bVar5 = (bool)((byte)(uVar6 >> 6) & 1);
        auVar116._24_4_ = (float)((uint)bVar5 * auVar113._24_4_ | (uint)!bVar5 * auVar108._24_4_);
        bVar5 = SUB81(uVar6 >> 7,0);
        auVar116._28_4_ = (float)((uint)bVar5 * auVar113._28_4_ | (uint)!bVar5 * auVar108._28_4_);
        auVar210 = vfmsub231ps_fma(auVar104,auVar116,auVar120);
        auVar104 = vfnmsub231ps_avx512vl(ZEXT1632(auVar210),auVar116,auVar106);
        auVar43._4_4_ = auVar104._4_4_ * auVar104._4_4_;
        auVar43._0_4_ = auVar104._0_4_ * auVar104._0_4_;
        auVar43._8_4_ = auVar104._8_4_ * auVar104._8_4_;
        auVar43._12_4_ = auVar104._12_4_ * auVar104._12_4_;
        auVar43._16_4_ = auVar104._16_4_ * auVar104._16_4_;
        auVar43._20_4_ = auVar104._20_4_ * auVar104._20_4_;
        auVar43._24_4_ = auVar104._24_4_ * auVar104._24_4_;
        auVar43._28_4_ = auVar110._28_4_;
        auVar108 = vfmadd213ps_avx512vl(auVar93,auVar104,auVar121);
        auVar108 = vfmadd213ps_avx512vl(auVar108,auVar104,auVar100);
        auVar108 = vfmadd213ps_avx512vl(auVar108,auVar104,auVar94);
        auVar108 = vfmadd213ps_avx512vl(auVar108,auVar104,auVar95);
        auVar108 = vfmadd213ps_avx512vl(auVar108,auVar104,auVar99);
        auVar210 = vfmadd213ps_fma(auVar108,auVar43,auVar104);
        auVar196._0_4_ = (int)auVar116._0_4_;
        auVar196._4_4_ = (int)auVar116._4_4_;
        auVar196._8_4_ = (int)auVar116._8_4_;
        auVar196._12_4_ = (int)auVar116._12_4_;
        auVar196._16_4_ = (int)auVar116._16_4_;
        auVar196._20_4_ = (int)auVar116._20_4_;
        auVar196._24_4_ = (int)auVar116._24_4_;
        auVar196._28_4_ = (int)auVar116._28_4_;
        auVar104 = vpslld_avx2(auVar196,0x17);
        auVar104 = vpaddd_avx512vl(auVar104,auVar122);
        auVar110 = vfmadd213ps_avx512vl(auVar104,ZEXT1632(auVar210),auVar104);
        uVar2 = *(undefined4 *)((long)_maxptr + lVar61 + lVar67 + 0x18);
        auVar19._4_4_ = uVar2;
        auVar19._0_4_ = uVar2;
        auVar19._8_4_ = uVar2;
        auVar19._12_4_ = uVar2;
        auVar19._16_4_ = uVar2;
        auVar19._20_4_ = uVar2;
        auVar19._24_4_ = uVar2;
        auVar19._28_4_ = uVar2;
        auVar104 = vsubps_avx512vl(*(undefined1 (*) [32])(pauVar68[6] + lVar61 * 8),auVar19);
        auVar104 = vminps_avx(auVar101,auVar104);
        auVar104 = vmaxps_avx(auVar91,auVar104);
        auVar113 = vfmadd213ps_avx512vl(auVar92,auVar104,auVar99);
        auVar108 = vroundps_avx(auVar113,1);
        uVar6 = vcmpps_avx512vl(auVar113,auVar108,1);
        auVar117 = vsubps_avx512vl(auVar108,auVar206);
        bVar5 = (bool)((byte)uVar6 & 1);
        auVar118._0_4_ = (float)((uint)bVar5 * auVar117._0_4_ | (uint)!bVar5 * auVar108._0_4_);
        bVar5 = (bool)((byte)(uVar6 >> 1) & 1);
        auVar118._4_4_ = (float)((uint)bVar5 * auVar117._4_4_ | (uint)!bVar5 * auVar108._4_4_);
        bVar5 = (bool)((byte)(uVar6 >> 2) & 1);
        auVar118._8_4_ = (float)((uint)bVar5 * auVar117._8_4_ | (uint)!bVar5 * auVar108._8_4_);
        bVar5 = (bool)((byte)(uVar6 >> 3) & 1);
        auVar118._12_4_ = (float)((uint)bVar5 * auVar117._12_4_ | (uint)!bVar5 * auVar108._12_4_);
        bVar5 = (bool)((byte)(uVar6 >> 4) & 1);
        auVar118._16_4_ = (float)((uint)bVar5 * auVar117._16_4_ | (uint)!bVar5 * auVar108._16_4_);
        bVar5 = (bool)((byte)(uVar6 >> 5) & 1);
        auVar118._20_4_ = (float)((uint)bVar5 * auVar117._20_4_ | (uint)!bVar5 * auVar108._20_4_);
        bVar5 = (bool)((byte)(uVar6 >> 6) & 1);
        auVar118._24_4_ = (float)((uint)bVar5 * auVar117._24_4_ | (uint)!bVar5 * auVar108._24_4_);
        bVar5 = SUB81(uVar6 >> 7,0);
        auVar118._28_4_ = (float)((uint)bVar5 * auVar117._28_4_ | (uint)!bVar5 * auVar108._28_4_);
        auVar210 = vfmsub231ps_fma(auVar104,auVar118,auVar120);
        auVar104 = vfnmsub231ps_avx512vl(ZEXT1632(auVar210),auVar118,auVar106);
        auVar44._4_4_ = auVar104._4_4_ * auVar104._4_4_;
        auVar44._0_4_ = auVar104._0_4_ * auVar104._0_4_;
        auVar44._8_4_ = auVar104._8_4_ * auVar104._8_4_;
        auVar44._12_4_ = auVar104._12_4_ * auVar104._12_4_;
        auVar44._16_4_ = auVar104._16_4_ * auVar104._16_4_;
        auVar44._20_4_ = auVar104._20_4_ * auVar104._20_4_;
        auVar44._24_4_ = auVar104._24_4_ * auVar104._24_4_;
        auVar44._28_4_ = auVar113._28_4_;
        auVar108 = vfmadd213ps_avx512vl(auVar93,auVar104,auVar121);
        auVar108 = vfmadd213ps_avx512vl(auVar108,auVar104,auVar100);
        auVar108 = vfmadd213ps_avx512vl(auVar108,auVar104,auVar94);
        auVar108 = vfmadd213ps_avx512vl(auVar108,auVar104,auVar95);
        auVar108 = vfmadd213ps_avx512vl(auVar108,auVar104,auVar99);
        auVar210 = vfmadd213ps_fma(auVar108,auVar44,auVar104);
        auVar197._0_4_ = (int)auVar118._0_4_;
        auVar197._4_4_ = (int)auVar118._4_4_;
        auVar197._8_4_ = (int)auVar118._8_4_;
        auVar197._12_4_ = (int)auVar118._12_4_;
        auVar197._16_4_ = (int)auVar118._16_4_;
        auVar197._20_4_ = (int)auVar118._20_4_;
        auVar197._24_4_ = (int)auVar118._24_4_;
        auVar197._28_4_ = (int)auVar118._28_4_;
        auVar104 = vpslld_avx2(auVar197,0x17);
        auVar104 = vpaddd_avx512vl(auVar104,auVar122);
        uVar2 = *(undefined4 *)((long)_maxptr + lVar61 + lVar67 + 0x1c);
        auVar20._4_4_ = uVar2;
        auVar20._0_4_ = uVar2;
        auVar20._8_4_ = uVar2;
        auVar20._12_4_ = uVar2;
        auVar20._16_4_ = uVar2;
        auVar20._20_4_ = uVar2;
        auVar20._24_4_ = uVar2;
        auVar20._28_4_ = uVar2;
        auVar108 = vsubps_avx512vl(*(undefined1 (*) [32])(pauVar68[7] + lVar61 * 8),auVar20);
        auVar210 = vfmadd213ps_fma(auVar104,ZEXT1632(auVar210),auVar104);
        auVar104 = vminps_avx(auVar108,auVar101);
        auVar104 = vmaxps_avx(auVar104,auVar91);
        auVar113 = vfmadd213ps_avx512vl(auVar92,auVar104,auVar99);
        auVar108 = vroundps_avx(auVar113,1);
        uVar6 = vcmpps_avx512vl(auVar113,auVar108,1);
        auVar117 = vsubps_avx512vl(auVar108,auVar206);
        bVar5 = (bool)((byte)uVar6 & 1);
        auVar119._0_4_ = (float)((uint)bVar5 * auVar117._0_4_ | (uint)!bVar5 * auVar108._0_4_);
        bVar5 = (bool)((byte)(uVar6 >> 1) & 1);
        auVar119._4_4_ = (float)((uint)bVar5 * auVar117._4_4_ | (uint)!bVar5 * auVar108._4_4_);
        bVar5 = (bool)((byte)(uVar6 >> 2) & 1);
        auVar119._8_4_ = (float)((uint)bVar5 * auVar117._8_4_ | (uint)!bVar5 * auVar108._8_4_);
        bVar5 = (bool)((byte)(uVar6 >> 3) & 1);
        auVar119._12_4_ = (float)((uint)bVar5 * auVar117._12_4_ | (uint)!bVar5 * auVar108._12_4_);
        bVar5 = (bool)((byte)(uVar6 >> 4) & 1);
        auVar119._16_4_ = (float)((uint)bVar5 * auVar117._16_4_ | (uint)!bVar5 * auVar108._16_4_);
        bVar5 = (bool)((byte)(uVar6 >> 5) & 1);
        auVar119._20_4_ = (float)((uint)bVar5 * auVar117._20_4_ | (uint)!bVar5 * auVar108._20_4_);
        bVar5 = (bool)((byte)(uVar6 >> 6) & 1);
        auVar119._24_4_ = (float)((uint)bVar5 * auVar117._24_4_ | (uint)!bVar5 * auVar108._24_4_);
        bVar5 = SUB81(uVar6 >> 7,0);
        auVar119._28_4_ = (float)((uint)bVar5 * auVar117._28_4_ | (uint)!bVar5 * auVar108._28_4_);
        auVar214 = vfmsub231ps_fma(auVar104,auVar119,auVar120);
        auVar120 = vfnmsub231ps_avx512vl(ZEXT1632(auVar214),auVar119,auVar106);
        auVar45._4_4_ = auVar120._4_4_ * auVar120._4_4_;
        auVar45._0_4_ = auVar120._0_4_ * auVar120._0_4_;
        auVar45._8_4_ = auVar120._8_4_ * auVar120._8_4_;
        auVar45._12_4_ = auVar120._12_4_ * auVar120._12_4_;
        auVar45._16_4_ = auVar120._16_4_ * auVar120._16_4_;
        auVar45._20_4_ = auVar120._20_4_ * auVar120._20_4_;
        auVar45._24_4_ = auVar120._24_4_ * auVar120._24_4_;
        auVar45._28_4_ = auVar113._28_4_;
        auVar121 = vfmadd213ps_avx512vl(auVar93,auVar120,auVar121);
        auVar121 = vfmadd213ps_avx512vl(auVar121,auVar120,auVar100);
        auVar121 = vfmadd213ps_avx512vl(auVar121,auVar120,auVar94);
        auVar121 = vfmadd213ps_avx512vl(auVar121,auVar120,auVar95);
        auVar121 = vfmadd213ps_avx512vl(auVar121,auVar120,auVar99);
        auVar120 = vfmadd213ps_avx512vl(auVar121,auVar45,auVar120);
        auVar215._0_4_ = (int)auVar119._0_4_;
        auVar215._4_4_ = (int)auVar119._4_4_;
        auVar215._8_4_ = (int)auVar119._8_4_;
        auVar215._12_4_ = (int)auVar119._12_4_;
        auVar215._16_4_ = (int)auVar119._16_4_;
        auVar215._20_4_ = (int)auVar119._20_4_;
        auVar215._24_4_ = (int)auVar119._24_4_;
        auVar215._28_4_ = (int)auVar119._28_4_;
        auVar121 = vpslld_avx2(auVar215,0x17);
        auVar121 = vpaddd_avx512vl(auVar121,auVar122);
        auVar120 = vfmadd213ps_avx512vl(auVar121,auVar120,auVar121);
        *(undefined1 (*) [32])(*pauVar68 + lVar61 * 8) = auVar105;
        *(undefined1 (*) [32])(pauVar68[1] + lVar61 * 8) = ZEXT1632(auVar75);
        *(undefined1 (*) [32])(pauVar68[2] + lVar61 * 8) = auVar109;
        *(undefined1 (*) [32])(pauVar68[3] + lVar61 * 8) = ZEXT1632(auVar89);
        *(undefined1 (*) [32])(pauVar68[4] + lVar61 * 8) = ZEXT1632(auVar90);
        *(undefined1 (*) [32])(pauVar68[5] + lVar61 * 8) = auVar110;
        *(undefined1 (*) [32])(pauVar68[6] + lVar61 * 8) = ZEXT1632(auVar210);
        *(undefined1 (*) [32])(pauVar68[7] + lVar61 * 8) = auVar120;
        auVar121 = vunpcklps_avx512vl(auVar105,ZEXT1632(auVar90));
        auVar122 = vunpckhps_avx512vl(auVar105,ZEXT1632(auVar90));
        auVar188._0_4_ = auVar121._0_4_ + auVar122._0_4_;
        auVar188._4_4_ = auVar121._4_4_ + auVar122._4_4_;
        auVar188._8_4_ = auVar121._8_4_ + auVar122._8_4_;
        auVar188._12_4_ = auVar121._12_4_ + auVar122._12_4_;
        auVar188._16_4_ = auVar121._16_4_ + auVar122._16_4_;
        auVar188._20_4_ = auVar121._20_4_ + auVar122._20_4_;
        auVar188._24_4_ = auVar121._24_4_ + auVar122._24_4_;
        auVar188._28_4_ = auVar121._28_4_ + auVar122._28_4_;
        auVar121 = vunpcklps_avx512vl(auVar109,ZEXT1632(auVar210));
        auVar122 = vunpckhps_avx512vl(auVar109,ZEXT1632(auVar210));
        auVar198._0_4_ = auVar121._0_4_ + auVar122._0_4_;
        auVar198._4_4_ = auVar121._4_4_ + auVar122._4_4_;
        auVar198._8_4_ = auVar121._8_4_ + auVar122._8_4_;
        auVar198._12_4_ = auVar121._12_4_ + auVar122._12_4_;
        auVar198._16_4_ = auVar121._16_4_ + auVar122._16_4_;
        auVar198._20_4_ = auVar121._20_4_ + auVar122._20_4_;
        auVar198._24_4_ = auVar121._24_4_ + auVar122._24_4_;
        auVar198._28_4_ = auVar121._28_4_ + auVar122._28_4_;
        auVar121 = vunpcklps_avx512vl(ZEXT1632(auVar75),auVar110);
        auVar122 = vunpckhps_avx512vl(ZEXT1632(auVar75),auVar110);
        auVar220._0_4_ = auVar121._0_4_ + auVar122._0_4_;
        auVar220._4_4_ = auVar121._4_4_ + auVar122._4_4_;
        auVar220._8_4_ = auVar121._8_4_ + auVar122._8_4_;
        auVar220._12_4_ = auVar121._12_4_ + auVar122._12_4_;
        auVar220._16_4_ = auVar121._16_4_ + auVar122._16_4_;
        auVar220._20_4_ = auVar121._20_4_ + auVar122._20_4_;
        auVar220._24_4_ = auVar121._24_4_ + auVar122._24_4_;
        auVar220._28_4_ = auVar121._28_4_ + auVar122._28_4_;
        auVar121 = vunpcklps_avx(ZEXT1632(auVar89),auVar120);
        auVar120 = vunpckhps_avx(ZEXT1632(auVar89),auVar120);
        auVar174._0_4_ = auVar121._0_4_ + auVar120._0_4_;
        auVar174._4_4_ = auVar121._4_4_ + auVar120._4_4_;
        auVar174._8_4_ = auVar121._8_4_ + auVar120._8_4_;
        auVar174._12_4_ = auVar121._12_4_ + auVar120._12_4_;
        auVar174._16_4_ = auVar121._16_4_ + auVar120._16_4_;
        auVar174._20_4_ = auVar121._20_4_ + auVar120._20_4_;
        auVar174._24_4_ = auVar121._24_4_ + auVar120._24_4_;
        auVar174._28_4_ = auVar121._28_4_ + auVar120._28_4_;
        auVar121 = vunpcklps_avx(auVar188,auVar198);
        auVar120 = vunpckhps_avx(auVar188,auVar198);
        auVar189._0_4_ = auVar121._0_4_ + auVar120._0_4_;
        auVar189._4_4_ = auVar121._4_4_ + auVar120._4_4_;
        auVar189._8_4_ = auVar121._8_4_ + auVar120._8_4_;
        auVar189._12_4_ = auVar121._12_4_ + auVar120._12_4_;
        auVar189._16_4_ = auVar121._16_4_ + auVar120._16_4_;
        auVar189._20_4_ = auVar121._20_4_ + auVar120._20_4_;
        auVar189._24_4_ = auVar121._24_4_ + auVar120._24_4_;
        auVar189._28_4_ = auVar121._28_4_ + auVar120._28_4_;
        auVar121 = vunpcklps_avx(auVar220,auVar174);
        auVar120 = vunpckhps_avx(auVar220,auVar174);
        auVar175._0_4_ = auVar121._0_4_ + auVar120._0_4_;
        auVar175._4_4_ = auVar121._4_4_ + auVar120._4_4_;
        auVar175._8_4_ = auVar121._8_4_ + auVar120._8_4_;
        auVar175._12_4_ = auVar121._12_4_ + auVar120._12_4_;
        auVar175._16_4_ = auVar121._16_4_ + auVar120._16_4_;
        auVar175._20_4_ = auVar121._20_4_ + auVar120._20_4_;
        auVar175._24_4_ = auVar121._24_4_ + auVar120._24_4_;
        auVar175._28_4_ = auVar121._28_4_ + auVar120._28_4_;
        auVar121 = vunpcklps_avx(auVar189,auVar175);
        auVar120 = vunpckhps_avx(auVar189,auVar175);
        auVar122 = vperm2f128_avx(auVar121,auVar120,0x31);
        pfVar1 = (float *)((long)_sumptr + lVar61 + lVar67);
        auVar176._0_4_ = auVar122._0_4_ + *pfVar1 + auVar121._0_4_;
        auVar176._4_4_ = auVar122._4_4_ + pfVar1[1] + auVar121._4_4_;
        auVar176._8_4_ = auVar122._8_4_ + pfVar1[2] + auVar121._8_4_;
        auVar176._12_4_ = auVar122._12_4_ + pfVar1[3] + auVar121._12_4_;
        auVar176._16_4_ = auVar122._16_4_ + pfVar1[4] + auVar120._0_4_;
        auVar176._20_4_ = auVar122._20_4_ + pfVar1[5] + auVar120._4_4_;
        auVar176._24_4_ = auVar122._24_4_ + pfVar1[6] + auVar120._8_4_;
        auVar176._28_4_ = auVar122._28_4_ + pfVar1[7] + auVar120._12_4_;
        *(undefined1 (*) [32])((long)_sumptr + lVar61 + lVar67) = auVar176;
        pauVar69 = pauVar69 + 8;
        iVar59 = iVar59 + 8;
        lVar61 = lVar61 + 0x20;
        lVar64 = lVar64 + 8;
      }
      for (; (int)lVar64 < size1; lVar64 = lVar64 + 1) {
        fVar224 = _maxptr[lVar64];
        auVar21._4_4_ = fVar224;
        auVar21._0_4_ = fVar224;
        auVar21._8_4_ = fVar224;
        auVar21._12_4_ = fVar224;
        auVar21._16_4_ = fVar224;
        auVar21._20_4_ = fVar224;
        auVar21._24_4_ = fVar224;
        auVar21._28_4_ = fVar224;
        auVar104 = vsubps_avx512vl(*pauVar69,auVar21);
        auVar104 = vminps_avx(auVar101,auVar104);
        auVar104 = vmaxps_avx(auVar91,auVar104);
        auVar75 = vfmadd231ps_fma(auVar99,auVar104,auVar92);
        auVar108 = vroundps_avx(ZEXT1632(auVar75),1);
        uVar6 = vcmpps_avx512vl(ZEXT1632(auVar75),auVar108,1);
        auVar105 = vaddps_avx512vl(auVar108,auVar102);
        bVar5 = (bool)((byte)uVar6 & 1);
        auVar123._0_4_ = (float)((uint)bVar5 * auVar105._0_4_ | (uint)!bVar5 * auVar108._0_4_);
        bVar5 = (bool)((byte)(uVar6 >> 1) & 1);
        auVar123._4_4_ = (float)((uint)bVar5 * auVar105._4_4_ | (uint)!bVar5 * auVar108._4_4_);
        bVar5 = (bool)((byte)(uVar6 >> 2) & 1);
        auVar123._8_4_ = (float)((uint)bVar5 * auVar105._8_4_ | (uint)!bVar5 * auVar108._8_4_);
        bVar5 = (bool)((byte)(uVar6 >> 3) & 1);
        auVar123._12_4_ = (float)((uint)bVar5 * auVar105._12_4_ | (uint)!bVar5 * auVar108._12_4_);
        bVar5 = (bool)((byte)(uVar6 >> 4) & 1);
        auVar123._16_4_ = (float)((uint)bVar5 * auVar105._16_4_ | (uint)!bVar5 * auVar108._16_4_);
        bVar5 = (bool)((byte)(uVar6 >> 5) & 1);
        auVar123._20_4_ = (float)((uint)bVar5 * auVar105._20_4_ | (uint)!bVar5 * auVar108._20_4_);
        bVar5 = (bool)((byte)(uVar6 >> 6) & 1);
        auVar123._24_4_ = (float)((uint)bVar5 * auVar105._24_4_ | (uint)!bVar5 * auVar108._24_4_);
        bVar5 = SUB81(uVar6 >> 7,0);
        auVar123._28_4_ = (float)((uint)bVar5 * auVar105._28_4_ | (uint)!bVar5 * auVar108._28_4_);
        auVar75 = vfmsub231ps_fma(auVar104,auVar123,auVar120);
        auVar104 = vfmsub231ps_avx512vl(ZEXT1632(auVar75),auVar123,auVar103);
        auVar190._0_4_ = auVar104._0_4_ * auVar104._0_4_;
        auVar190._4_4_ = auVar104._4_4_ * auVar104._4_4_;
        auVar190._8_4_ = auVar104._8_4_ * auVar104._8_4_;
        auVar190._12_4_ = auVar104._12_4_ * auVar104._12_4_;
        auVar190._16_4_ = auVar104._16_4_ * auVar104._16_4_;
        auVar190._20_4_ = auVar104._20_4_ * auVar104._20_4_;
        auVar190._24_4_ = auVar104._24_4_ * auVar104._24_4_;
        auVar190._28_4_ = 0;
        auVar108 = vfmadd213ps_avx512vl(auVar93,auVar104,auVar121);
        auVar108 = vfmadd213ps_avx512vl(auVar108,auVar104,auVar100);
        auVar108 = vfmadd213ps_avx512vl(auVar108,auVar104,auVar94);
        auVar108 = vfmadd213ps_avx512vl(auVar108,auVar104,auVar95);
        auVar108 = vfmadd213ps_avx512vl(auVar108,auVar104,auVar99);
        auVar75 = vfmadd213ps_fma(auVar108,auVar190,auVar104);
        auVar177._0_4_ = (int)auVar123._0_4_;
        auVar177._4_4_ = (int)auVar123._4_4_;
        auVar177._8_4_ = (int)auVar123._8_4_;
        auVar177._12_4_ = (int)auVar123._12_4_;
        auVar177._16_4_ = (int)auVar123._16_4_;
        auVar177._20_4_ = (int)auVar123._20_4_;
        auVar177._24_4_ = (int)auVar123._24_4_;
        auVar177._28_4_ = (int)auVar123._28_4_;
        auVar104 = vpslld_avx2(auVar177,0x17);
        auVar104 = vpaddd_avx512vl(auVar104,auVar122);
        auVar75 = vfmadd213ps_fma(auVar104,ZEXT1632(auVar75),auVar104);
        *pauVar69 = ZEXT1632(auVar75);
        auVar165._0_4_ = auVar75._0_4_ + 0.0;
        auVar165._4_4_ = auVar75._4_4_ + 0.0;
        auVar165._8_4_ = auVar75._8_4_ + 0.0;
        auVar165._12_4_ = auVar75._12_4_ + 0.0;
        auVar75 = vshufpd_avx(auVar165,auVar165,1);
        auVar166._0_4_ = auVar75._0_4_ + auVar165._0_4_;
        auVar166._4_4_ = auVar75._4_4_ + auVar165._4_4_;
        auVar166._8_4_ = auVar75._8_4_ + auVar165._8_4_;
        auVar166._12_4_ = auVar75._12_4_ + auVar165._12_4_;
        auVar75 = vmovshdup_avx(auVar166);
        _sumptr[lVar64] = auVar75._0_4_ + _sumptr[lVar64] + auVar166._0_4_;
        pauVar69 = pauVar69 + 1;
      }
      pfVar65 = pfVar65 + lVar70;
    }
    iVar59 = 0;
    auVar124 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
    pauVar63 = (undefined1 (*) [64])_sumptr;
    for (; iVar59 + 0xf < size1; iVar59 = iVar59 + 0x10) {
      auVar125 = vdivps_avx512f(auVar124,*pauVar63);
      *pauVar63 = auVar125;
      pauVar63 = pauVar63 + 1;
    }
    for (; iVar59 + 7 < size1; iVar59 = iVar59 + 8) {
      auVar178._8_4_ = 0x3f800000;
      auVar178._0_8_ = 0x3f8000003f800000;
      auVar178._12_4_ = 0x3f800000;
      auVar178._16_4_ = 0x3f800000;
      auVar178._20_4_ = 0x3f800000;
      auVar178._24_4_ = 0x3f800000;
      auVar178._28_4_ = 0x3f800000;
      auVar99 = vdivps_avx(auVar178,*(undefined1 (*) [32])*pauVar63);
      *(undefined1 (*) [32])*pauVar63 = auVar99;
      pauVar63 = (undefined1 (*) [64])(*pauVar63 + 0x20);
    }
    auVar167._8_4_ = 0x3f800000;
    auVar167._0_8_ = 0x3f8000003f800000;
    auVar167._12_4_ = 0x3f800000;
    for (; iVar59 + 3 < size1; iVar59 = iVar59 + 4) {
      auVar75 = vdivps_avx(auVar167,*(undefined1 (*) [16])*pauVar63);
      *(undefined1 (*) [16])*pauVar63 = auVar75;
      pauVar63 = (undefined1 (*) [64])(*pauVar63 + 0x10);
    }
    for (; iVar59 < size1; iVar59 = iVar59 + 1) {
      *(float *)*pauVar63 = 1.0 / *(float *)*pauVar63;
      pauVar63 = (undefined1 (*) [64])(*pauVar63 + 4);
    }
    for (uVar60 = 0; uVar60 != uVar72; uVar60 = uVar60 + 1) {
      pauVar63 = (undefined1 (*) [64])(_ptr + uVar60 * lVar70);
      pfVar65 = _sumptr;
      for (iVar59 = 0; iVar59 + 0xf < size1; iVar59 = iVar59 + 0x10) {
        fVar224 = *pfVar65;
        fVar3 = pfVar65[1];
        auVar182._4_4_ = fVar3;
        auVar182._0_4_ = fVar3;
        auVar182._8_4_ = fVar3;
        auVar182._12_4_ = fVar3;
        auVar182._16_4_ = fVar3;
        auVar182._20_4_ = fVar3;
        auVar182._24_4_ = fVar3;
        auVar182._28_4_ = fVar3;
        fVar3 = pfVar65[2];
        fVar4 = pfVar65[3];
        auVar199._4_4_ = fVar4;
        auVar199._0_4_ = fVar4;
        auVar199._8_4_ = fVar4;
        auVar199._12_4_ = fVar4;
        auVar199._16_4_ = fVar4;
        auVar199._20_4_ = fVar4;
        auVar199._24_4_ = fVar4;
        auVar199._28_4_ = fVar4;
        auVar124 = vinsertf64x4_avx512f
                             (ZEXT3264(CONCAT428(fVar224,CONCAT424(fVar224,CONCAT420(fVar224,
                                                  CONCAT416(fVar224,CONCAT412(fVar224,CONCAT48(
                                                  fVar224,CONCAT44(fVar224,fVar224)))))))),auVar182,
                              1);
        auVar125 = vinsertf64x4_avx512f
                             (ZEXT3264(CONCAT428(fVar3,CONCAT424(fVar3,CONCAT420(fVar3,CONCAT416(
                                                  fVar3,CONCAT412(fVar3,CONCAT48(fVar3,CONCAT44(
                                                  fVar3,fVar3)))))))),auVar199,1);
        fVar224 = pfVar65[4];
        fVar3 = pfVar65[5];
        auVar200._4_4_ = fVar3;
        auVar200._0_4_ = fVar3;
        auVar200._8_4_ = fVar3;
        auVar200._12_4_ = fVar3;
        auVar200._16_4_ = fVar3;
        auVar200._20_4_ = fVar3;
        auVar200._24_4_ = fVar3;
        auVar200._28_4_ = fVar3;
        fVar3 = pfVar65[6];
        auVar126 = vinsertf64x4_avx512f
                             (ZEXT3264(CONCAT428(fVar224,CONCAT424(fVar224,CONCAT420(fVar224,
                                                  CONCAT416(fVar224,CONCAT412(fVar224,CONCAT48(
                                                  fVar224,CONCAT44(fVar224,fVar224)))))))),auVar200,
                              1);
        fVar224 = pfVar65[7];
        auVar201._4_4_ = fVar224;
        auVar201._0_4_ = fVar224;
        auVar201._8_4_ = fVar224;
        auVar201._12_4_ = fVar224;
        auVar201._16_4_ = fVar224;
        auVar201._20_4_ = fVar224;
        auVar201._24_4_ = fVar224;
        auVar201._28_4_ = fVar224;
        auVar127 = vinsertf64x4_avx512f
                             (ZEXT3264(CONCAT428(fVar3,CONCAT424(fVar3,CONCAT420(fVar3,CONCAT416(
                                                  fVar3,CONCAT412(fVar3,CONCAT48(fVar3,CONCAT44(
                                                  fVar3,fVar3)))))))),auVar201,1);
        fVar224 = pfVar65[8];
        fVar3 = pfVar65[9];
        auVar208._4_4_ = fVar3;
        auVar208._0_4_ = fVar3;
        auVar208._8_4_ = fVar3;
        auVar208._12_4_ = fVar3;
        auVar208._16_4_ = fVar3;
        auVar208._20_4_ = fVar3;
        auVar208._24_4_ = fVar3;
        auVar208._28_4_ = fVar3;
        fVar3 = pfVar65[10];
        fVar4 = pfVar65[0xb];
        auVar211._4_4_ = fVar4;
        auVar211._0_4_ = fVar4;
        auVar211._8_4_ = fVar4;
        auVar211._12_4_ = fVar4;
        auVar211._16_4_ = fVar4;
        auVar211._20_4_ = fVar4;
        auVar211._24_4_ = fVar4;
        auVar211._28_4_ = fVar4;
        auVar128 = vinsertf64x4_avx512f
                             (ZEXT3264(CONCAT428(fVar224,CONCAT424(fVar224,CONCAT420(fVar224,
                                                  CONCAT416(fVar224,CONCAT412(fVar224,CONCAT48(
                                                  fVar224,CONCAT44(fVar224,fVar224)))))))),auVar208,
                              1);
        auVar129 = vinsertf64x4_avx512f
                             (ZEXT3264(CONCAT428(fVar3,CONCAT424(fVar3,CONCAT420(fVar3,CONCAT416(
                                                  fVar3,CONCAT412(fVar3,CONCAT48(fVar3,CONCAT44(
                                                  fVar3,fVar3)))))))),auVar211,1);
        fVar224 = pfVar65[0xc];
        fVar3 = pfVar65[0xd];
        auVar212._4_4_ = fVar3;
        auVar212._0_4_ = fVar3;
        auVar212._8_4_ = fVar3;
        auVar212._12_4_ = fVar3;
        auVar212._16_4_ = fVar3;
        auVar212._20_4_ = fVar3;
        auVar212._24_4_ = fVar3;
        auVar212._28_4_ = fVar3;
        fVar3 = pfVar65[0xe];
        auVar130 = vinsertf64x4_avx512f
                             (ZEXT3264(CONCAT428(fVar224,CONCAT424(fVar224,CONCAT420(fVar224,
                                                  CONCAT416(fVar224,CONCAT412(fVar224,CONCAT48(
                                                  fVar224,CONCAT44(fVar224,fVar224)))))))),auVar212,
                              1);
        fVar224 = pfVar65[0xf];
        auVar213._4_4_ = fVar224;
        auVar213._0_4_ = fVar224;
        auVar213._8_4_ = fVar224;
        auVar213._12_4_ = fVar224;
        auVar213._16_4_ = fVar224;
        auVar213._20_4_ = fVar224;
        auVar213._24_4_ = fVar224;
        auVar213._28_4_ = fVar224;
        auVar131 = vinsertf64x4_avx512f
                             (ZEXT3264(CONCAT428(fVar3,CONCAT424(fVar3,CONCAT420(fVar3,CONCAT416(
                                                  fVar3,CONCAT412(fVar3,CONCAT48(fVar3,CONCAT44(
                                                  fVar3,fVar3)))))))),auVar213,1);
        auVar124 = vmulps_avx512f(auVar124,*pauVar63);
        auVar125 = vmulps_avx512f(auVar125,pauVar63[1]);
        auVar126 = vmulps_avx512f(auVar126,pauVar63[2]);
        auVar127 = vmulps_avx512f(auVar127,pauVar63[3]);
        auVar128 = vmulps_avx512f(auVar128,pauVar63[4]);
        auVar129 = vmulps_avx512f(auVar129,pauVar63[5]);
        auVar130 = vmulps_avx512f(auVar130,pauVar63[6]);
        auVar131 = vmulps_avx512f(auVar131,pauVar63[7]);
        *pauVar63 = auVar124;
        pauVar63[1] = auVar125;
        pauVar63[2] = auVar126;
        pauVar63[3] = auVar127;
        pauVar63[4] = auVar128;
        pauVar63[5] = auVar129;
        pauVar63[6] = auVar130;
        pauVar63[7] = auVar131;
        pauVar63 = pauVar63 + 8;
        pfVar65 = pfVar65 + 0x10;
      }
      for (; iVar59 + 3 < size1; iVar59 = iVar59 + 4) {
        fVar224 = *pfVar65;
        auVar46._4_4_ = fVar224 * *(float *)(*pauVar63 + 4);
        auVar46._0_4_ = fVar224 * *(float *)*pauVar63;
        auVar46._8_4_ = fVar224 * *(float *)(*pauVar63 + 8);
        auVar46._12_4_ = fVar224 * *(float *)(*pauVar63 + 0xc);
        auVar46._16_4_ = fVar224 * *(float *)(*pauVar63 + 0x10);
        auVar46._20_4_ = fVar224 * *(float *)(*pauVar63 + 0x14);
        auVar46._24_4_ = fVar224 * *(float *)(*pauVar63 + 0x18);
        auVar46._28_4_ = fVar224;
        fVar224 = pfVar65[1];
        auVar47._4_4_ = fVar224 * *(float *)(*pauVar63 + 0x24);
        auVar47._0_4_ = fVar224 * *(float *)(*pauVar63 + 0x20);
        auVar47._8_4_ = fVar224 * *(float *)(*pauVar63 + 0x28);
        auVar47._12_4_ = fVar224 * *(float *)(*pauVar63 + 0x2c);
        auVar47._16_4_ = fVar224 * *(float *)(*pauVar63 + 0x30);
        auVar47._20_4_ = fVar224 * *(float *)(*pauVar63 + 0x34);
        auVar47._24_4_ = fVar224 * *(float *)(*pauVar63 + 0x38);
        auVar47._28_4_ = fVar224;
        fVar224 = pfVar65[2];
        auVar48._4_4_ = fVar224 * *(float *)(pauVar63[1] + 4);
        auVar48._0_4_ = fVar224 * *(float *)pauVar63[1];
        auVar48._8_4_ = fVar224 * *(float *)(pauVar63[1] + 8);
        auVar48._12_4_ = fVar224 * *(float *)(pauVar63[1] + 0xc);
        auVar48._16_4_ = fVar224 * *(float *)(pauVar63[1] + 0x10);
        auVar48._20_4_ = fVar224 * *(float *)(pauVar63[1] + 0x14);
        auVar48._24_4_ = fVar224 * *(float *)(pauVar63[1] + 0x18);
        auVar48._28_4_ = fVar224;
        fVar224 = pfVar65[3];
        auVar49._4_4_ = fVar224 * *(float *)(pauVar63[1] + 0x24);
        auVar49._0_4_ = fVar224 * *(float *)(pauVar63[1] + 0x20);
        auVar49._8_4_ = fVar224 * *(float *)(pauVar63[1] + 0x28);
        auVar49._12_4_ = fVar224 * *(float *)(pauVar63[1] + 0x2c);
        auVar49._16_4_ = fVar224 * *(float *)(pauVar63[1] + 0x30);
        auVar49._20_4_ = fVar224 * *(float *)(pauVar63[1] + 0x34);
        auVar49._24_4_ = fVar224 * *(float *)(pauVar63[1] + 0x38);
        auVar49._28_4_ = fVar224;
        *(undefined1 (*) [32])*pauVar63 = auVar46;
        *(undefined1 (*) [32])(*pauVar63 + 0x20) = auVar47;
        *(undefined1 (*) [32])pauVar63[1] = auVar48;
        *(undefined1 (*) [32])(pauVar63[1] + 0x20) = auVar49;
        pauVar63 = pauVar63 + 2;
        pfVar65 = pfVar65 + 4;
      }
      lVar64 = 0;
      for (; iVar59 < size1; iVar59 = iVar59 + 1) {
        fVar224 = *(float *)((long)pfVar65 + lVar64);
        pfVar1 = (float *)(*pauVar63 + lVar64 * 8);
        auVar50._4_4_ = fVar224 * pfVar1[1];
        auVar50._0_4_ = fVar224 * *pfVar1;
        auVar50._8_4_ = fVar224 * pfVar1[2];
        auVar50._12_4_ = fVar224 * pfVar1[3];
        auVar50._16_4_ = fVar224 * pfVar1[4];
        auVar50._20_4_ = fVar224 * pfVar1[5];
        auVar50._24_4_ = fVar224 * pfVar1[6];
        auVar50._28_4_ = fVar224;
        *(undefined1 (*) [32])(*pauVar63 + lVar64 * 8) = auVar50;
        lVar64 = lVar64 + 4;
      }
    }
  }
  else if (elempack == 0x10) {
    uVar60 = 0;
    uVar72 = (ulong)(uint)elemcount;
    if (elemcount < 1) {
      uVar72 = 0;
    }
    for (; afVar58 = ::_ps512_cephes_exp_p5, afVar57 = ::_ps512_cephes_exp_p4,
        afVar56 = ::_ps512_cephes_exp_p3, afVar55 = ::_ps512_cephes_exp_p2,
        afVar54 = ::_ps512_cephes_exp_p1, afVar53 = ::_ps512_cephes_exp_p0,
        afVar52 = ::_ps512_cephes_LOG2EF, afVar207 = ::_ps512_exp_lo, afVar209 = ::_ps512_exp_hi,
        afVar51 = ::_ps512_1, uVar60 != uVar72; uVar60 = uVar60 + 1) {
      pauVar62 = (undefined1 (*) [64])(_ptr + uVar60 * lVar70);
      lVar64 = 0;
      pauVar63 = (undefined1 (*) [64])_maxptr;
      for (iVar59 = 0; iVar59 + 0xf < size1; iVar59 = iVar59 + 0x10) {
        auVar124 = vunpcklps_avx512f(*pauVar62,pauVar62[1]);
        auVar125 = vunpckhps_avx512f(*pauVar62,pauVar62[1]);
        auVar124 = vmaxps_avx512f(auVar124,auVar125);
        auVar125 = vunpcklps_avx512f(pauVar62[2],pauVar62[3]);
        auVar126 = vunpckhps_avx512f(pauVar62[2],pauVar62[3]);
        auVar125 = vmaxps_avx512f(auVar125,auVar126);
        auVar126 = vunpcklps_avx512f(pauVar62[4],pauVar62[5]);
        auVar127 = vunpckhps_avx512f(pauVar62[4],pauVar62[5]);
        auVar126 = vmaxps_avx512f(auVar126,auVar127);
        auVar127 = vunpcklps_avx512f(pauVar62[6],pauVar62[7]);
        auVar128 = vunpckhps_avx512f(pauVar62[6],pauVar62[7]);
        auVar127 = vmaxps_avx512f(auVar127,auVar128);
        auVar128 = vunpcklps_avx512f(pauVar62[8],pauVar62[9]);
        auVar129 = vunpckhps_avx512f(pauVar62[8],pauVar62[9]);
        auVar128 = vmaxps_avx512f(auVar128,auVar129);
        auVar129 = vunpcklps_avx512f(pauVar62[10],pauVar62[0xb]);
        auVar130 = vunpckhps_avx512f(pauVar62[10],pauVar62[0xb]);
        auVar129 = vmaxps_avx512f(auVar129,auVar130);
        auVar130 = vunpcklps_avx512f(pauVar62[0xc],pauVar62[0xd]);
        auVar131 = vunpckhps_avx512f(pauVar62[0xc],pauVar62[0xd]);
        auVar130 = vmaxps_avx512f(auVar130,auVar131);
        auVar131 = vunpcklps_avx512f(pauVar62[0xe],pauVar62[0xf]);
        auVar132 = vunpckhps_avx512f(pauVar62[0xe],pauVar62[0xf]);
        auVar131 = vmaxps_avx512f(auVar131,auVar132);
        auVar132 = vunpcklpd_avx512f(auVar124,auVar125);
        auVar124 = vunpckhpd_avx512f(auVar124,auVar125);
        auVar124 = vmaxps_avx512f(auVar132,auVar124);
        auVar125 = vunpcklpd_avx512f(auVar126,auVar127);
        auVar126 = vunpckhpd_avx512f(auVar126,auVar127);
        auVar125 = vmaxps_avx512f(auVar125,auVar126);
        auVar126 = vunpcklpd_avx512f(auVar128,auVar129);
        auVar127 = vunpckhpd_avx512f(auVar128,auVar129);
        auVar126 = vmaxps_avx512f(auVar126,auVar127);
        auVar127 = vunpcklpd_avx512f(auVar130,auVar131);
        auVar128 = vunpckhpd_avx512f(auVar130,auVar131);
        auVar127 = vmaxps_avx512f(auVar127,auVar128);
        auVar128 = vinsertf64x4_avx512f(auVar124,auVar125._0_32_,1);
        auVar124 = vshuff64x2_avx512f(auVar124,auVar125,0xee);
        auVar124 = vmaxps_avx512f(auVar128,auVar124);
        auVar125 = vinsertf64x4_avx512f(auVar126,auVar127._0_32_,1);
        auVar126 = vshuff64x2_avx512f(auVar126,auVar127,0xee);
        auVar125 = vmaxps_avx512f(auVar125,auVar126);
        auVar126 = vshuff64x2_avx512f(auVar124,auVar125,0x88);
        auVar124 = vshuff64x2_avx512f(auVar124,auVar125,0xdd);
        auVar124 = vmaxps_avx512f(auVar126,auVar124);
        auVar124 = vmaxps_avx512f(auVar124,*pauVar63);
        *pauVar63 = auVar124;
        pauVar62 = pauVar62 + 0x10;
        pauVar63 = pauVar63 + 1;
        lVar64 = lVar64 + 0x10;
      }
      for (; (int)lVar64 < size1; lVar64 = lVar64 + 1) {
        auVar99 = vmaxps_avx(*(undefined1 (*) [32])*pauVar62,
                             *(undefined1 (*) [32])(*pauVar62 + 0x20));
        auVar75 = vmaxps_avx(auVar99._0_16_,auVar99._16_16_);
        auVar89 = vshufpd_avx(auVar75,auVar75,3);
        auVar75 = vmaxps_avx(auVar75,auVar89);
        auVar89 = vmovshdup_avx(auVar75);
        auVar75 = vmaxss_avx(auVar75,auVar89);
        auVar75 = vmaxss_avx(auVar75,ZEXT416((uint)_maxptr[lVar64]));
        _maxptr[lVar64] = auVar75._0_4_;
        pauVar62 = pauVar62 + 1;
      }
    }
    auVar124 = vbroadcastss_avx512f(ZEXT416(0x80000000));
    auVar125 = vxorps_avx512dq(auVar124,(undefined1  [64])::_ps512_cephes_exp_C1);
    auVar124 = vxorps_avx512dq(auVar124,(undefined1  [64])::_ps512_cephes_exp_C2);
    auVar126 = vmovdqa64_avx512f((undefined1  [64])::_pi32_512_0x7f);
    for (uVar60 = 0; uVar60 != uVar72; uVar60 = uVar60 + 1) {
      pauVar63 = (undefined1 (*) [64])(_ptr + uVar60 * lVar70);
      lVar64 = 0;
      lVar67 = 0;
      for (iVar59 = 0; iVar59 + 0xf < size1; iVar59 = iVar59 + 0x10) {
        uVar2 = *(undefined4 *)((long)_maxptr + lVar67);
        auVar128._4_4_ = uVar2;
        auVar128._0_4_ = uVar2;
        auVar128._8_4_ = uVar2;
        auVar128._12_4_ = uVar2;
        auVar128._16_4_ = uVar2;
        auVar128._20_4_ = uVar2;
        auVar128._24_4_ = uVar2;
        auVar128._28_4_ = uVar2;
        auVar128._32_4_ = uVar2;
        auVar128._36_4_ = uVar2;
        auVar128._40_4_ = uVar2;
        auVar128._44_4_ = uVar2;
        auVar128._48_4_ = uVar2;
        auVar128._52_4_ = uVar2;
        auVar128._56_4_ = uVar2;
        auVar128._60_4_ = uVar2;
        auVar127 = vsubps_avx512f(*pauVar63,auVar128);
        auVar127 = vminps_avx512f(auVar127,(undefined1  [64])afVar209);
        auVar127 = vmaxps_avx512f(auVar127,(undefined1  [64])afVar207);
        auVar128 = vfmadd213ps_avx512f((undefined1  [64])afVar52,auVar127,(undefined1  [64])afVar58)
        ;
        auVar129 = vrndscaleps_avx512f(auVar128,1);
        uVar6 = vcmpps_avx512f(auVar128,auVar129,1);
        auVar128 = vsubps_avx512f(auVar129,(undefined1  [64])afVar51);
        bVar5 = (bool)((byte)uVar6 & 1);
        auVar133._0_4_ = (uint)bVar5 * auVar128._0_4_ | (uint)!bVar5 * auVar129._0_4_;
        bVar5 = (bool)((byte)(uVar6 >> 1) & 1);
        auVar133._4_4_ = (uint)bVar5 * auVar128._4_4_ | (uint)!bVar5 * auVar129._4_4_;
        bVar5 = (bool)((byte)(uVar6 >> 2) & 1);
        auVar133._8_4_ = (uint)bVar5 * auVar128._8_4_ | (uint)!bVar5 * auVar129._8_4_;
        bVar5 = (bool)((byte)(uVar6 >> 3) & 1);
        auVar133._12_4_ = (uint)bVar5 * auVar128._12_4_ | (uint)!bVar5 * auVar129._12_4_;
        bVar5 = (bool)((byte)(uVar6 >> 4) & 1);
        auVar133._16_4_ = (uint)bVar5 * auVar128._16_4_ | (uint)!bVar5 * auVar129._16_4_;
        bVar5 = (bool)((byte)(uVar6 >> 5) & 1);
        auVar133._20_4_ = (uint)bVar5 * auVar128._20_4_ | (uint)!bVar5 * auVar129._20_4_;
        bVar5 = (bool)((byte)(uVar6 >> 6) & 1);
        auVar133._24_4_ = (uint)bVar5 * auVar128._24_4_ | (uint)!bVar5 * auVar129._24_4_;
        bVar5 = (bool)((byte)(uVar6 >> 7) & 1);
        auVar133._28_4_ = (uint)bVar5 * auVar128._28_4_ | (uint)!bVar5 * auVar129._28_4_;
        bVar5 = (bool)((byte)(uVar6 >> 8) & 1);
        auVar133._32_4_ = (uint)bVar5 * auVar128._32_4_ | (uint)!bVar5 * auVar129._32_4_;
        bVar5 = (bool)((byte)(uVar6 >> 9) & 1);
        auVar133._36_4_ = (uint)bVar5 * auVar128._36_4_ | (uint)!bVar5 * auVar129._36_4_;
        bVar5 = (bool)((byte)(uVar6 >> 10) & 1);
        auVar133._40_4_ = (uint)bVar5 * auVar128._40_4_ | (uint)!bVar5 * auVar129._40_4_;
        bVar5 = (bool)((byte)(uVar6 >> 0xb) & 1);
        auVar133._44_4_ = (uint)bVar5 * auVar128._44_4_ | (uint)!bVar5 * auVar129._44_4_;
        bVar5 = (bool)((byte)(uVar6 >> 0xc) & 1);
        auVar133._48_4_ = (uint)bVar5 * auVar128._48_4_ | (uint)!bVar5 * auVar129._48_4_;
        bVar5 = (bool)((byte)(uVar6 >> 0xd) & 1);
        auVar133._52_4_ = (uint)bVar5 * auVar128._52_4_ | (uint)!bVar5 * auVar129._52_4_;
        bVar5 = (bool)((byte)(uVar6 >> 0xe) & 1);
        auVar133._56_4_ = (uint)bVar5 * auVar128._56_4_ | (uint)!bVar5 * auVar129._56_4_;
        bVar5 = SUB81(uVar6 >> 0xf,0);
        auVar133._60_4_ = (uint)bVar5 * auVar128._60_4_ | (uint)!bVar5 * auVar129._60_4_;
        auVar127 = vfmadd231ps_avx512f(auVar127,auVar133,auVar125);
        auVar127 = vfmadd231ps_avx512f(auVar127,auVar133,auVar124);
        auVar128 = vmulps_avx512f(auVar127,auVar127);
        auVar129 = vfmadd213ps_avx512f(auVar127,(undefined1  [64])afVar53,(undefined1  [64])afVar54)
        ;
        auVar129 = vfmadd213ps_avx512f(auVar129,auVar127,(undefined1  [64])afVar55);
        auVar129 = vfmadd213ps_avx512f(auVar129,auVar127,(undefined1  [64])afVar56);
        auVar129 = vfmadd213ps_avx512f(auVar129,auVar127,(undefined1  [64])afVar57);
        auVar129 = vfmadd213ps_avx512f(auVar129,auVar127,(undefined1  [64])afVar58);
        auVar127 = vfmadd213ps_avx512f(auVar129,auVar128,auVar127);
        auVar127 = vaddps_avx512f(auVar127,(undefined1  [64])afVar51);
        auVar128 = vcvttps2dq_avx512f(auVar133);
        auVar128 = vpaddd_avx512f(auVar128,auVar126);
        auVar128 = vpslld_avx512f(auVar128,0x17);
        auVar127 = vmulps_avx512f(auVar127,auVar128);
        uVar2 = *(undefined4 *)((long)_maxptr + lVar67 + 4);
        auVar141._4_4_ = uVar2;
        auVar141._0_4_ = uVar2;
        auVar141._8_4_ = uVar2;
        auVar141._12_4_ = uVar2;
        auVar141._16_4_ = uVar2;
        auVar141._20_4_ = uVar2;
        auVar141._24_4_ = uVar2;
        auVar141._28_4_ = uVar2;
        auVar141._32_4_ = uVar2;
        auVar141._36_4_ = uVar2;
        auVar141._40_4_ = uVar2;
        auVar141._44_4_ = uVar2;
        auVar141._48_4_ = uVar2;
        auVar141._52_4_ = uVar2;
        auVar141._56_4_ = uVar2;
        auVar141._60_4_ = uVar2;
        auVar128 = vsubps_avx512f(pauVar63[1],auVar141);
        auVar128 = vminps_avx512f(auVar128,(undefined1  [64])afVar209);
        auVar128 = vmaxps_avx512f(auVar128,(undefined1  [64])afVar207);
        auVar129 = vfmadd213ps_avx512f((undefined1  [64])afVar52,auVar128,(undefined1  [64])afVar58)
        ;
        auVar130 = vrndscaleps_avx512f(auVar129,1);
        uVar6 = vcmpps_avx512f(auVar129,auVar130,1);
        auVar129 = vsubps_avx512f(auVar130,(undefined1  [64])afVar51);
        bVar5 = (bool)((byte)uVar6 & 1);
        auVar134._0_4_ = (uint)bVar5 * auVar129._0_4_ | (uint)!bVar5 * auVar130._0_4_;
        bVar5 = (bool)((byte)(uVar6 >> 1) & 1);
        auVar134._4_4_ = (uint)bVar5 * auVar129._4_4_ | (uint)!bVar5 * auVar130._4_4_;
        bVar5 = (bool)((byte)(uVar6 >> 2) & 1);
        auVar134._8_4_ = (uint)bVar5 * auVar129._8_4_ | (uint)!bVar5 * auVar130._8_4_;
        bVar5 = (bool)((byte)(uVar6 >> 3) & 1);
        auVar134._12_4_ = (uint)bVar5 * auVar129._12_4_ | (uint)!bVar5 * auVar130._12_4_;
        bVar5 = (bool)((byte)(uVar6 >> 4) & 1);
        auVar134._16_4_ = (uint)bVar5 * auVar129._16_4_ | (uint)!bVar5 * auVar130._16_4_;
        bVar5 = (bool)((byte)(uVar6 >> 5) & 1);
        auVar134._20_4_ = (uint)bVar5 * auVar129._20_4_ | (uint)!bVar5 * auVar130._20_4_;
        bVar5 = (bool)((byte)(uVar6 >> 6) & 1);
        auVar134._24_4_ = (uint)bVar5 * auVar129._24_4_ | (uint)!bVar5 * auVar130._24_4_;
        bVar5 = (bool)((byte)(uVar6 >> 7) & 1);
        auVar134._28_4_ = (uint)bVar5 * auVar129._28_4_ | (uint)!bVar5 * auVar130._28_4_;
        bVar5 = (bool)((byte)(uVar6 >> 8) & 1);
        auVar134._32_4_ = (uint)bVar5 * auVar129._32_4_ | (uint)!bVar5 * auVar130._32_4_;
        bVar5 = (bool)((byte)(uVar6 >> 9) & 1);
        auVar134._36_4_ = (uint)bVar5 * auVar129._36_4_ | (uint)!bVar5 * auVar130._36_4_;
        bVar5 = (bool)((byte)(uVar6 >> 10) & 1);
        auVar134._40_4_ = (uint)bVar5 * auVar129._40_4_ | (uint)!bVar5 * auVar130._40_4_;
        bVar5 = (bool)((byte)(uVar6 >> 0xb) & 1);
        auVar134._44_4_ = (uint)bVar5 * auVar129._44_4_ | (uint)!bVar5 * auVar130._44_4_;
        bVar5 = (bool)((byte)(uVar6 >> 0xc) & 1);
        auVar134._48_4_ = (uint)bVar5 * auVar129._48_4_ | (uint)!bVar5 * auVar130._48_4_;
        bVar5 = (bool)((byte)(uVar6 >> 0xd) & 1);
        auVar134._52_4_ = (uint)bVar5 * auVar129._52_4_ | (uint)!bVar5 * auVar130._52_4_;
        bVar5 = (bool)((byte)(uVar6 >> 0xe) & 1);
        auVar134._56_4_ = (uint)bVar5 * auVar129._56_4_ | (uint)!bVar5 * auVar130._56_4_;
        bVar5 = SUB81(uVar6 >> 0xf,0);
        auVar134._60_4_ = (uint)bVar5 * auVar129._60_4_ | (uint)!bVar5 * auVar130._60_4_;
        auVar128 = vfmadd231ps_avx512f(auVar128,auVar134,auVar125);
        auVar128 = vfmadd231ps_avx512f(auVar128,auVar134,auVar124);
        auVar129 = vmulps_avx512f(auVar128,auVar128);
        auVar130 = vfmadd213ps_avx512f(auVar128,(undefined1  [64])afVar53,(undefined1  [64])afVar54)
        ;
        auVar130 = vfmadd213ps_avx512f(auVar130,auVar128,(undefined1  [64])afVar55);
        auVar130 = vfmadd213ps_avx512f(auVar130,auVar128,(undefined1  [64])afVar56);
        auVar130 = vfmadd213ps_avx512f(auVar130,auVar128,(undefined1  [64])afVar57);
        auVar130 = vfmadd213ps_avx512f(auVar130,auVar128,(undefined1  [64])afVar58);
        auVar128 = vfmadd213ps_avx512f(auVar130,auVar129,auVar128);
        auVar128 = vaddps_avx512f(auVar128,(undefined1  [64])afVar51);
        auVar129 = vcvttps2dq_avx512f(auVar134);
        auVar129 = vpaddd_avx512f(auVar129,auVar126);
        auVar129 = vpslld_avx512f(auVar129,0x17);
        auVar128 = vmulps_avx512f(auVar128,auVar129);
        uVar2 = *(undefined4 *)((long)_maxptr + lVar67 + 8);
        auVar147._4_4_ = uVar2;
        auVar147._0_4_ = uVar2;
        auVar147._8_4_ = uVar2;
        auVar147._12_4_ = uVar2;
        auVar147._16_4_ = uVar2;
        auVar147._20_4_ = uVar2;
        auVar147._24_4_ = uVar2;
        auVar147._28_4_ = uVar2;
        auVar147._32_4_ = uVar2;
        auVar147._36_4_ = uVar2;
        auVar147._40_4_ = uVar2;
        auVar147._44_4_ = uVar2;
        auVar147._48_4_ = uVar2;
        auVar147._52_4_ = uVar2;
        auVar147._56_4_ = uVar2;
        auVar147._60_4_ = uVar2;
        auVar129 = vsubps_avx512f(pauVar63[2],auVar147);
        auVar129 = vminps_avx512f(auVar129,(undefined1  [64])afVar209);
        auVar129 = vmaxps_avx512f(auVar129,(undefined1  [64])afVar207);
        auVar130 = vfmadd213ps_avx512f((undefined1  [64])afVar52,auVar129,(undefined1  [64])afVar58)
        ;
        auVar131 = vrndscaleps_avx512f(auVar130,1);
        uVar6 = vcmpps_avx512f(auVar130,auVar131,1);
        auVar130 = vsubps_avx512f(auVar131,(undefined1  [64])afVar51);
        bVar5 = (bool)((byte)uVar6 & 1);
        auVar135._0_4_ = (uint)bVar5 * auVar130._0_4_ | (uint)!bVar5 * auVar131._0_4_;
        bVar5 = (bool)((byte)(uVar6 >> 1) & 1);
        auVar135._4_4_ = (uint)bVar5 * auVar130._4_4_ | (uint)!bVar5 * auVar131._4_4_;
        bVar5 = (bool)((byte)(uVar6 >> 2) & 1);
        auVar135._8_4_ = (uint)bVar5 * auVar130._8_4_ | (uint)!bVar5 * auVar131._8_4_;
        bVar5 = (bool)((byte)(uVar6 >> 3) & 1);
        auVar135._12_4_ = (uint)bVar5 * auVar130._12_4_ | (uint)!bVar5 * auVar131._12_4_;
        bVar5 = (bool)((byte)(uVar6 >> 4) & 1);
        auVar135._16_4_ = (uint)bVar5 * auVar130._16_4_ | (uint)!bVar5 * auVar131._16_4_;
        bVar5 = (bool)((byte)(uVar6 >> 5) & 1);
        auVar135._20_4_ = (uint)bVar5 * auVar130._20_4_ | (uint)!bVar5 * auVar131._20_4_;
        bVar5 = (bool)((byte)(uVar6 >> 6) & 1);
        auVar135._24_4_ = (uint)bVar5 * auVar130._24_4_ | (uint)!bVar5 * auVar131._24_4_;
        bVar5 = (bool)((byte)(uVar6 >> 7) & 1);
        auVar135._28_4_ = (uint)bVar5 * auVar130._28_4_ | (uint)!bVar5 * auVar131._28_4_;
        bVar5 = (bool)((byte)(uVar6 >> 8) & 1);
        auVar135._32_4_ = (uint)bVar5 * auVar130._32_4_ | (uint)!bVar5 * auVar131._32_4_;
        bVar5 = (bool)((byte)(uVar6 >> 9) & 1);
        auVar135._36_4_ = (uint)bVar5 * auVar130._36_4_ | (uint)!bVar5 * auVar131._36_4_;
        bVar5 = (bool)((byte)(uVar6 >> 10) & 1);
        auVar135._40_4_ = (uint)bVar5 * auVar130._40_4_ | (uint)!bVar5 * auVar131._40_4_;
        bVar5 = (bool)((byte)(uVar6 >> 0xb) & 1);
        auVar135._44_4_ = (uint)bVar5 * auVar130._44_4_ | (uint)!bVar5 * auVar131._44_4_;
        bVar5 = (bool)((byte)(uVar6 >> 0xc) & 1);
        auVar135._48_4_ = (uint)bVar5 * auVar130._48_4_ | (uint)!bVar5 * auVar131._48_4_;
        bVar5 = (bool)((byte)(uVar6 >> 0xd) & 1);
        auVar135._52_4_ = (uint)bVar5 * auVar130._52_4_ | (uint)!bVar5 * auVar131._52_4_;
        bVar5 = (bool)((byte)(uVar6 >> 0xe) & 1);
        auVar135._56_4_ = (uint)bVar5 * auVar130._56_4_ | (uint)!bVar5 * auVar131._56_4_;
        bVar5 = SUB81(uVar6 >> 0xf,0);
        auVar135._60_4_ = (uint)bVar5 * auVar130._60_4_ | (uint)!bVar5 * auVar131._60_4_;
        auVar129 = vfmadd231ps_avx512f(auVar129,auVar135,auVar125);
        auVar129 = vfmadd231ps_avx512f(auVar129,auVar135,auVar124);
        auVar130 = vmulps_avx512f(auVar129,auVar129);
        auVar131 = vfmadd213ps_avx512f(auVar129,(undefined1  [64])afVar53,(undefined1  [64])afVar54)
        ;
        auVar131 = vfmadd213ps_avx512f(auVar131,auVar129,(undefined1  [64])afVar55);
        auVar131 = vfmadd213ps_avx512f(auVar131,auVar129,(undefined1  [64])afVar56);
        auVar131 = vfmadd213ps_avx512f(auVar131,auVar129,(undefined1  [64])afVar57);
        auVar131 = vfmadd213ps_avx512f(auVar131,auVar129,(undefined1  [64])afVar58);
        auVar129 = vfmadd213ps_avx512f(auVar131,auVar130,auVar129);
        auVar129 = vaddps_avx512f(auVar129,(undefined1  [64])afVar51);
        auVar130 = vcvttps2dq_avx512f(auVar135);
        auVar130 = vpaddd_avx512f(auVar130,auVar126);
        auVar130 = vpslld_avx512f(auVar130,0x17);
        auVar129 = vmulps_avx512f(auVar129,auVar130);
        uVar2 = *(undefined4 *)((long)_maxptr + lVar67 + 0xc);
        auVar149._4_4_ = uVar2;
        auVar149._0_4_ = uVar2;
        auVar149._8_4_ = uVar2;
        auVar149._12_4_ = uVar2;
        auVar149._16_4_ = uVar2;
        auVar149._20_4_ = uVar2;
        auVar149._24_4_ = uVar2;
        auVar149._28_4_ = uVar2;
        auVar149._32_4_ = uVar2;
        auVar149._36_4_ = uVar2;
        auVar149._40_4_ = uVar2;
        auVar149._44_4_ = uVar2;
        auVar149._48_4_ = uVar2;
        auVar149._52_4_ = uVar2;
        auVar149._56_4_ = uVar2;
        auVar149._60_4_ = uVar2;
        auVar130 = vsubps_avx512f(pauVar63[3],auVar149);
        auVar130 = vminps_avx512f(auVar130,(undefined1  [64])afVar209);
        auVar130 = vmaxps_avx512f(auVar130,(undefined1  [64])afVar207);
        auVar131 = vfmadd213ps_avx512f((undefined1  [64])afVar52,auVar130,(undefined1  [64])afVar58)
        ;
        auVar132 = vrndscaleps_avx512f(auVar131,1);
        uVar6 = vcmpps_avx512f(auVar131,auVar132,1);
        auVar131 = vsubps_avx512f(auVar132,(undefined1  [64])afVar51);
        bVar5 = (bool)((byte)uVar6 & 1);
        auVar136._0_4_ = (uint)bVar5 * auVar131._0_4_ | (uint)!bVar5 * auVar132._0_4_;
        bVar5 = (bool)((byte)(uVar6 >> 1) & 1);
        auVar136._4_4_ = (uint)bVar5 * auVar131._4_4_ | (uint)!bVar5 * auVar132._4_4_;
        bVar5 = (bool)((byte)(uVar6 >> 2) & 1);
        auVar136._8_4_ = (uint)bVar5 * auVar131._8_4_ | (uint)!bVar5 * auVar132._8_4_;
        bVar5 = (bool)((byte)(uVar6 >> 3) & 1);
        auVar136._12_4_ = (uint)bVar5 * auVar131._12_4_ | (uint)!bVar5 * auVar132._12_4_;
        bVar5 = (bool)((byte)(uVar6 >> 4) & 1);
        auVar136._16_4_ = (uint)bVar5 * auVar131._16_4_ | (uint)!bVar5 * auVar132._16_4_;
        bVar5 = (bool)((byte)(uVar6 >> 5) & 1);
        auVar136._20_4_ = (uint)bVar5 * auVar131._20_4_ | (uint)!bVar5 * auVar132._20_4_;
        bVar5 = (bool)((byte)(uVar6 >> 6) & 1);
        auVar136._24_4_ = (uint)bVar5 * auVar131._24_4_ | (uint)!bVar5 * auVar132._24_4_;
        bVar5 = (bool)((byte)(uVar6 >> 7) & 1);
        auVar136._28_4_ = (uint)bVar5 * auVar131._28_4_ | (uint)!bVar5 * auVar132._28_4_;
        bVar5 = (bool)((byte)(uVar6 >> 8) & 1);
        auVar136._32_4_ = (uint)bVar5 * auVar131._32_4_ | (uint)!bVar5 * auVar132._32_4_;
        bVar5 = (bool)((byte)(uVar6 >> 9) & 1);
        auVar136._36_4_ = (uint)bVar5 * auVar131._36_4_ | (uint)!bVar5 * auVar132._36_4_;
        bVar5 = (bool)((byte)(uVar6 >> 10) & 1);
        auVar136._40_4_ = (uint)bVar5 * auVar131._40_4_ | (uint)!bVar5 * auVar132._40_4_;
        bVar5 = (bool)((byte)(uVar6 >> 0xb) & 1);
        auVar136._44_4_ = (uint)bVar5 * auVar131._44_4_ | (uint)!bVar5 * auVar132._44_4_;
        bVar5 = (bool)((byte)(uVar6 >> 0xc) & 1);
        auVar136._48_4_ = (uint)bVar5 * auVar131._48_4_ | (uint)!bVar5 * auVar132._48_4_;
        bVar5 = (bool)((byte)(uVar6 >> 0xd) & 1);
        auVar136._52_4_ = (uint)bVar5 * auVar131._52_4_ | (uint)!bVar5 * auVar132._52_4_;
        bVar5 = (bool)((byte)(uVar6 >> 0xe) & 1);
        auVar136._56_4_ = (uint)bVar5 * auVar131._56_4_ | (uint)!bVar5 * auVar132._56_4_;
        bVar5 = SUB81(uVar6 >> 0xf,0);
        auVar136._60_4_ = (uint)bVar5 * auVar131._60_4_ | (uint)!bVar5 * auVar132._60_4_;
        auVar130 = vfmadd231ps_avx512f(auVar130,auVar136,auVar125);
        auVar130 = vfmadd231ps_avx512f(auVar130,auVar136,auVar124);
        auVar131 = vmulps_avx512f(auVar130,auVar130);
        auVar132 = vfmadd213ps_avx512f(auVar130,(undefined1  [64])afVar53,(undefined1  [64])afVar54)
        ;
        auVar132 = vfmadd213ps_avx512f(auVar132,auVar130,(undefined1  [64])afVar55);
        auVar132 = vfmadd213ps_avx512f(auVar132,auVar130,(undefined1  [64])afVar56);
        auVar132 = vfmadd213ps_avx512f(auVar132,auVar130,(undefined1  [64])afVar57);
        auVar132 = vfmadd213ps_avx512f(auVar132,auVar130,(undefined1  [64])afVar58);
        auVar130 = vfmadd213ps_avx512f(auVar132,auVar131,auVar130);
        auVar130 = vaddps_avx512f(auVar130,(undefined1  [64])afVar51);
        auVar131 = vcvttps2dq_avx512f(auVar136);
        auVar131 = vpaddd_avx512f(auVar131,auVar126);
        auVar131 = vpslld_avx512f(auVar131,0x17);
        auVar130 = vmulps_avx512f(auVar130,auVar131);
        uVar2 = *(undefined4 *)((long)_maxptr + lVar67 + 0x10);
        auVar153._4_4_ = uVar2;
        auVar153._0_4_ = uVar2;
        auVar153._8_4_ = uVar2;
        auVar153._12_4_ = uVar2;
        auVar153._16_4_ = uVar2;
        auVar153._20_4_ = uVar2;
        auVar153._24_4_ = uVar2;
        auVar153._28_4_ = uVar2;
        auVar153._32_4_ = uVar2;
        auVar153._36_4_ = uVar2;
        auVar153._40_4_ = uVar2;
        auVar153._44_4_ = uVar2;
        auVar153._48_4_ = uVar2;
        auVar153._52_4_ = uVar2;
        auVar153._56_4_ = uVar2;
        auVar153._60_4_ = uVar2;
        auVar131 = vsubps_avx512f(pauVar63[4],auVar153);
        auVar131 = vminps_avx512f(auVar131,(undefined1  [64])afVar209);
        auVar131 = vmaxps_avx512f(auVar131,(undefined1  [64])afVar207);
        auVar132 = vfmadd213ps_avx512f((undefined1  [64])afVar52,auVar131,(undefined1  [64])afVar58)
        ;
        auVar137 = vrndscaleps_avx512f(auVar132,1);
        uVar6 = vcmpps_avx512f(auVar132,auVar137,1);
        auVar132 = vsubps_avx512f(auVar137,(undefined1  [64])afVar51);
        bVar5 = (bool)((byte)uVar6 & 1);
        auVar138._0_4_ = (uint)bVar5 * auVar132._0_4_ | (uint)!bVar5 * auVar137._0_4_;
        bVar5 = (bool)((byte)(uVar6 >> 1) & 1);
        auVar138._4_4_ = (uint)bVar5 * auVar132._4_4_ | (uint)!bVar5 * auVar137._4_4_;
        bVar5 = (bool)((byte)(uVar6 >> 2) & 1);
        auVar138._8_4_ = (uint)bVar5 * auVar132._8_4_ | (uint)!bVar5 * auVar137._8_4_;
        bVar5 = (bool)((byte)(uVar6 >> 3) & 1);
        auVar138._12_4_ = (uint)bVar5 * auVar132._12_4_ | (uint)!bVar5 * auVar137._12_4_;
        bVar5 = (bool)((byte)(uVar6 >> 4) & 1);
        auVar138._16_4_ = (uint)bVar5 * auVar132._16_4_ | (uint)!bVar5 * auVar137._16_4_;
        bVar5 = (bool)((byte)(uVar6 >> 5) & 1);
        auVar138._20_4_ = (uint)bVar5 * auVar132._20_4_ | (uint)!bVar5 * auVar137._20_4_;
        bVar5 = (bool)((byte)(uVar6 >> 6) & 1);
        auVar138._24_4_ = (uint)bVar5 * auVar132._24_4_ | (uint)!bVar5 * auVar137._24_4_;
        bVar5 = (bool)((byte)(uVar6 >> 7) & 1);
        auVar138._28_4_ = (uint)bVar5 * auVar132._28_4_ | (uint)!bVar5 * auVar137._28_4_;
        bVar5 = (bool)((byte)(uVar6 >> 8) & 1);
        auVar138._32_4_ = (uint)bVar5 * auVar132._32_4_ | (uint)!bVar5 * auVar137._32_4_;
        bVar5 = (bool)((byte)(uVar6 >> 9) & 1);
        auVar138._36_4_ = (uint)bVar5 * auVar132._36_4_ | (uint)!bVar5 * auVar137._36_4_;
        bVar5 = (bool)((byte)(uVar6 >> 10) & 1);
        auVar138._40_4_ = (uint)bVar5 * auVar132._40_4_ | (uint)!bVar5 * auVar137._40_4_;
        bVar5 = (bool)((byte)(uVar6 >> 0xb) & 1);
        auVar138._44_4_ = (uint)bVar5 * auVar132._44_4_ | (uint)!bVar5 * auVar137._44_4_;
        bVar5 = (bool)((byte)(uVar6 >> 0xc) & 1);
        auVar138._48_4_ = (uint)bVar5 * auVar132._48_4_ | (uint)!bVar5 * auVar137._48_4_;
        bVar5 = (bool)((byte)(uVar6 >> 0xd) & 1);
        auVar138._52_4_ = (uint)bVar5 * auVar132._52_4_ | (uint)!bVar5 * auVar137._52_4_;
        bVar5 = (bool)((byte)(uVar6 >> 0xe) & 1);
        auVar138._56_4_ = (uint)bVar5 * auVar132._56_4_ | (uint)!bVar5 * auVar137._56_4_;
        bVar5 = SUB81(uVar6 >> 0xf,0);
        auVar138._60_4_ = (uint)bVar5 * auVar132._60_4_ | (uint)!bVar5 * auVar137._60_4_;
        auVar131 = vfmadd231ps_avx512f(auVar131,auVar138,auVar125);
        auVar131 = vfmadd231ps_avx512f(auVar131,auVar138,auVar124);
        auVar132 = vmulps_avx512f(auVar131,auVar131);
        auVar137 = vfmadd213ps_avx512f(auVar131,(undefined1  [64])afVar53,(undefined1  [64])afVar54)
        ;
        auVar137 = vfmadd213ps_avx512f(auVar137,auVar131,(undefined1  [64])afVar55);
        auVar137 = vfmadd213ps_avx512f(auVar137,auVar131,(undefined1  [64])afVar56);
        auVar137 = vfmadd213ps_avx512f(auVar137,auVar131,(undefined1  [64])afVar57);
        auVar137 = vfmadd213ps_avx512f(auVar137,auVar131,(undefined1  [64])afVar58);
        auVar131 = vfmadd213ps_avx512f(auVar137,auVar132,auVar131);
        auVar131 = vaddps_avx512f(auVar131,(undefined1  [64])afVar51);
        auVar132 = vcvttps2dq_avx512f(auVar138);
        auVar132 = vpaddd_avx512f(auVar132,auVar126);
        auVar132 = vpslld_avx512f(auVar132,0x17);
        auVar131 = vmulps_avx512f(auVar131,auVar132);
        uVar2 = *(undefined4 *)((long)_maxptr + lVar67 + 0x14);
        auVar22._4_4_ = uVar2;
        auVar22._0_4_ = uVar2;
        auVar22._8_4_ = uVar2;
        auVar22._12_4_ = uVar2;
        auVar22._16_4_ = uVar2;
        auVar22._20_4_ = uVar2;
        auVar22._24_4_ = uVar2;
        auVar22._28_4_ = uVar2;
        auVar22._32_4_ = uVar2;
        auVar22._36_4_ = uVar2;
        auVar22._40_4_ = uVar2;
        auVar22._44_4_ = uVar2;
        auVar22._48_4_ = uVar2;
        auVar22._52_4_ = uVar2;
        auVar22._56_4_ = uVar2;
        auVar22._60_4_ = uVar2;
        auVar132 = vsubps_avx512f(pauVar63[5],auVar22);
        auVar132 = vminps_avx512f(auVar132,(undefined1  [64])afVar209);
        auVar132 = vmaxps_avx512f(auVar132,(undefined1  [64])afVar207);
        auVar137 = vfmadd213ps_avx512f((undefined1  [64])afVar52,auVar132,(undefined1  [64])afVar58)
        ;
        auVar139 = vrndscaleps_avx512f(auVar137,1);
        uVar6 = vcmpps_avx512f(auVar137,auVar139,1);
        auVar137 = vsubps_avx512f(auVar139,(undefined1  [64])afVar51);
        bVar5 = (bool)((byte)uVar6 & 1);
        auVar140._0_4_ = (uint)bVar5 * auVar137._0_4_ | (uint)!bVar5 * auVar139._0_4_;
        bVar5 = (bool)((byte)(uVar6 >> 1) & 1);
        auVar140._4_4_ = (uint)bVar5 * auVar137._4_4_ | (uint)!bVar5 * auVar139._4_4_;
        bVar5 = (bool)((byte)(uVar6 >> 2) & 1);
        auVar140._8_4_ = (uint)bVar5 * auVar137._8_4_ | (uint)!bVar5 * auVar139._8_4_;
        bVar5 = (bool)((byte)(uVar6 >> 3) & 1);
        auVar140._12_4_ = (uint)bVar5 * auVar137._12_4_ | (uint)!bVar5 * auVar139._12_4_;
        bVar5 = (bool)((byte)(uVar6 >> 4) & 1);
        auVar140._16_4_ = (uint)bVar5 * auVar137._16_4_ | (uint)!bVar5 * auVar139._16_4_;
        bVar5 = (bool)((byte)(uVar6 >> 5) & 1);
        auVar140._20_4_ = (uint)bVar5 * auVar137._20_4_ | (uint)!bVar5 * auVar139._20_4_;
        bVar5 = (bool)((byte)(uVar6 >> 6) & 1);
        auVar140._24_4_ = (uint)bVar5 * auVar137._24_4_ | (uint)!bVar5 * auVar139._24_4_;
        bVar5 = (bool)((byte)(uVar6 >> 7) & 1);
        auVar140._28_4_ = (uint)bVar5 * auVar137._28_4_ | (uint)!bVar5 * auVar139._28_4_;
        bVar5 = (bool)((byte)(uVar6 >> 8) & 1);
        auVar140._32_4_ = (uint)bVar5 * auVar137._32_4_ | (uint)!bVar5 * auVar139._32_4_;
        bVar5 = (bool)((byte)(uVar6 >> 9) & 1);
        auVar140._36_4_ = (uint)bVar5 * auVar137._36_4_ | (uint)!bVar5 * auVar139._36_4_;
        bVar5 = (bool)((byte)(uVar6 >> 10) & 1);
        auVar140._40_4_ = (uint)bVar5 * auVar137._40_4_ | (uint)!bVar5 * auVar139._40_4_;
        bVar5 = (bool)((byte)(uVar6 >> 0xb) & 1);
        auVar140._44_4_ = (uint)bVar5 * auVar137._44_4_ | (uint)!bVar5 * auVar139._44_4_;
        bVar5 = (bool)((byte)(uVar6 >> 0xc) & 1);
        auVar140._48_4_ = (uint)bVar5 * auVar137._48_4_ | (uint)!bVar5 * auVar139._48_4_;
        bVar5 = (bool)((byte)(uVar6 >> 0xd) & 1);
        auVar140._52_4_ = (uint)bVar5 * auVar137._52_4_ | (uint)!bVar5 * auVar139._52_4_;
        bVar5 = (bool)((byte)(uVar6 >> 0xe) & 1);
        auVar140._56_4_ = (uint)bVar5 * auVar137._56_4_ | (uint)!bVar5 * auVar139._56_4_;
        bVar5 = SUB81(uVar6 >> 0xf,0);
        auVar140._60_4_ = (uint)bVar5 * auVar137._60_4_ | (uint)!bVar5 * auVar139._60_4_;
        auVar132 = vfmadd231ps_avx512f(auVar132,auVar140,auVar125);
        auVar132 = vfmadd231ps_avx512f(auVar132,auVar140,auVar124);
        auVar137 = vmulps_avx512f(auVar132,auVar132);
        auVar139 = vfmadd213ps_avx512f(auVar132,(undefined1  [64])afVar53,(undefined1  [64])afVar54)
        ;
        auVar139 = vfmadd213ps_avx512f(auVar139,auVar132,(undefined1  [64])afVar55);
        auVar139 = vfmadd213ps_avx512f(auVar139,auVar132,(undefined1  [64])afVar56);
        auVar139 = vfmadd213ps_avx512f(auVar139,auVar132,(undefined1  [64])afVar57);
        auVar139 = vfmadd213ps_avx512f(auVar139,auVar132,(undefined1  [64])afVar58);
        auVar132 = vfmadd213ps_avx512f(auVar139,auVar137,auVar132);
        auVar132 = vaddps_avx512f(auVar132,(undefined1  [64])afVar51);
        auVar137 = vcvttps2dq_avx512f(auVar140);
        auVar137 = vpaddd_avx512f(auVar137,auVar126);
        auVar137 = vpslld_avx512f(auVar137,0x17);
        auVar132 = vmulps_avx512f(auVar132,auVar137);
        uVar2 = *(undefined4 *)((long)_maxptr + lVar67 + 0x18);
        auVar23._4_4_ = uVar2;
        auVar23._0_4_ = uVar2;
        auVar23._8_4_ = uVar2;
        auVar23._12_4_ = uVar2;
        auVar23._16_4_ = uVar2;
        auVar23._20_4_ = uVar2;
        auVar23._24_4_ = uVar2;
        auVar23._28_4_ = uVar2;
        auVar23._32_4_ = uVar2;
        auVar23._36_4_ = uVar2;
        auVar23._40_4_ = uVar2;
        auVar23._44_4_ = uVar2;
        auVar23._48_4_ = uVar2;
        auVar23._52_4_ = uVar2;
        auVar23._56_4_ = uVar2;
        auVar23._60_4_ = uVar2;
        auVar137 = vsubps_avx512f(pauVar63[6],auVar23);
        auVar137 = vminps_avx512f(auVar137,(undefined1  [64])afVar209);
        auVar137 = vmaxps_avx512f(auVar137,(undefined1  [64])afVar207);
        auVar139 = vfmadd213ps_avx512f((undefined1  [64])afVar52,auVar137,(undefined1  [64])afVar58)
        ;
        auVar141 = vrndscaleps_avx512f(auVar139,1);
        uVar6 = vcmpps_avx512f(auVar139,auVar141,1);
        auVar139 = vsubps_avx512f(auVar141,(undefined1  [64])afVar51);
        bVar5 = (bool)((byte)uVar6 & 1);
        auVar142._0_4_ = (uint)bVar5 * auVar139._0_4_ | (uint)!bVar5 * auVar141._0_4_;
        bVar5 = (bool)((byte)(uVar6 >> 1) & 1);
        auVar142._4_4_ = (uint)bVar5 * auVar139._4_4_ | (uint)!bVar5 * auVar141._4_4_;
        bVar5 = (bool)((byte)(uVar6 >> 2) & 1);
        auVar142._8_4_ = (uint)bVar5 * auVar139._8_4_ | (uint)!bVar5 * auVar141._8_4_;
        bVar5 = (bool)((byte)(uVar6 >> 3) & 1);
        auVar142._12_4_ = (uint)bVar5 * auVar139._12_4_ | (uint)!bVar5 * auVar141._12_4_;
        bVar5 = (bool)((byte)(uVar6 >> 4) & 1);
        auVar142._16_4_ = (uint)bVar5 * auVar139._16_4_ | (uint)!bVar5 * auVar141._16_4_;
        bVar5 = (bool)((byte)(uVar6 >> 5) & 1);
        auVar142._20_4_ = (uint)bVar5 * auVar139._20_4_ | (uint)!bVar5 * auVar141._20_4_;
        bVar5 = (bool)((byte)(uVar6 >> 6) & 1);
        auVar142._24_4_ = (uint)bVar5 * auVar139._24_4_ | (uint)!bVar5 * auVar141._24_4_;
        bVar5 = (bool)((byte)(uVar6 >> 7) & 1);
        auVar142._28_4_ = (uint)bVar5 * auVar139._28_4_ | (uint)!bVar5 * auVar141._28_4_;
        bVar5 = (bool)((byte)(uVar6 >> 8) & 1);
        auVar142._32_4_ = (uint)bVar5 * auVar139._32_4_ | (uint)!bVar5 * auVar141._32_4_;
        bVar5 = (bool)((byte)(uVar6 >> 9) & 1);
        auVar142._36_4_ = (uint)bVar5 * auVar139._36_4_ | (uint)!bVar5 * auVar141._36_4_;
        bVar5 = (bool)((byte)(uVar6 >> 10) & 1);
        auVar142._40_4_ = (uint)bVar5 * auVar139._40_4_ | (uint)!bVar5 * auVar141._40_4_;
        bVar5 = (bool)((byte)(uVar6 >> 0xb) & 1);
        auVar142._44_4_ = (uint)bVar5 * auVar139._44_4_ | (uint)!bVar5 * auVar141._44_4_;
        bVar5 = (bool)((byte)(uVar6 >> 0xc) & 1);
        auVar142._48_4_ = (uint)bVar5 * auVar139._48_4_ | (uint)!bVar5 * auVar141._48_4_;
        bVar5 = (bool)((byte)(uVar6 >> 0xd) & 1);
        auVar142._52_4_ = (uint)bVar5 * auVar139._52_4_ | (uint)!bVar5 * auVar141._52_4_;
        bVar5 = (bool)((byte)(uVar6 >> 0xe) & 1);
        auVar142._56_4_ = (uint)bVar5 * auVar139._56_4_ | (uint)!bVar5 * auVar141._56_4_;
        bVar5 = SUB81(uVar6 >> 0xf,0);
        auVar142._60_4_ = (uint)bVar5 * auVar139._60_4_ | (uint)!bVar5 * auVar141._60_4_;
        auVar137 = vfmadd231ps_avx512f(auVar137,auVar142,auVar125);
        auVar137 = vfmadd231ps_avx512f(auVar137,auVar142,auVar124);
        auVar139 = vmulps_avx512f(auVar137,auVar137);
        auVar141 = vfmadd213ps_avx512f(auVar137,(undefined1  [64])afVar53,(undefined1  [64])afVar54)
        ;
        auVar141 = vfmadd213ps_avx512f(auVar141,auVar137,(undefined1  [64])afVar55);
        auVar141 = vfmadd213ps_avx512f(auVar141,auVar137,(undefined1  [64])afVar56);
        auVar141 = vfmadd213ps_avx512f(auVar141,auVar137,(undefined1  [64])afVar57);
        auVar141 = vfmadd213ps_avx512f(auVar141,auVar137,(undefined1  [64])afVar58);
        auVar137 = vfmadd213ps_avx512f(auVar141,auVar139,auVar137);
        auVar137 = vaddps_avx512f(auVar137,(undefined1  [64])afVar51);
        auVar139 = vcvttps2dq_avx512f(auVar142);
        auVar139 = vpaddd_avx512f(auVar139,auVar126);
        auVar139 = vpslld_avx512f(auVar139,0x17);
        auVar137 = vmulps_avx512f(auVar137,auVar139);
        uVar2 = *(undefined4 *)((long)_maxptr + lVar67 + 0x1c);
        auVar24._4_4_ = uVar2;
        auVar24._0_4_ = uVar2;
        auVar24._8_4_ = uVar2;
        auVar24._12_4_ = uVar2;
        auVar24._16_4_ = uVar2;
        auVar24._20_4_ = uVar2;
        auVar24._24_4_ = uVar2;
        auVar24._28_4_ = uVar2;
        auVar24._32_4_ = uVar2;
        auVar24._36_4_ = uVar2;
        auVar24._40_4_ = uVar2;
        auVar24._44_4_ = uVar2;
        auVar24._48_4_ = uVar2;
        auVar24._52_4_ = uVar2;
        auVar24._56_4_ = uVar2;
        auVar24._60_4_ = uVar2;
        auVar139 = vsubps_avx512f(pauVar63[7],auVar24);
        auVar139 = vminps_avx512f(auVar139,(undefined1  [64])afVar209);
        auVar139 = vmaxps_avx512f(auVar139,(undefined1  [64])afVar207);
        auVar141 = vfmadd213ps_avx512f((undefined1  [64])afVar52,auVar139,(undefined1  [64])afVar58)
        ;
        auVar143 = vrndscaleps_avx512f(auVar141,1);
        uVar6 = vcmpps_avx512f(auVar141,auVar143,1);
        auVar141 = vsubps_avx512f(auVar143,(undefined1  [64])afVar51);
        bVar5 = (bool)((byte)uVar6 & 1);
        auVar144._0_4_ = (uint)bVar5 * auVar141._0_4_ | (uint)!bVar5 * auVar143._0_4_;
        bVar5 = (bool)((byte)(uVar6 >> 1) & 1);
        auVar144._4_4_ = (uint)bVar5 * auVar141._4_4_ | (uint)!bVar5 * auVar143._4_4_;
        bVar5 = (bool)((byte)(uVar6 >> 2) & 1);
        auVar144._8_4_ = (uint)bVar5 * auVar141._8_4_ | (uint)!bVar5 * auVar143._8_4_;
        bVar5 = (bool)((byte)(uVar6 >> 3) & 1);
        auVar144._12_4_ = (uint)bVar5 * auVar141._12_4_ | (uint)!bVar5 * auVar143._12_4_;
        bVar5 = (bool)((byte)(uVar6 >> 4) & 1);
        auVar144._16_4_ = (uint)bVar5 * auVar141._16_4_ | (uint)!bVar5 * auVar143._16_4_;
        bVar5 = (bool)((byte)(uVar6 >> 5) & 1);
        auVar144._20_4_ = (uint)bVar5 * auVar141._20_4_ | (uint)!bVar5 * auVar143._20_4_;
        bVar5 = (bool)((byte)(uVar6 >> 6) & 1);
        auVar144._24_4_ = (uint)bVar5 * auVar141._24_4_ | (uint)!bVar5 * auVar143._24_4_;
        bVar5 = (bool)((byte)(uVar6 >> 7) & 1);
        auVar144._28_4_ = (uint)bVar5 * auVar141._28_4_ | (uint)!bVar5 * auVar143._28_4_;
        bVar5 = (bool)((byte)(uVar6 >> 8) & 1);
        auVar144._32_4_ = (uint)bVar5 * auVar141._32_4_ | (uint)!bVar5 * auVar143._32_4_;
        bVar5 = (bool)((byte)(uVar6 >> 9) & 1);
        auVar144._36_4_ = (uint)bVar5 * auVar141._36_4_ | (uint)!bVar5 * auVar143._36_4_;
        bVar5 = (bool)((byte)(uVar6 >> 10) & 1);
        auVar144._40_4_ = (uint)bVar5 * auVar141._40_4_ | (uint)!bVar5 * auVar143._40_4_;
        bVar5 = (bool)((byte)(uVar6 >> 0xb) & 1);
        auVar144._44_4_ = (uint)bVar5 * auVar141._44_4_ | (uint)!bVar5 * auVar143._44_4_;
        bVar5 = (bool)((byte)(uVar6 >> 0xc) & 1);
        auVar144._48_4_ = (uint)bVar5 * auVar141._48_4_ | (uint)!bVar5 * auVar143._48_4_;
        bVar5 = (bool)((byte)(uVar6 >> 0xd) & 1);
        auVar144._52_4_ = (uint)bVar5 * auVar141._52_4_ | (uint)!bVar5 * auVar143._52_4_;
        bVar5 = (bool)((byte)(uVar6 >> 0xe) & 1);
        auVar144._56_4_ = (uint)bVar5 * auVar141._56_4_ | (uint)!bVar5 * auVar143._56_4_;
        bVar5 = SUB81(uVar6 >> 0xf,0);
        auVar144._60_4_ = (uint)bVar5 * auVar141._60_4_ | (uint)!bVar5 * auVar143._60_4_;
        auVar139 = vfmadd231ps_avx512f(auVar139,auVar144,auVar125);
        auVar139 = vfmadd231ps_avx512f(auVar139,auVar144,auVar124);
        auVar141 = vmulps_avx512f(auVar139,auVar139);
        auVar143 = vfmadd213ps_avx512f(auVar139,(undefined1  [64])afVar53,(undefined1  [64])afVar54)
        ;
        auVar143 = vfmadd213ps_avx512f(auVar143,auVar139,(undefined1  [64])afVar55);
        auVar143 = vfmadd213ps_avx512f(auVar143,auVar139,(undefined1  [64])afVar56);
        auVar143 = vfmadd213ps_avx512f(auVar143,auVar139,(undefined1  [64])afVar57);
        auVar143 = vfmadd213ps_avx512f(auVar143,auVar139,(undefined1  [64])afVar58);
        auVar139 = vfmadd213ps_avx512f(auVar143,auVar141,auVar139);
        auVar139 = vaddps_avx512f(auVar139,(undefined1  [64])afVar51);
        auVar141 = vcvttps2dq_avx512f(auVar144);
        auVar141 = vpaddd_avx512f(auVar141,auVar126);
        auVar141 = vpslld_avx512f(auVar141,0x17);
        auVar139 = vmulps_avx512f(auVar139,auVar141);
        uVar2 = *(undefined4 *)((long)_maxptr + lVar67 + 0x20);
        auVar25._4_4_ = uVar2;
        auVar25._0_4_ = uVar2;
        auVar25._8_4_ = uVar2;
        auVar25._12_4_ = uVar2;
        auVar25._16_4_ = uVar2;
        auVar25._20_4_ = uVar2;
        auVar25._24_4_ = uVar2;
        auVar25._28_4_ = uVar2;
        auVar25._32_4_ = uVar2;
        auVar25._36_4_ = uVar2;
        auVar25._40_4_ = uVar2;
        auVar25._44_4_ = uVar2;
        auVar25._48_4_ = uVar2;
        auVar25._52_4_ = uVar2;
        auVar25._56_4_ = uVar2;
        auVar25._60_4_ = uVar2;
        auVar141 = vsubps_avx512f(pauVar63[8],auVar25);
        auVar141 = vminps_avx512f(auVar141,(undefined1  [64])afVar209);
        auVar141 = vmaxps_avx512f(auVar141,(undefined1  [64])afVar207);
        auVar143 = vfmadd213ps_avx512f((undefined1  [64])afVar52,auVar141,(undefined1  [64])afVar58)
        ;
        auVar145 = vrndscaleps_avx512f(auVar143,1);
        uVar6 = vcmpps_avx512f(auVar143,auVar145,1);
        auVar143 = vsubps_avx512f(auVar145,(undefined1  [64])afVar51);
        bVar5 = (bool)((byte)uVar6 & 1);
        auVar146._0_4_ = (uint)bVar5 * auVar143._0_4_ | (uint)!bVar5 * auVar145._0_4_;
        bVar5 = (bool)((byte)(uVar6 >> 1) & 1);
        auVar146._4_4_ = (uint)bVar5 * auVar143._4_4_ | (uint)!bVar5 * auVar145._4_4_;
        bVar5 = (bool)((byte)(uVar6 >> 2) & 1);
        auVar146._8_4_ = (uint)bVar5 * auVar143._8_4_ | (uint)!bVar5 * auVar145._8_4_;
        bVar5 = (bool)((byte)(uVar6 >> 3) & 1);
        auVar146._12_4_ = (uint)bVar5 * auVar143._12_4_ | (uint)!bVar5 * auVar145._12_4_;
        bVar5 = (bool)((byte)(uVar6 >> 4) & 1);
        auVar146._16_4_ = (uint)bVar5 * auVar143._16_4_ | (uint)!bVar5 * auVar145._16_4_;
        bVar5 = (bool)((byte)(uVar6 >> 5) & 1);
        auVar146._20_4_ = (uint)bVar5 * auVar143._20_4_ | (uint)!bVar5 * auVar145._20_4_;
        bVar5 = (bool)((byte)(uVar6 >> 6) & 1);
        auVar146._24_4_ = (uint)bVar5 * auVar143._24_4_ | (uint)!bVar5 * auVar145._24_4_;
        bVar5 = (bool)((byte)(uVar6 >> 7) & 1);
        auVar146._28_4_ = (uint)bVar5 * auVar143._28_4_ | (uint)!bVar5 * auVar145._28_4_;
        bVar5 = (bool)((byte)(uVar6 >> 8) & 1);
        auVar146._32_4_ = (uint)bVar5 * auVar143._32_4_ | (uint)!bVar5 * auVar145._32_4_;
        bVar5 = (bool)((byte)(uVar6 >> 9) & 1);
        auVar146._36_4_ = (uint)bVar5 * auVar143._36_4_ | (uint)!bVar5 * auVar145._36_4_;
        bVar5 = (bool)((byte)(uVar6 >> 10) & 1);
        auVar146._40_4_ = (uint)bVar5 * auVar143._40_4_ | (uint)!bVar5 * auVar145._40_4_;
        bVar5 = (bool)((byte)(uVar6 >> 0xb) & 1);
        auVar146._44_4_ = (uint)bVar5 * auVar143._44_4_ | (uint)!bVar5 * auVar145._44_4_;
        bVar5 = (bool)((byte)(uVar6 >> 0xc) & 1);
        auVar146._48_4_ = (uint)bVar5 * auVar143._48_4_ | (uint)!bVar5 * auVar145._48_4_;
        bVar5 = (bool)((byte)(uVar6 >> 0xd) & 1);
        auVar146._52_4_ = (uint)bVar5 * auVar143._52_4_ | (uint)!bVar5 * auVar145._52_4_;
        bVar5 = (bool)((byte)(uVar6 >> 0xe) & 1);
        auVar146._56_4_ = (uint)bVar5 * auVar143._56_4_ | (uint)!bVar5 * auVar145._56_4_;
        bVar5 = SUB81(uVar6 >> 0xf,0);
        auVar146._60_4_ = (uint)bVar5 * auVar143._60_4_ | (uint)!bVar5 * auVar145._60_4_;
        auVar141 = vfmadd231ps_avx512f(auVar141,auVar146,auVar125);
        auVar141 = vfmadd231ps_avx512f(auVar141,auVar146,auVar124);
        auVar143 = vmulps_avx512f(auVar141,auVar141);
        auVar145 = vfmadd213ps_avx512f(auVar141,(undefined1  [64])afVar53,(undefined1  [64])afVar54)
        ;
        auVar145 = vfmadd213ps_avx512f(auVar145,auVar141,(undefined1  [64])afVar55);
        auVar145 = vfmadd213ps_avx512f(auVar145,auVar141,(undefined1  [64])afVar56);
        auVar145 = vfmadd213ps_avx512f(auVar145,auVar141,(undefined1  [64])afVar57);
        auVar145 = vfmadd213ps_avx512f(auVar145,auVar141,(undefined1  [64])afVar58);
        auVar141 = vfmadd213ps_avx512f(auVar145,auVar143,auVar141);
        auVar141 = vaddps_avx512f(auVar141,(undefined1  [64])afVar51);
        auVar143 = vcvttps2dq_avx512f(auVar146);
        auVar143 = vpaddd_avx512f(auVar143,auVar126);
        auVar143 = vpslld_avx512f(auVar143,0x17);
        auVar141 = vmulps_avx512f(auVar141,auVar143);
        uVar2 = *(undefined4 *)((long)_maxptr + lVar67 + 0x24);
        auVar26._4_4_ = uVar2;
        auVar26._0_4_ = uVar2;
        auVar26._8_4_ = uVar2;
        auVar26._12_4_ = uVar2;
        auVar26._16_4_ = uVar2;
        auVar26._20_4_ = uVar2;
        auVar26._24_4_ = uVar2;
        auVar26._28_4_ = uVar2;
        auVar26._32_4_ = uVar2;
        auVar26._36_4_ = uVar2;
        auVar26._40_4_ = uVar2;
        auVar26._44_4_ = uVar2;
        auVar26._48_4_ = uVar2;
        auVar26._52_4_ = uVar2;
        auVar26._56_4_ = uVar2;
        auVar26._60_4_ = uVar2;
        auVar143 = vsubps_avx512f(pauVar63[9],auVar26);
        auVar143 = vminps_avx512f(auVar143,(undefined1  [64])afVar209);
        auVar143 = vmaxps_avx512f(auVar143,(undefined1  [64])afVar207);
        auVar145 = vfmadd213ps_avx512f((undefined1  [64])afVar52,auVar143,(undefined1  [64])afVar58)
        ;
        auVar147 = vrndscaleps_avx512f(auVar145,1);
        uVar6 = vcmpps_avx512f(auVar145,auVar147,1);
        auVar145 = vsubps_avx512f(auVar147,(undefined1  [64])afVar51);
        bVar5 = (bool)((byte)uVar6 & 1);
        auVar148._0_4_ = (uint)bVar5 * auVar145._0_4_ | (uint)!bVar5 * auVar147._0_4_;
        bVar5 = (bool)((byte)(uVar6 >> 1) & 1);
        auVar148._4_4_ = (uint)bVar5 * auVar145._4_4_ | (uint)!bVar5 * auVar147._4_4_;
        bVar5 = (bool)((byte)(uVar6 >> 2) & 1);
        auVar148._8_4_ = (uint)bVar5 * auVar145._8_4_ | (uint)!bVar5 * auVar147._8_4_;
        bVar5 = (bool)((byte)(uVar6 >> 3) & 1);
        auVar148._12_4_ = (uint)bVar5 * auVar145._12_4_ | (uint)!bVar5 * auVar147._12_4_;
        bVar5 = (bool)((byte)(uVar6 >> 4) & 1);
        auVar148._16_4_ = (uint)bVar5 * auVar145._16_4_ | (uint)!bVar5 * auVar147._16_4_;
        bVar5 = (bool)((byte)(uVar6 >> 5) & 1);
        auVar148._20_4_ = (uint)bVar5 * auVar145._20_4_ | (uint)!bVar5 * auVar147._20_4_;
        bVar5 = (bool)((byte)(uVar6 >> 6) & 1);
        auVar148._24_4_ = (uint)bVar5 * auVar145._24_4_ | (uint)!bVar5 * auVar147._24_4_;
        bVar5 = (bool)((byte)(uVar6 >> 7) & 1);
        auVar148._28_4_ = (uint)bVar5 * auVar145._28_4_ | (uint)!bVar5 * auVar147._28_4_;
        bVar5 = (bool)((byte)(uVar6 >> 8) & 1);
        auVar148._32_4_ = (uint)bVar5 * auVar145._32_4_ | (uint)!bVar5 * auVar147._32_4_;
        bVar5 = (bool)((byte)(uVar6 >> 9) & 1);
        auVar148._36_4_ = (uint)bVar5 * auVar145._36_4_ | (uint)!bVar5 * auVar147._36_4_;
        bVar5 = (bool)((byte)(uVar6 >> 10) & 1);
        auVar148._40_4_ = (uint)bVar5 * auVar145._40_4_ | (uint)!bVar5 * auVar147._40_4_;
        bVar5 = (bool)((byte)(uVar6 >> 0xb) & 1);
        auVar148._44_4_ = (uint)bVar5 * auVar145._44_4_ | (uint)!bVar5 * auVar147._44_4_;
        bVar5 = (bool)((byte)(uVar6 >> 0xc) & 1);
        auVar148._48_4_ = (uint)bVar5 * auVar145._48_4_ | (uint)!bVar5 * auVar147._48_4_;
        bVar5 = (bool)((byte)(uVar6 >> 0xd) & 1);
        auVar148._52_4_ = (uint)bVar5 * auVar145._52_4_ | (uint)!bVar5 * auVar147._52_4_;
        bVar5 = (bool)((byte)(uVar6 >> 0xe) & 1);
        auVar148._56_4_ = (uint)bVar5 * auVar145._56_4_ | (uint)!bVar5 * auVar147._56_4_;
        bVar5 = SUB81(uVar6 >> 0xf,0);
        auVar148._60_4_ = (uint)bVar5 * auVar145._60_4_ | (uint)!bVar5 * auVar147._60_4_;
        auVar143 = vfmadd231ps_avx512f(auVar143,auVar148,auVar125);
        auVar143 = vfmadd231ps_avx512f(auVar143,auVar148,auVar124);
        auVar145 = vmulps_avx512f(auVar143,auVar143);
        auVar147 = vfmadd213ps_avx512f(auVar143,(undefined1  [64])afVar53,(undefined1  [64])afVar54)
        ;
        auVar147 = vfmadd213ps_avx512f(auVar147,auVar143,(undefined1  [64])afVar55);
        auVar147 = vfmadd213ps_avx512f(auVar147,auVar143,(undefined1  [64])afVar56);
        auVar147 = vfmadd213ps_avx512f(auVar147,auVar143,(undefined1  [64])afVar57);
        auVar147 = vfmadd213ps_avx512f(auVar147,auVar143,(undefined1  [64])afVar58);
        auVar143 = vfmadd213ps_avx512f(auVar147,auVar145,auVar143);
        auVar143 = vaddps_avx512f(auVar143,(undefined1  [64])afVar51);
        auVar145 = vcvttps2dq_avx512f(auVar148);
        auVar145 = vpaddd_avx512f(auVar145,auVar126);
        auVar145 = vpslld_avx512f(auVar145,0x17);
        auVar143 = vmulps_avx512f(auVar143,auVar145);
        uVar2 = *(undefined4 *)((long)_maxptr + lVar67 + 0x28);
        auVar27._4_4_ = uVar2;
        auVar27._0_4_ = uVar2;
        auVar27._8_4_ = uVar2;
        auVar27._12_4_ = uVar2;
        auVar27._16_4_ = uVar2;
        auVar27._20_4_ = uVar2;
        auVar27._24_4_ = uVar2;
        auVar27._28_4_ = uVar2;
        auVar27._32_4_ = uVar2;
        auVar27._36_4_ = uVar2;
        auVar27._40_4_ = uVar2;
        auVar27._44_4_ = uVar2;
        auVar27._48_4_ = uVar2;
        auVar27._52_4_ = uVar2;
        auVar27._56_4_ = uVar2;
        auVar27._60_4_ = uVar2;
        auVar145 = vsubps_avx512f(pauVar63[10],auVar27);
        auVar145 = vminps_avx512f(auVar145,(undefined1  [64])afVar209);
        auVar145 = vmaxps_avx512f(auVar145,(undefined1  [64])afVar207);
        auVar147 = vfmadd213ps_avx512f((undefined1  [64])afVar52,auVar145,(undefined1  [64])afVar58)
        ;
        auVar149 = vrndscaleps_avx512f(auVar147,1);
        uVar6 = vcmpps_avx512f(auVar147,auVar149,1);
        auVar147 = vsubps_avx512f(auVar149,(undefined1  [64])afVar51);
        bVar5 = (bool)((byte)uVar6 & 1);
        auVar150._0_4_ = (uint)bVar5 * auVar147._0_4_ | (uint)!bVar5 * auVar149._0_4_;
        bVar5 = (bool)((byte)(uVar6 >> 1) & 1);
        auVar150._4_4_ = (uint)bVar5 * auVar147._4_4_ | (uint)!bVar5 * auVar149._4_4_;
        bVar5 = (bool)((byte)(uVar6 >> 2) & 1);
        auVar150._8_4_ = (uint)bVar5 * auVar147._8_4_ | (uint)!bVar5 * auVar149._8_4_;
        bVar5 = (bool)((byte)(uVar6 >> 3) & 1);
        auVar150._12_4_ = (uint)bVar5 * auVar147._12_4_ | (uint)!bVar5 * auVar149._12_4_;
        bVar5 = (bool)((byte)(uVar6 >> 4) & 1);
        auVar150._16_4_ = (uint)bVar5 * auVar147._16_4_ | (uint)!bVar5 * auVar149._16_4_;
        bVar5 = (bool)((byte)(uVar6 >> 5) & 1);
        auVar150._20_4_ = (uint)bVar5 * auVar147._20_4_ | (uint)!bVar5 * auVar149._20_4_;
        bVar5 = (bool)((byte)(uVar6 >> 6) & 1);
        auVar150._24_4_ = (uint)bVar5 * auVar147._24_4_ | (uint)!bVar5 * auVar149._24_4_;
        bVar5 = (bool)((byte)(uVar6 >> 7) & 1);
        auVar150._28_4_ = (uint)bVar5 * auVar147._28_4_ | (uint)!bVar5 * auVar149._28_4_;
        bVar5 = (bool)((byte)(uVar6 >> 8) & 1);
        auVar150._32_4_ = (uint)bVar5 * auVar147._32_4_ | (uint)!bVar5 * auVar149._32_4_;
        bVar5 = (bool)((byte)(uVar6 >> 9) & 1);
        auVar150._36_4_ = (uint)bVar5 * auVar147._36_4_ | (uint)!bVar5 * auVar149._36_4_;
        bVar5 = (bool)((byte)(uVar6 >> 10) & 1);
        auVar150._40_4_ = (uint)bVar5 * auVar147._40_4_ | (uint)!bVar5 * auVar149._40_4_;
        bVar5 = (bool)((byte)(uVar6 >> 0xb) & 1);
        auVar150._44_4_ = (uint)bVar5 * auVar147._44_4_ | (uint)!bVar5 * auVar149._44_4_;
        bVar5 = (bool)((byte)(uVar6 >> 0xc) & 1);
        auVar150._48_4_ = (uint)bVar5 * auVar147._48_4_ | (uint)!bVar5 * auVar149._48_4_;
        bVar5 = (bool)((byte)(uVar6 >> 0xd) & 1);
        auVar150._52_4_ = (uint)bVar5 * auVar147._52_4_ | (uint)!bVar5 * auVar149._52_4_;
        bVar5 = (bool)((byte)(uVar6 >> 0xe) & 1);
        auVar150._56_4_ = (uint)bVar5 * auVar147._56_4_ | (uint)!bVar5 * auVar149._56_4_;
        bVar5 = SUB81(uVar6 >> 0xf,0);
        auVar150._60_4_ = (uint)bVar5 * auVar147._60_4_ | (uint)!bVar5 * auVar149._60_4_;
        auVar145 = vfmadd231ps_avx512f(auVar145,auVar150,auVar125);
        auVar145 = vfmadd231ps_avx512f(auVar145,auVar150,auVar124);
        auVar147 = vmulps_avx512f(auVar145,auVar145);
        auVar149 = vfmadd213ps_avx512f(auVar145,(undefined1  [64])afVar53,(undefined1  [64])afVar54)
        ;
        auVar149 = vfmadd213ps_avx512f(auVar149,auVar145,(undefined1  [64])afVar55);
        auVar149 = vfmadd213ps_avx512f(auVar149,auVar145,(undefined1  [64])afVar56);
        auVar149 = vfmadd213ps_avx512f(auVar149,auVar145,(undefined1  [64])afVar57);
        auVar149 = vfmadd213ps_avx512f(auVar149,auVar145,(undefined1  [64])afVar58);
        auVar145 = vfmadd213ps_avx512f(auVar149,auVar147,auVar145);
        auVar145 = vaddps_avx512f(auVar145,(undefined1  [64])afVar51);
        auVar147 = vcvttps2dq_avx512f(auVar150);
        auVar147 = vpaddd_avx512f(auVar147,auVar126);
        auVar147 = vpslld_avx512f(auVar147,0x17);
        auVar145 = vmulps_avx512f(auVar145,auVar147);
        uVar2 = *(undefined4 *)((long)_maxptr + lVar67 + 0x2c);
        auVar28._4_4_ = uVar2;
        auVar28._0_4_ = uVar2;
        auVar28._8_4_ = uVar2;
        auVar28._12_4_ = uVar2;
        auVar28._16_4_ = uVar2;
        auVar28._20_4_ = uVar2;
        auVar28._24_4_ = uVar2;
        auVar28._28_4_ = uVar2;
        auVar28._32_4_ = uVar2;
        auVar28._36_4_ = uVar2;
        auVar28._40_4_ = uVar2;
        auVar28._44_4_ = uVar2;
        auVar28._48_4_ = uVar2;
        auVar28._52_4_ = uVar2;
        auVar28._56_4_ = uVar2;
        auVar28._60_4_ = uVar2;
        auVar147 = vsubps_avx512f(pauVar63[0xb],auVar28);
        auVar147 = vminps_avx512f(auVar147,(undefined1  [64])afVar209);
        auVar147 = vmaxps_avx512f(auVar147,(undefined1  [64])afVar207);
        auVar149 = vfmadd213ps_avx512f((undefined1  [64])afVar52,auVar147,(undefined1  [64])afVar58)
        ;
        auVar151 = vrndscaleps_avx512f(auVar149,1);
        uVar6 = vcmpps_avx512f(auVar149,auVar151,1);
        auVar149 = vsubps_avx512f(auVar151,(undefined1  [64])afVar51);
        bVar5 = (bool)((byte)uVar6 & 1);
        auVar152._0_4_ = (uint)bVar5 * auVar149._0_4_ | (uint)!bVar5 * auVar151._0_4_;
        bVar5 = (bool)((byte)(uVar6 >> 1) & 1);
        auVar152._4_4_ = (uint)bVar5 * auVar149._4_4_ | (uint)!bVar5 * auVar151._4_4_;
        bVar5 = (bool)((byte)(uVar6 >> 2) & 1);
        auVar152._8_4_ = (uint)bVar5 * auVar149._8_4_ | (uint)!bVar5 * auVar151._8_4_;
        bVar5 = (bool)((byte)(uVar6 >> 3) & 1);
        auVar152._12_4_ = (uint)bVar5 * auVar149._12_4_ | (uint)!bVar5 * auVar151._12_4_;
        bVar5 = (bool)((byte)(uVar6 >> 4) & 1);
        auVar152._16_4_ = (uint)bVar5 * auVar149._16_4_ | (uint)!bVar5 * auVar151._16_4_;
        bVar5 = (bool)((byte)(uVar6 >> 5) & 1);
        auVar152._20_4_ = (uint)bVar5 * auVar149._20_4_ | (uint)!bVar5 * auVar151._20_4_;
        bVar5 = (bool)((byte)(uVar6 >> 6) & 1);
        auVar152._24_4_ = (uint)bVar5 * auVar149._24_4_ | (uint)!bVar5 * auVar151._24_4_;
        bVar5 = (bool)((byte)(uVar6 >> 7) & 1);
        auVar152._28_4_ = (uint)bVar5 * auVar149._28_4_ | (uint)!bVar5 * auVar151._28_4_;
        bVar5 = (bool)((byte)(uVar6 >> 8) & 1);
        auVar152._32_4_ = (uint)bVar5 * auVar149._32_4_ | (uint)!bVar5 * auVar151._32_4_;
        bVar5 = (bool)((byte)(uVar6 >> 9) & 1);
        auVar152._36_4_ = (uint)bVar5 * auVar149._36_4_ | (uint)!bVar5 * auVar151._36_4_;
        bVar5 = (bool)((byte)(uVar6 >> 10) & 1);
        auVar152._40_4_ = (uint)bVar5 * auVar149._40_4_ | (uint)!bVar5 * auVar151._40_4_;
        bVar5 = (bool)((byte)(uVar6 >> 0xb) & 1);
        auVar152._44_4_ = (uint)bVar5 * auVar149._44_4_ | (uint)!bVar5 * auVar151._44_4_;
        bVar5 = (bool)((byte)(uVar6 >> 0xc) & 1);
        auVar152._48_4_ = (uint)bVar5 * auVar149._48_4_ | (uint)!bVar5 * auVar151._48_4_;
        bVar5 = (bool)((byte)(uVar6 >> 0xd) & 1);
        auVar152._52_4_ = (uint)bVar5 * auVar149._52_4_ | (uint)!bVar5 * auVar151._52_4_;
        bVar5 = (bool)((byte)(uVar6 >> 0xe) & 1);
        auVar152._56_4_ = (uint)bVar5 * auVar149._56_4_ | (uint)!bVar5 * auVar151._56_4_;
        bVar5 = SUB81(uVar6 >> 0xf,0);
        auVar152._60_4_ = (uint)bVar5 * auVar149._60_4_ | (uint)!bVar5 * auVar151._60_4_;
        auVar147 = vfmadd231ps_avx512f(auVar147,auVar152,auVar125);
        auVar147 = vfmadd231ps_avx512f(auVar147,auVar152,auVar124);
        auVar149 = vmulps_avx512f(auVar147,auVar147);
        auVar151 = vfmadd213ps_avx512f(auVar147,(undefined1  [64])afVar53,(undefined1  [64])afVar54)
        ;
        auVar151 = vfmadd213ps_avx512f(auVar151,auVar147,(undefined1  [64])afVar55);
        auVar151 = vfmadd213ps_avx512f(auVar151,auVar147,(undefined1  [64])afVar56);
        auVar151 = vfmadd213ps_avx512f(auVar151,auVar147,(undefined1  [64])afVar57);
        auVar151 = vfmadd213ps_avx512f(auVar151,auVar147,(undefined1  [64])afVar58);
        auVar147 = vfmadd213ps_avx512f(auVar151,auVar149,auVar147);
        auVar147 = vaddps_avx512f(auVar147,(undefined1  [64])afVar51);
        auVar149 = vcvttps2dq_avx512f(auVar152);
        auVar149 = vpaddd_avx512f(auVar149,auVar126);
        auVar149 = vpslld_avx512f(auVar149,0x17);
        auVar147 = vmulps_avx512f(auVar147,auVar149);
        uVar2 = *(undefined4 *)((long)_maxptr + lVar67 + 0x30);
        auVar29._4_4_ = uVar2;
        auVar29._0_4_ = uVar2;
        auVar29._8_4_ = uVar2;
        auVar29._12_4_ = uVar2;
        auVar29._16_4_ = uVar2;
        auVar29._20_4_ = uVar2;
        auVar29._24_4_ = uVar2;
        auVar29._28_4_ = uVar2;
        auVar29._32_4_ = uVar2;
        auVar29._36_4_ = uVar2;
        auVar29._40_4_ = uVar2;
        auVar29._44_4_ = uVar2;
        auVar29._48_4_ = uVar2;
        auVar29._52_4_ = uVar2;
        auVar29._56_4_ = uVar2;
        auVar29._60_4_ = uVar2;
        auVar149 = vsubps_avx512f(pauVar63[0xc],auVar29);
        auVar149 = vminps_avx512f(auVar149,(undefined1  [64])afVar209);
        auVar149 = vmaxps_avx512f(auVar149,(undefined1  [64])afVar207);
        auVar151 = vfmadd213ps_avx512f((undefined1  [64])afVar52,auVar149,(undefined1  [64])afVar58)
        ;
        auVar153 = vrndscaleps_avx512f(auVar151,1);
        uVar6 = vcmpps_avx512f(auVar151,auVar153,1);
        auVar151 = vsubps_avx512f(auVar153,(undefined1  [64])afVar51);
        bVar5 = (bool)((byte)uVar6 & 1);
        auVar154._0_4_ = (uint)bVar5 * auVar151._0_4_ | (uint)!bVar5 * auVar153._0_4_;
        bVar5 = (bool)((byte)(uVar6 >> 1) & 1);
        auVar154._4_4_ = (uint)bVar5 * auVar151._4_4_ | (uint)!bVar5 * auVar153._4_4_;
        bVar5 = (bool)((byte)(uVar6 >> 2) & 1);
        auVar154._8_4_ = (uint)bVar5 * auVar151._8_4_ | (uint)!bVar5 * auVar153._8_4_;
        bVar5 = (bool)((byte)(uVar6 >> 3) & 1);
        auVar154._12_4_ = (uint)bVar5 * auVar151._12_4_ | (uint)!bVar5 * auVar153._12_4_;
        bVar5 = (bool)((byte)(uVar6 >> 4) & 1);
        auVar154._16_4_ = (uint)bVar5 * auVar151._16_4_ | (uint)!bVar5 * auVar153._16_4_;
        bVar5 = (bool)((byte)(uVar6 >> 5) & 1);
        auVar154._20_4_ = (uint)bVar5 * auVar151._20_4_ | (uint)!bVar5 * auVar153._20_4_;
        bVar5 = (bool)((byte)(uVar6 >> 6) & 1);
        auVar154._24_4_ = (uint)bVar5 * auVar151._24_4_ | (uint)!bVar5 * auVar153._24_4_;
        bVar5 = (bool)((byte)(uVar6 >> 7) & 1);
        auVar154._28_4_ = (uint)bVar5 * auVar151._28_4_ | (uint)!bVar5 * auVar153._28_4_;
        bVar5 = (bool)((byte)(uVar6 >> 8) & 1);
        auVar154._32_4_ = (uint)bVar5 * auVar151._32_4_ | (uint)!bVar5 * auVar153._32_4_;
        bVar5 = (bool)((byte)(uVar6 >> 9) & 1);
        auVar154._36_4_ = (uint)bVar5 * auVar151._36_4_ | (uint)!bVar5 * auVar153._36_4_;
        bVar5 = (bool)((byte)(uVar6 >> 10) & 1);
        auVar154._40_4_ = (uint)bVar5 * auVar151._40_4_ | (uint)!bVar5 * auVar153._40_4_;
        bVar5 = (bool)((byte)(uVar6 >> 0xb) & 1);
        auVar154._44_4_ = (uint)bVar5 * auVar151._44_4_ | (uint)!bVar5 * auVar153._44_4_;
        bVar5 = (bool)((byte)(uVar6 >> 0xc) & 1);
        auVar154._48_4_ = (uint)bVar5 * auVar151._48_4_ | (uint)!bVar5 * auVar153._48_4_;
        bVar5 = (bool)((byte)(uVar6 >> 0xd) & 1);
        auVar154._52_4_ = (uint)bVar5 * auVar151._52_4_ | (uint)!bVar5 * auVar153._52_4_;
        bVar5 = (bool)((byte)(uVar6 >> 0xe) & 1);
        auVar154._56_4_ = (uint)bVar5 * auVar151._56_4_ | (uint)!bVar5 * auVar153._56_4_;
        bVar5 = SUB81(uVar6 >> 0xf,0);
        auVar154._60_4_ = (uint)bVar5 * auVar151._60_4_ | (uint)!bVar5 * auVar153._60_4_;
        auVar149 = vfmadd231ps_avx512f(auVar149,auVar154,auVar125);
        auVar149 = vfmadd231ps_avx512f(auVar149,auVar154,auVar124);
        auVar151 = vmulps_avx512f(auVar149,auVar149);
        auVar153 = vfmadd213ps_avx512f(auVar149,(undefined1  [64])afVar53,(undefined1  [64])afVar54)
        ;
        auVar153 = vfmadd213ps_avx512f(auVar153,auVar149,(undefined1  [64])afVar55);
        auVar153 = vfmadd213ps_avx512f(auVar153,auVar149,(undefined1  [64])afVar56);
        auVar153 = vfmadd213ps_avx512f(auVar153,auVar149,(undefined1  [64])afVar57);
        auVar153 = vfmadd213ps_avx512f(auVar153,auVar149,(undefined1  [64])afVar58);
        auVar149 = vfmadd213ps_avx512f(auVar153,auVar151,auVar149);
        auVar149 = vaddps_avx512f(auVar149,(undefined1  [64])afVar51);
        auVar151 = vcvttps2dq_avx512f(auVar154);
        auVar151 = vpaddd_avx512f(auVar151,auVar126);
        auVar151 = vpslld_avx512f(auVar151,0x17);
        auVar149 = vmulps_avx512f(auVar149,auVar151);
        uVar2 = *(undefined4 *)((long)_maxptr + lVar67 + 0x34);
        auVar30._4_4_ = uVar2;
        auVar30._0_4_ = uVar2;
        auVar30._8_4_ = uVar2;
        auVar30._12_4_ = uVar2;
        auVar30._16_4_ = uVar2;
        auVar30._20_4_ = uVar2;
        auVar30._24_4_ = uVar2;
        auVar30._28_4_ = uVar2;
        auVar30._32_4_ = uVar2;
        auVar30._36_4_ = uVar2;
        auVar30._40_4_ = uVar2;
        auVar30._44_4_ = uVar2;
        auVar30._48_4_ = uVar2;
        auVar30._52_4_ = uVar2;
        auVar30._56_4_ = uVar2;
        auVar30._60_4_ = uVar2;
        auVar151 = vsubps_avx512f(pauVar63[0xd],auVar30);
        auVar151 = vminps_avx512f(auVar151,(undefined1  [64])afVar209);
        auVar151 = vmaxps_avx512f(auVar151,(undefined1  [64])afVar207);
        auVar153 = vfmadd213ps_avx512f((undefined1  [64])afVar52,auVar151,(undefined1  [64])afVar58)
        ;
        auVar155 = vrndscaleps_avx512f(auVar153,1);
        uVar6 = vcmpps_avx512f(auVar153,auVar155,1);
        auVar153 = vsubps_avx512f(auVar155,(undefined1  [64])afVar51);
        bVar5 = (bool)((byte)uVar6 & 1);
        auVar156._0_4_ = (uint)bVar5 * auVar153._0_4_ | (uint)!bVar5 * auVar155._0_4_;
        bVar5 = (bool)((byte)(uVar6 >> 1) & 1);
        auVar156._4_4_ = (uint)bVar5 * auVar153._4_4_ | (uint)!bVar5 * auVar155._4_4_;
        bVar5 = (bool)((byte)(uVar6 >> 2) & 1);
        auVar156._8_4_ = (uint)bVar5 * auVar153._8_4_ | (uint)!bVar5 * auVar155._8_4_;
        bVar5 = (bool)((byte)(uVar6 >> 3) & 1);
        auVar156._12_4_ = (uint)bVar5 * auVar153._12_4_ | (uint)!bVar5 * auVar155._12_4_;
        bVar5 = (bool)((byte)(uVar6 >> 4) & 1);
        auVar156._16_4_ = (uint)bVar5 * auVar153._16_4_ | (uint)!bVar5 * auVar155._16_4_;
        bVar5 = (bool)((byte)(uVar6 >> 5) & 1);
        auVar156._20_4_ = (uint)bVar5 * auVar153._20_4_ | (uint)!bVar5 * auVar155._20_4_;
        bVar5 = (bool)((byte)(uVar6 >> 6) & 1);
        auVar156._24_4_ = (uint)bVar5 * auVar153._24_4_ | (uint)!bVar5 * auVar155._24_4_;
        bVar5 = (bool)((byte)(uVar6 >> 7) & 1);
        auVar156._28_4_ = (uint)bVar5 * auVar153._28_4_ | (uint)!bVar5 * auVar155._28_4_;
        bVar5 = (bool)((byte)(uVar6 >> 8) & 1);
        auVar156._32_4_ = (uint)bVar5 * auVar153._32_4_ | (uint)!bVar5 * auVar155._32_4_;
        bVar5 = (bool)((byte)(uVar6 >> 9) & 1);
        auVar156._36_4_ = (uint)bVar5 * auVar153._36_4_ | (uint)!bVar5 * auVar155._36_4_;
        bVar5 = (bool)((byte)(uVar6 >> 10) & 1);
        auVar156._40_4_ = (uint)bVar5 * auVar153._40_4_ | (uint)!bVar5 * auVar155._40_4_;
        bVar5 = (bool)((byte)(uVar6 >> 0xb) & 1);
        auVar156._44_4_ = (uint)bVar5 * auVar153._44_4_ | (uint)!bVar5 * auVar155._44_4_;
        bVar5 = (bool)((byte)(uVar6 >> 0xc) & 1);
        auVar156._48_4_ = (uint)bVar5 * auVar153._48_4_ | (uint)!bVar5 * auVar155._48_4_;
        bVar5 = (bool)((byte)(uVar6 >> 0xd) & 1);
        auVar156._52_4_ = (uint)bVar5 * auVar153._52_4_ | (uint)!bVar5 * auVar155._52_4_;
        bVar5 = (bool)((byte)(uVar6 >> 0xe) & 1);
        auVar156._56_4_ = (uint)bVar5 * auVar153._56_4_ | (uint)!bVar5 * auVar155._56_4_;
        bVar5 = SUB81(uVar6 >> 0xf,0);
        auVar156._60_4_ = (uint)bVar5 * auVar153._60_4_ | (uint)!bVar5 * auVar155._60_4_;
        auVar151 = vfmadd231ps_avx512f(auVar151,auVar156,auVar125);
        auVar151 = vfmadd231ps_avx512f(auVar151,auVar156,auVar124);
        auVar153 = vmulps_avx512f(auVar151,auVar151);
        auVar155 = vfmadd213ps_avx512f(auVar151,(undefined1  [64])afVar53,(undefined1  [64])afVar54)
        ;
        auVar155 = vfmadd213ps_avx512f(auVar155,auVar151,(undefined1  [64])afVar55);
        auVar155 = vfmadd213ps_avx512f(auVar155,auVar151,(undefined1  [64])afVar56);
        auVar155 = vfmadd213ps_avx512f(auVar155,auVar151,(undefined1  [64])afVar57);
        auVar155 = vfmadd213ps_avx512f(auVar155,auVar151,(undefined1  [64])afVar58);
        auVar151 = vfmadd213ps_avx512f(auVar155,auVar153,auVar151);
        auVar151 = vaddps_avx512f(auVar151,(undefined1  [64])afVar51);
        auVar153 = vcvttps2dq_avx512f(auVar156);
        auVar153 = vpaddd_avx512f(auVar153,auVar126);
        auVar153 = vpslld_avx512f(auVar153,0x17);
        auVar151 = vmulps_avx512f(auVar151,auVar153);
        uVar2 = *(undefined4 *)((long)_maxptr + lVar67 + 0x38);
        auVar31._4_4_ = uVar2;
        auVar31._0_4_ = uVar2;
        auVar31._8_4_ = uVar2;
        auVar31._12_4_ = uVar2;
        auVar31._16_4_ = uVar2;
        auVar31._20_4_ = uVar2;
        auVar31._24_4_ = uVar2;
        auVar31._28_4_ = uVar2;
        auVar31._32_4_ = uVar2;
        auVar31._36_4_ = uVar2;
        auVar31._40_4_ = uVar2;
        auVar31._44_4_ = uVar2;
        auVar31._48_4_ = uVar2;
        auVar31._52_4_ = uVar2;
        auVar31._56_4_ = uVar2;
        auVar31._60_4_ = uVar2;
        auVar153 = vsubps_avx512f(pauVar63[0xe],auVar31);
        auVar153 = vminps_avx512f(auVar153,(undefined1  [64])afVar209);
        auVar153 = vmaxps_avx512f(auVar153,(undefined1  [64])afVar207);
        auVar155 = vfmadd213ps_avx512f((undefined1  [64])afVar52,auVar153,(undefined1  [64])afVar58)
        ;
        auVar157 = vrndscaleps_avx512f(auVar155,1);
        uVar6 = vcmpps_avx512f(auVar155,auVar157,1);
        auVar155 = vsubps_avx512f(auVar157,(undefined1  [64])afVar51);
        bVar5 = (bool)((byte)uVar6 & 1);
        auVar158._0_4_ = (uint)bVar5 * auVar155._0_4_ | (uint)!bVar5 * auVar157._0_4_;
        bVar5 = (bool)((byte)(uVar6 >> 1) & 1);
        auVar158._4_4_ = (uint)bVar5 * auVar155._4_4_ | (uint)!bVar5 * auVar157._4_4_;
        bVar5 = (bool)((byte)(uVar6 >> 2) & 1);
        auVar158._8_4_ = (uint)bVar5 * auVar155._8_4_ | (uint)!bVar5 * auVar157._8_4_;
        bVar5 = (bool)((byte)(uVar6 >> 3) & 1);
        auVar158._12_4_ = (uint)bVar5 * auVar155._12_4_ | (uint)!bVar5 * auVar157._12_4_;
        bVar5 = (bool)((byte)(uVar6 >> 4) & 1);
        auVar158._16_4_ = (uint)bVar5 * auVar155._16_4_ | (uint)!bVar5 * auVar157._16_4_;
        bVar5 = (bool)((byte)(uVar6 >> 5) & 1);
        auVar158._20_4_ = (uint)bVar5 * auVar155._20_4_ | (uint)!bVar5 * auVar157._20_4_;
        bVar5 = (bool)((byte)(uVar6 >> 6) & 1);
        auVar158._24_4_ = (uint)bVar5 * auVar155._24_4_ | (uint)!bVar5 * auVar157._24_4_;
        bVar5 = (bool)((byte)(uVar6 >> 7) & 1);
        auVar158._28_4_ = (uint)bVar5 * auVar155._28_4_ | (uint)!bVar5 * auVar157._28_4_;
        bVar5 = (bool)((byte)(uVar6 >> 8) & 1);
        auVar158._32_4_ = (uint)bVar5 * auVar155._32_4_ | (uint)!bVar5 * auVar157._32_4_;
        bVar5 = (bool)((byte)(uVar6 >> 9) & 1);
        auVar158._36_4_ = (uint)bVar5 * auVar155._36_4_ | (uint)!bVar5 * auVar157._36_4_;
        bVar5 = (bool)((byte)(uVar6 >> 10) & 1);
        auVar158._40_4_ = (uint)bVar5 * auVar155._40_4_ | (uint)!bVar5 * auVar157._40_4_;
        bVar5 = (bool)((byte)(uVar6 >> 0xb) & 1);
        auVar158._44_4_ = (uint)bVar5 * auVar155._44_4_ | (uint)!bVar5 * auVar157._44_4_;
        bVar5 = (bool)((byte)(uVar6 >> 0xc) & 1);
        auVar158._48_4_ = (uint)bVar5 * auVar155._48_4_ | (uint)!bVar5 * auVar157._48_4_;
        bVar5 = (bool)((byte)(uVar6 >> 0xd) & 1);
        auVar158._52_4_ = (uint)bVar5 * auVar155._52_4_ | (uint)!bVar5 * auVar157._52_4_;
        bVar5 = (bool)((byte)(uVar6 >> 0xe) & 1);
        auVar158._56_4_ = (uint)bVar5 * auVar155._56_4_ | (uint)!bVar5 * auVar157._56_4_;
        bVar5 = SUB81(uVar6 >> 0xf,0);
        auVar158._60_4_ = (uint)bVar5 * auVar155._60_4_ | (uint)!bVar5 * auVar157._60_4_;
        auVar153 = vfmadd231ps_avx512f(auVar153,auVar158,auVar125);
        auVar153 = vfmadd231ps_avx512f(auVar153,auVar158,auVar124);
        auVar155 = vmulps_avx512f(auVar153,auVar153);
        auVar157 = vfmadd213ps_avx512f(auVar153,(undefined1  [64])afVar53,(undefined1  [64])afVar54)
        ;
        auVar157 = vfmadd213ps_avx512f(auVar157,auVar153,(undefined1  [64])afVar55);
        auVar157 = vfmadd213ps_avx512f(auVar157,auVar153,(undefined1  [64])afVar56);
        auVar157 = vfmadd213ps_avx512f(auVar157,auVar153,(undefined1  [64])afVar57);
        auVar157 = vfmadd213ps_avx512f(auVar157,auVar153,(undefined1  [64])afVar58);
        auVar153 = vfmadd213ps_avx512f(auVar157,auVar155,auVar153);
        auVar153 = vaddps_avx512f(auVar153,(undefined1  [64])afVar51);
        auVar155 = vcvttps2dq_avx512f(auVar158);
        auVar155 = vpaddd_avx512f(auVar155,auVar126);
        auVar155 = vpslld_avx512f(auVar155,0x17);
        auVar153 = vmulps_avx512f(auVar153,auVar155);
        uVar2 = *(undefined4 *)((long)_maxptr + lVar67 + 0x3c);
        auVar32._4_4_ = uVar2;
        auVar32._0_4_ = uVar2;
        auVar32._8_4_ = uVar2;
        auVar32._12_4_ = uVar2;
        auVar32._16_4_ = uVar2;
        auVar32._20_4_ = uVar2;
        auVar32._24_4_ = uVar2;
        auVar32._28_4_ = uVar2;
        auVar32._32_4_ = uVar2;
        auVar32._36_4_ = uVar2;
        auVar32._40_4_ = uVar2;
        auVar32._44_4_ = uVar2;
        auVar32._48_4_ = uVar2;
        auVar32._52_4_ = uVar2;
        auVar32._56_4_ = uVar2;
        auVar32._60_4_ = uVar2;
        auVar155 = vsubps_avx512f(pauVar63[0xf],auVar32);
        auVar155 = vminps_avx512f(auVar155,(undefined1  [64])afVar209);
        auVar155 = vmaxps_avx512f(auVar155,(undefined1  [64])afVar207);
        auVar157 = vfmadd213ps_avx512f((undefined1  [64])afVar52,auVar155,(undefined1  [64])afVar58)
        ;
        auVar159 = vrndscaleps_avx512f(auVar157,1);
        uVar6 = vcmpps_avx512f(auVar157,auVar159,1);
        auVar157 = vsubps_avx512f(auVar159,(undefined1  [64])afVar51);
        bVar5 = (bool)((byte)uVar6 & 1);
        auVar160._0_4_ = (uint)bVar5 * auVar157._0_4_ | (uint)!bVar5 * auVar159._0_4_;
        bVar5 = (bool)((byte)(uVar6 >> 1) & 1);
        auVar160._4_4_ = (uint)bVar5 * auVar157._4_4_ | (uint)!bVar5 * auVar159._4_4_;
        bVar5 = (bool)((byte)(uVar6 >> 2) & 1);
        auVar160._8_4_ = (uint)bVar5 * auVar157._8_4_ | (uint)!bVar5 * auVar159._8_4_;
        bVar5 = (bool)((byte)(uVar6 >> 3) & 1);
        auVar160._12_4_ = (uint)bVar5 * auVar157._12_4_ | (uint)!bVar5 * auVar159._12_4_;
        bVar5 = (bool)((byte)(uVar6 >> 4) & 1);
        auVar160._16_4_ = (uint)bVar5 * auVar157._16_4_ | (uint)!bVar5 * auVar159._16_4_;
        bVar5 = (bool)((byte)(uVar6 >> 5) & 1);
        auVar160._20_4_ = (uint)bVar5 * auVar157._20_4_ | (uint)!bVar5 * auVar159._20_4_;
        bVar5 = (bool)((byte)(uVar6 >> 6) & 1);
        auVar160._24_4_ = (uint)bVar5 * auVar157._24_4_ | (uint)!bVar5 * auVar159._24_4_;
        bVar5 = (bool)((byte)(uVar6 >> 7) & 1);
        auVar160._28_4_ = (uint)bVar5 * auVar157._28_4_ | (uint)!bVar5 * auVar159._28_4_;
        bVar5 = (bool)((byte)(uVar6 >> 8) & 1);
        auVar160._32_4_ = (uint)bVar5 * auVar157._32_4_ | (uint)!bVar5 * auVar159._32_4_;
        bVar5 = (bool)((byte)(uVar6 >> 9) & 1);
        auVar160._36_4_ = (uint)bVar5 * auVar157._36_4_ | (uint)!bVar5 * auVar159._36_4_;
        bVar5 = (bool)((byte)(uVar6 >> 10) & 1);
        auVar160._40_4_ = (uint)bVar5 * auVar157._40_4_ | (uint)!bVar5 * auVar159._40_4_;
        bVar5 = (bool)((byte)(uVar6 >> 0xb) & 1);
        auVar160._44_4_ = (uint)bVar5 * auVar157._44_4_ | (uint)!bVar5 * auVar159._44_4_;
        bVar5 = (bool)((byte)(uVar6 >> 0xc) & 1);
        auVar160._48_4_ = (uint)bVar5 * auVar157._48_4_ | (uint)!bVar5 * auVar159._48_4_;
        bVar5 = (bool)((byte)(uVar6 >> 0xd) & 1);
        auVar160._52_4_ = (uint)bVar5 * auVar157._52_4_ | (uint)!bVar5 * auVar159._52_4_;
        bVar5 = (bool)((byte)(uVar6 >> 0xe) & 1);
        auVar160._56_4_ = (uint)bVar5 * auVar157._56_4_ | (uint)!bVar5 * auVar159._56_4_;
        bVar5 = SUB81(uVar6 >> 0xf,0);
        auVar160._60_4_ = (uint)bVar5 * auVar157._60_4_ | (uint)!bVar5 * auVar159._60_4_;
        auVar155 = vfmadd231ps_avx512f(auVar155,auVar160,auVar125);
        auVar155 = vfmadd231ps_avx512f(auVar155,auVar160,auVar124);
        auVar157 = vmulps_avx512f(auVar155,auVar155);
        auVar159 = vfmadd213ps_avx512f(auVar155,(undefined1  [64])afVar53,(undefined1  [64])afVar54)
        ;
        auVar159 = vfmadd213ps_avx512f(auVar159,auVar155,(undefined1  [64])afVar55);
        auVar159 = vfmadd213ps_avx512f(auVar159,auVar155,(undefined1  [64])afVar56);
        auVar159 = vfmadd213ps_avx512f(auVar159,auVar155,(undefined1  [64])afVar57);
        auVar159 = vfmadd213ps_avx512f(auVar159,auVar155,(undefined1  [64])afVar58);
        auVar155 = vfmadd213ps_avx512f(auVar159,auVar157,auVar155);
        auVar155 = vaddps_avx512f(auVar155,(undefined1  [64])afVar51);
        auVar157 = vcvttps2dq_avx512f(auVar160);
        auVar157 = vpaddd_avx512f(auVar157,auVar126);
        auVar157 = vpslld_avx512f(auVar157,0x17);
        auVar155 = vmulps_avx512f(auVar155,auVar157);
        *pauVar63 = auVar127;
        pauVar63[1] = auVar128;
        pauVar63[2] = auVar129;
        pauVar63[3] = auVar130;
        pauVar63[4] = auVar131;
        pauVar63[5] = auVar132;
        pauVar63[6] = auVar137;
        pauVar63[7] = auVar139;
        pauVar63[8] = auVar141;
        pauVar63[9] = auVar143;
        pauVar63[10] = auVar145;
        pauVar63[0xb] = auVar147;
        pauVar63[0xc] = auVar149;
        pauVar63[0xd] = auVar151;
        pauVar63[0xe] = auVar153;
        pauVar63[0xf] = auVar155;
        auVar157 = vunpcklps_avx512f(auVar127,auVar128);
        auVar127 = vunpckhps_avx512f(auVar127,auVar128);
        auVar127 = vaddps_avx512f(auVar157,auVar127);
        auVar128 = vunpcklps_avx512f(auVar129,auVar130);
        auVar129 = vunpckhps_avx512f(auVar129,auVar130);
        auVar128 = vaddps_avx512f(auVar128,auVar129);
        auVar129 = vunpcklps_avx512f(auVar131,auVar132);
        auVar130 = vunpckhps_avx512f(auVar131,auVar132);
        auVar129 = vaddps_avx512f(auVar129,auVar130);
        auVar130 = vunpcklps_avx512f(auVar137,auVar139);
        auVar131 = vunpckhps_avx512f(auVar137,auVar139);
        auVar130 = vaddps_avx512f(auVar130,auVar131);
        auVar131 = vunpcklps_avx512f(auVar141,auVar143);
        auVar132 = vunpckhps_avx512f(auVar141,auVar143);
        auVar131 = vaddps_avx512f(auVar131,auVar132);
        auVar132 = vunpcklps_avx512f(auVar145,auVar147);
        auVar137 = vunpckhps_avx512f(auVar145,auVar147);
        auVar132 = vaddps_avx512f(auVar132,auVar137);
        auVar137 = vunpcklps_avx512f(auVar149,auVar151);
        auVar139 = vunpckhps_avx512f(auVar149,auVar151);
        auVar137 = vaddps_avx512f(auVar137,auVar139);
        auVar139 = vunpcklps_avx512f(auVar153,auVar155);
        auVar141 = vunpckhps_avx512f(auVar153,auVar155);
        auVar139 = vaddps_avx512f(auVar139,auVar141);
        auVar141 = vunpcklpd_avx512f(auVar127,auVar128);
        auVar127 = vunpckhpd_avx512f(auVar127,auVar128);
        auVar127 = vaddps_avx512f(auVar141,auVar127);
        auVar128 = vunpcklpd_avx512f(auVar129,auVar130);
        auVar129 = vunpckhpd_avx512f(auVar129,auVar130);
        auVar128 = vaddps_avx512f(auVar128,auVar129);
        auVar129 = vunpcklpd_avx512f(auVar131,auVar132);
        auVar130 = vunpckhpd_avx512f(auVar131,auVar132);
        auVar129 = vaddps_avx512f(auVar129,auVar130);
        auVar130 = vunpcklpd_avx512f(auVar137,auVar139);
        auVar131 = vunpckhpd_avx512f(auVar137,auVar139);
        auVar130 = vaddps_avx512f(auVar130,auVar131);
        auVar131 = vinsertf64x4_avx512f(auVar127,auVar128._0_32_,1);
        auVar127 = vshuff64x2_avx512f(auVar127,auVar128,0xee);
        auVar127 = vaddps_avx512f(auVar131,auVar127);
        auVar128 = vinsertf64x4_avx512f(auVar129,auVar130._0_32_,1);
        auVar129 = vshuff64x2_avx512f(auVar129,auVar130,0xee);
        auVar128 = vaddps_avx512f(auVar128,auVar129);
        auVar129 = vshuff64x2_avx512f(auVar127,auVar128,0x88);
        auVar127 = vshuff64x2_avx512f(auVar127,auVar128,0xdd);
        auVar127 = vaddps_avx512f(auVar127,*(undefined1 (*) [64])((long)_sumptr + lVar67));
        auVar127 = vaddps_avx512f(auVar127,auVar129);
        *(undefined1 (*) [64])((long)_sumptr + lVar67) = auVar127;
        pauVar63 = pauVar63 + 0x10;
        lVar67 = lVar67 + 0x40;
        lVar64 = lVar64 + 0x10;
      }
      for (; (int)lVar64 < size1; lVar64 = lVar64 + 1) {
        fVar224 = _maxptr[lVar64];
        auVar33._4_4_ = fVar224;
        auVar33._0_4_ = fVar224;
        auVar33._8_4_ = fVar224;
        auVar33._12_4_ = fVar224;
        auVar33._16_4_ = fVar224;
        auVar33._20_4_ = fVar224;
        auVar33._24_4_ = fVar224;
        auVar33._28_4_ = fVar224;
        auVar33._32_4_ = fVar224;
        auVar33._36_4_ = fVar224;
        auVar33._40_4_ = fVar224;
        auVar33._44_4_ = fVar224;
        auVar33._48_4_ = fVar224;
        auVar33._52_4_ = fVar224;
        auVar33._56_4_ = fVar224;
        auVar33._60_4_ = fVar224;
        auVar127 = vsubps_avx512f(*pauVar63,auVar33);
        auVar127 = vminps_avx512f(auVar127,(undefined1  [64])afVar209);
        auVar127 = vmaxps_avx512f(auVar127,(undefined1  [64])afVar207);
        auVar128 = vfmadd213ps_avx512f((undefined1  [64])afVar52,auVar127,(undefined1  [64])afVar58)
        ;
        auVar129 = vrndscaleps_avx512f(auVar128,1);
        uVar6 = vcmpps_avx512f(auVar128,auVar129,1);
        auVar128 = vsubps_avx512f(auVar129,(undefined1  [64])afVar51);
        bVar5 = (bool)((byte)uVar6 & 1);
        auVar161._0_4_ = (uint)bVar5 * auVar128._0_4_ | (uint)!bVar5 * auVar129._0_4_;
        bVar5 = (bool)((byte)(uVar6 >> 1) & 1);
        auVar161._4_4_ = (uint)bVar5 * auVar128._4_4_ | (uint)!bVar5 * auVar129._4_4_;
        bVar5 = (bool)((byte)(uVar6 >> 2) & 1);
        auVar161._8_4_ = (uint)bVar5 * auVar128._8_4_ | (uint)!bVar5 * auVar129._8_4_;
        bVar5 = (bool)((byte)(uVar6 >> 3) & 1);
        auVar161._12_4_ = (uint)bVar5 * auVar128._12_4_ | (uint)!bVar5 * auVar129._12_4_;
        bVar5 = (bool)((byte)(uVar6 >> 4) & 1);
        auVar161._16_4_ = (uint)bVar5 * auVar128._16_4_ | (uint)!bVar5 * auVar129._16_4_;
        bVar5 = (bool)((byte)(uVar6 >> 5) & 1);
        auVar161._20_4_ = (uint)bVar5 * auVar128._20_4_ | (uint)!bVar5 * auVar129._20_4_;
        bVar5 = (bool)((byte)(uVar6 >> 6) & 1);
        auVar161._24_4_ = (uint)bVar5 * auVar128._24_4_ | (uint)!bVar5 * auVar129._24_4_;
        bVar5 = (bool)((byte)(uVar6 >> 7) & 1);
        auVar161._28_4_ = (uint)bVar5 * auVar128._28_4_ | (uint)!bVar5 * auVar129._28_4_;
        bVar5 = (bool)((byte)(uVar6 >> 8) & 1);
        auVar161._32_4_ = (uint)bVar5 * auVar128._32_4_ | (uint)!bVar5 * auVar129._32_4_;
        bVar5 = (bool)((byte)(uVar6 >> 9) & 1);
        auVar161._36_4_ = (uint)bVar5 * auVar128._36_4_ | (uint)!bVar5 * auVar129._36_4_;
        bVar5 = (bool)((byte)(uVar6 >> 10) & 1);
        auVar161._40_4_ = (uint)bVar5 * auVar128._40_4_ | (uint)!bVar5 * auVar129._40_4_;
        bVar5 = (bool)((byte)(uVar6 >> 0xb) & 1);
        auVar161._44_4_ = (uint)bVar5 * auVar128._44_4_ | (uint)!bVar5 * auVar129._44_4_;
        bVar5 = (bool)((byte)(uVar6 >> 0xc) & 1);
        auVar161._48_4_ = (uint)bVar5 * auVar128._48_4_ | (uint)!bVar5 * auVar129._48_4_;
        bVar5 = (bool)((byte)(uVar6 >> 0xd) & 1);
        auVar161._52_4_ = (uint)bVar5 * auVar128._52_4_ | (uint)!bVar5 * auVar129._52_4_;
        bVar5 = (bool)((byte)(uVar6 >> 0xe) & 1);
        auVar161._56_4_ = (uint)bVar5 * auVar128._56_4_ | (uint)!bVar5 * auVar129._56_4_;
        bVar5 = SUB81(uVar6 >> 0xf,0);
        auVar161._60_4_ = (uint)bVar5 * auVar128._60_4_ | (uint)!bVar5 * auVar129._60_4_;
        auVar127 = vfmadd231ps_avx512f(auVar127,auVar161,auVar125);
        auVar127 = vfmadd231ps_avx512f(auVar127,auVar161,auVar124);
        auVar128 = vmulps_avx512f(auVar127,auVar127);
        auVar129 = vfmadd213ps_avx512f(auVar127,(undefined1  [64])afVar53,(undefined1  [64])afVar54)
        ;
        auVar129 = vfmadd213ps_avx512f(auVar129,auVar127,(undefined1  [64])afVar55);
        auVar129 = vfmadd213ps_avx512f(auVar129,auVar127,(undefined1  [64])afVar56);
        auVar129 = vfmadd213ps_avx512f(auVar129,auVar127,(undefined1  [64])afVar57);
        auVar129 = vfmadd213ps_avx512f(auVar129,auVar127,(undefined1  [64])afVar58);
        auVar127 = vfmadd213ps_avx512f(auVar129,auVar128,auVar127);
        auVar127 = vaddps_avx512f(auVar127,(undefined1  [64])afVar51);
        auVar128 = vcvttps2dq_avx512f(auVar161);
        auVar128 = vpaddd_avx512f(auVar128,auVar126);
        auVar128 = vpslld_avx512f(auVar128,0x17);
        auVar127 = vmulps_avx512f(auVar127,auVar128);
        *pauVar63 = auVar127;
        auVar99 = vextractf64x4_avx512f(auVar127,1);
        fVar224 = auVar127._4_4_ + auVar99._4_4_;
        auVar222._0_4_ = auVar127._0_4_ + auVar99._0_4_ + auVar127._16_4_ + auVar99._16_4_;
        auVar222._4_4_ = fVar224 + fVar224;
        auVar222._8_4_ = auVar127._8_4_ + auVar99._8_4_ + auVar127._24_4_ + auVar99._24_4_;
        auVar222._12_4_ = auVar127._12_4_ + auVar99._12_4_ + auVar127._28_4_ + auVar99._28_4_;
        auVar75 = vshufpd_avx(auVar222,auVar222,1);
        auVar223._0_4_ = auVar75._0_4_ + auVar222._0_4_;
        auVar223._4_4_ = auVar75._4_4_ + auVar222._4_4_;
        auVar223._8_4_ = auVar75._8_4_ + auVar222._8_4_;
        auVar223._12_4_ = auVar75._12_4_ + auVar222._12_4_;
        auVar75 = vmovshdup_avx(auVar223);
        _sumptr[lVar64] = auVar75._0_4_ + _sumptr[lVar64] + auVar223._0_4_;
        pauVar63 = pauVar63 + 1;
      }
    }
    iVar59 = 0;
    auVar124 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
    pauVar63 = (undefined1 (*) [64])_sumptr;
    for (; iVar59 + 0xf < size1; iVar59 = iVar59 + 0x10) {
      auVar125 = vdivps_avx512f(auVar124,*pauVar63);
      *pauVar63 = auVar125;
      pauVar63 = pauVar63 + 1;
    }
    auVar179._8_4_ = 0x3f800000;
    auVar179._0_8_ = 0x3f8000003f800000;
    auVar179._12_4_ = 0x3f800000;
    auVar179._16_4_ = 0x3f800000;
    auVar179._20_4_ = 0x3f800000;
    auVar179._24_4_ = 0x3f800000;
    auVar179._28_4_ = 0x3f800000;
    for (; iVar59 + 7 < size1; iVar59 = iVar59 + 8) {
      auVar99 = vdivps_avx(auVar179,*(undefined1 (*) [32])*pauVar63);
      *(undefined1 (*) [32])*pauVar63 = auVar99;
      pauVar63 = (undefined1 (*) [64])(*pauVar63 + 0x20);
    }
    auVar168._8_4_ = 0x3f800000;
    auVar168._0_8_ = 0x3f8000003f800000;
    auVar168._12_4_ = 0x3f800000;
    for (; iVar59 + 3 < size1; iVar59 = iVar59 + 4) {
      auVar75 = vdivps_avx(auVar168,*(undefined1 (*) [16])*pauVar63);
      *(undefined1 (*) [16])*pauVar63 = auVar75;
      pauVar63 = (undefined1 (*) [64])(*pauVar63 + 0x10);
    }
    for (; iVar59 < size1; iVar59 = iVar59 + 1) {
      *(float *)*pauVar63 = 1.0 / *(float *)*pauVar63;
      pauVar63 = (undefined1 (*) [64])(*pauVar63 + 4);
    }
    for (uVar60 = 0; uVar60 != uVar72; uVar60 = uVar60 + 1) {
      pauVar63 = (undefined1 (*) [64])(_ptr + uVar60 * lVar70);
      lVar64 = 0;
      pfVar65 = _sumptr;
      for (iVar59 = 0; iVar59 + 3 < size1; iVar59 = iVar59 + 4) {
        auVar124 = vbroadcastss_avx512f(ZEXT416((uint)*pfVar65));
        auVar124 = vmulps_avx512f(auVar124,*pauVar63);
        auVar125 = vbroadcastss_avx512f(ZEXT416((uint)pfVar65[1]));
        auVar125 = vmulps_avx512f(auVar125,pauVar63[1]);
        auVar126 = vbroadcastss_avx512f(ZEXT416((uint)pfVar65[2]));
        auVar126 = vmulps_avx512f(auVar126,pauVar63[2]);
        auVar127 = vbroadcastss_avx512f(ZEXT416((uint)pfVar65[3]));
        auVar127 = vmulps_avx512f(auVar127,pauVar63[3]);
        *pauVar63 = auVar124;
        pauVar63[1] = auVar125;
        pauVar63[2] = auVar126;
        pauVar63[3] = auVar127;
        pauVar63 = pauVar63 + 4;
        pfVar65 = pfVar65 + 4;
        lVar64 = lVar64 + 4;
      }
      for (; (int)lVar64 < size1; lVar64 = lVar64 + 1) {
        auVar124 = vbroadcastss_avx512f(ZEXT416((uint)_sumptr[lVar64]));
        auVar124 = vmulps_avx512f(auVar124,*pauVar63);
        *pauVar63 = auVar124;
        pauVar63 = pauVar63 + 1;
      }
    }
  }
  return;
}

Assistant:

static void softmax(float* _ptr, int elemcount, int elempack, int stride, int size1, float* _maxptr, float* _sumptr)
{
    // reduce max
    {
        float* maxptr = _maxptr;

        int j = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        __m512 _negmax_avx512 = _mm512_set1_ps(-FLT_MAX);
        for (; j + 15 < size1; j += 16)
        {
            _mm512_storeu_ps(maxptr, _negmax_avx512);
            maxptr += 16;
        }
#endif // __AVX512F__
        __m256 _negmax_avx = _mm256_set1_ps(-FLT_MAX);
        for (; j + 7 < size1; j += 8)
        {
            _mm256_storeu_ps(maxptr, _negmax_avx);
            maxptr += 8;
        }
#endif // __AVX__
        __m128 _negmax = _mm_set1_ps(-FLT_MAX);
        for (; j + 3 < size1; j += 4)
        {
            _mm_storeu_ps(maxptr, _negmax);
            maxptr += 4;
        }
#endif // __SSE2__
        for (; j < size1; j++)
        {
            *maxptr++ = -FLT_MAX;
        }
    }

    // reduce exp(x - max)
    {
        float* sumptr = _sumptr;

        int j = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        __m512 _zero_avx512 = _mm512_set1_ps(0.f);
        for (; j + 15 < size1; j += 16)
        {
            _mm512_storeu_ps(sumptr, _zero_avx512);
            sumptr += 16;
        }
#endif // __AVX512F__
        __m256 _zero_avx = _mm256_set1_ps(0.f);
        for (; j + 7 < size1; j += 8)
        {
            _mm256_storeu_ps(sumptr, _zero_avx);
            sumptr += 8;
        }
#endif // __AVX__
        __m128 _zero = _mm_set1_ps(0.f);
        for (; j + 3 < size1; j += 4)
        {
            _mm_storeu_ps(sumptr, _zero);
            sumptr += 4;
        }
#endif // __SSE2__
        for (; j < size1; j++)
        {
            *sumptr++ = 0.f;
        }
    }

#if __SSE2__
#if __AVX__
#if __AVX512F__
    if (elempack == 16)
    {
        softmax_pack16(_ptr, elemcount, stride, size1, _maxptr, _sumptr);
    }
#endif // __AVX512F__
    if (elempack == 8)
    {
        softmax_pack8(_ptr, elemcount, stride, size1, _maxptr, _sumptr);
    }
#endif // __AVX__
    if (elempack == 4)
    {
        softmax_pack4(_ptr, elemcount, stride, size1, _maxptr, _sumptr);
    }
#endif // __SSE2__
    if (elempack == 1)
    {
        softmax_pack1(_ptr, elemcount, stride, size1, _maxptr, _sumptr);
    }
}